

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_rtcd.h
# Opt level: O2

void setup_rtcd_internal(void)

{
  uint *puVar1;
  long lVar2;
  uint uVar3;
  char *pcVar4;
  ulong uVar5;
  code *pcVar6;
  code *pcVar7;
  code *pcVar8;
  code *pcVar9;
  code *pcVar10;
  code *pcVar11;
  code *pcVar12;
  code *pcVar13;
  code *pcVar14;
  code *pcVar15;
  code *pcVar16;
  code *pcVar17;
  code *pcVar18;
  code *pcVar19;
  code *pcVar20;
  code *pcVar21;
  code *pcVar22;
  code *pcVar23;
  code *pcVar24;
  code *pcVar25;
  code *pcVar26;
  code *pcVar27;
  code *pcVar28;
  code *pcVar29;
  code *pcVar30;
  code *pcVar31;
  code *pcVar32;
  code *pcVar33;
  code *pcVar34;
  code *pcVar35;
  code *pcVar36;
  code *pcVar37;
  code *pcVar38;
  code *pcVar39;
  code *pcVar40;
  code *pcVar41;
  code *pcVar42;
  code *pcVar43;
  code *pcVar44;
  code *pcVar45;
  code *pcVar46;
  code *pcVar47;
  code *pcVar48;
  code *pcVar49;
  code *pcVar50;
  code *pcVar51;
  code *pcVar52;
  code *pcVar53;
  code *pcVar54;
  code *pcVar55;
  code *pcVar56;
  code *pcVar57;
  code *pcVar58;
  code *pcVar59;
  code *pcVar60;
  code *pcVar61;
  code *pcVar62;
  code *pcVar63;
  code *pcVar64;
  code *pcVar65;
  code *pcVar66;
  code *pcVar67;
  code *pcVar68;
  code *pcVar69;
  code *pcVar70;
  code *pcVar71;
  code *pcVar72;
  code *pcVar73;
  code *pcVar74;
  code *pcVar75;
  code *pcVar76;
  code *pcVar77;
  code *pcVar78;
  code *pcVar79;
  code *pcVar80;
  code *pcVar81;
  code *pcVar82;
  code *pcVar83;
  code *pcVar84;
  code *pcVar85;
  code *pcVar86;
  code *pcVar87;
  code *pcVar88;
  code *pcVar89;
  code *pcVar90;
  code *pcVar91;
  code *pcVar92;
  code *pcVar93;
  code *pcVar94;
  code *pcVar95;
  code *pcVar96;
  code *pcVar97;
  code *pcVar98;
  code *pcVar99;
  code *pcVar100;
  code *pcVar101;
  code *pcVar102;
  code *pcVar103;
  code *pcVar104;
  code *pcVar105;
  code *pcVar106;
  code *pcVar107;
  code *pcVar108;
  code *pcVar109;
  code *pcVar110;
  code *pcVar111;
  code *pcVar112;
  code *pcVar113;
  code *pcVar114;
  code *pcVar115;
  code *pcVar116;
  code *pcVar117;
  code *pcVar118;
  code *pcVar119;
  code *pcVar120;
  code *pcVar121;
  code *pcVar122;
  code *pcVar123;
  code *pcVar124;
  code *pcVar125;
  code *pcVar126;
  code *pcVar127;
  code *pcVar128;
  code *pcVar129;
  code *pcVar130;
  code *pcVar131;
  code *pcVar132;
  code *pcVar133;
  code *pcVar134;
  code *pcVar135;
  code *pcVar136;
  code *pcVar137;
  code *pcVar138;
  code *pcVar139;
  code *pcVar140;
  code *pcVar141;
  code *pcVar142;
  code *pcVar143;
  code *pcVar144;
  code *pcVar145;
  code *pcVar146;
  code *pcVar147;
  code *pcVar148;
  code *pcVar149;
  code *pcVar150;
  code *pcVar151;
  code *pcVar152;
  code *pcVar153;
  code *pcVar154;
  code *pcVar155;
  code *pcVar156;
  code *pcVar157;
  code *pcVar158;
  code *pcVar159;
  code *pcVar160;
  code *pcVar161;
  code *pcVar162;
  code *pcVar163;
  code *pcVar164;
  code *pcVar165;
  code *pcVar166;
  code *pcVar167;
  code *pcVar168;
  code *pcVar169;
  code *pcVar170;
  code *pcVar171;
  code *pcVar172;
  code *pcVar173;
  code *pcVar174;
  code *pcVar175;
  code *pcVar176;
  code *pcVar177;
  code *pcVar178;
  code *pcVar179;
  code *pcVar180;
  code *pcVar181;
  code *pcVar182;
  code *pcVar183;
  code *pcVar184;
  code *pcVar185;
  code *pcVar186;
  code *pcVar187;
  code *pcVar188;
  code *pcVar189;
  code *pcVar190;
  code *pcVar191;
  code *pcVar192;
  code *pcVar193;
  code *pcVar194;
  code *pcVar195;
  code *pcVar196;
  code *pcVar197;
  code *pcVar198;
  code *pcVar199;
  code *pcVar200;
  code *pcVar201;
  code *pcVar202;
  code *pcVar203;
  code *pcVar204;
  code *pcVar205;
  code *pcVar206;
  code *pcVar207;
  code *pcVar208;
  code *pcVar209;
  code *pcVar210;
  code *pcVar211;
  code *pcVar212;
  code *pcVar213;
  code *pcVar214;
  code *pcVar215;
  code *pcVar216;
  code *pcVar217;
  code *pcVar218;
  code *pcVar219;
  code *pcVar220;
  code *pcVar221;
  code *pcVar222;
  code *pcVar223;
  code *pcVar224;
  code *pcVar225;
  code *pcVar226;
  code *pcVar227;
  code *pcVar228;
  code *pcVar229;
  code *pcVar230;
  code *pcVar231;
  code *pcVar232;
  code *pcVar233;
  code *pcVar234;
  code *pcVar235;
  code *pcVar236;
  code *pcVar237;
  code *pcVar238;
  code *pcVar239;
  code *pcVar240;
  code *pcVar241;
  code *pcVar242;
  code *pcVar243;
  code *pcVar244;
  code *pcVar245;
  code *pcVar246;
  code *pcVar247;
  code *pcVar248;
  code *pcVar249;
  code *pcVar250;
  code *pcVar251;
  code *pcVar252;
  code *pcVar253;
  code *pcVar254;
  code *pcVar255;
  code *pcVar256;
  code *pcVar257;
  code *pcVar258;
  code *pcVar259;
  code *pcVar260;
  code *pcVar261;
  code *pcVar262;
  code *pcVar263;
  code *pcVar264;
  code *pcVar265;
  code *pcVar266;
  code *pcVar267;
  code *pcVar268;
  code *pcVar269;
  code *pcVar270;
  uint uVar271;
  code *pcVar272;
  code *pcVar273;
  code *pcVar274;
  code *pcVar275;
  code *pcVar276;
  code *pcVar277;
  code *pcVar278;
  code *pcVar279;
  code *pcVar280;
  code *pcVar281;
  code *pcVar282;
  code *pcVar283;
  code *pcVar284;
  code *pcVar285;
  code *pcVar286;
  code *pcVar287;
  code *pcVar288;
  code *pcVar289;
  code *pcVar290;
  code *pcVar291;
  code *pcVar292;
  code *pcVar293;
  code *pcVar294;
  code *pcVar295;
  code *pcVar296;
  code *pcVar297;
  code *pcVar298;
  code *pcVar299;
  code *pcVar300;
  code *pcVar301;
  code *pcVar302;
  code *pcVar303;
  code *pcVar304;
  code *pcVar305;
  code *pcVar306;
  code *pcVar307;
  code *pcVar308;
  code *pcVar309;
  code *pcVar310;
  code *pcVar311;
  code *pcVar312;
  code *pcVar313;
  code *pcVar314;
  code *pcVar315;
  code *pcVar316;
  code *pcVar317;
  code *pcVar318;
  code *pcVar319;
  code *pcVar320;
  code *pcVar321;
  code *pcVar322;
  code *pcVar323;
  code *pcVar324;
  code *pcVar325;
  code *pcVar326;
  code *pcVar327;
  code *pcVar328;
  code *pcVar329;
  code *pcVar330;
  code *pcVar331;
  code *pcVar332;
  code *pcVar333;
  code *pcVar334;
  code *pcVar335;
  code *pcVar336;
  code *pcVar337;
  code *pcVar338;
  code *pcVar339;
  code *pcVar340;
  code *pcVar341;
  code *pcVar342;
  code *pcVar343;
  code *pcVar344;
  code *pcVar345;
  code *pcVar346;
  code *pcVar347;
  code *pcVar348;
  code *pcVar349;
  code *pcVar350;
  code *pcVar351;
  code *pcVar352;
  code *pcVar353;
  code *pcVar354;
  code *pcVar355;
  code *pcVar356;
  code *pcVar357;
  code *pcVar358;
  code *pcVar359;
  code *pcVar360;
  code *pcVar361;
  code *pcVar362;
  code *pcVar363;
  code *pcVar364;
  code *pcVar365;
  code *pcVar366;
  code *pcVar367;
  code *pcVar368;
  code *pcVar369;
  code *pcVar370;
  code *pcVar371;
  code *pcVar372;
  code *pcVar373;
  code *pcVar374;
  code *pcVar375;
  code *pcVar376;
  code *pcVar377;
  code *pcVar378;
  code *pcVar379;
  code *pcVar380;
  code *pcVar381;
  code *pcVar382;
  code *pcVar383;
  code *pcVar384;
  code *pcVar385;
  code *pcVar386;
  code *pcVar387;
  code *pcVar388;
  code *pcVar389;
  code *pcVar390;
  code *pcVar391;
  code *pcVar392;
  code *pcVar393;
  code *pcVar394;
  code *pcVar395;
  code *pcVar396;
  code *pcVar397;
  code *pcVar398;
  code *pcVar399;
  code *pcVar400;
  code *pcVar401;
  code *pcVar402;
  code *pcVar403;
  code *pcVar404;
  code *pcVar405;
  code *pcVar406;
  code *pcVar407;
  code *pcVar408;
  code *pcVar409;
  code *pcVar410;
  code *pcVar411;
  code *pcVar412;
  code *pcVar413;
  code *pcVar414;
  code *pcVar415;
  code *pcVar416;
  code *pcVar417;
  code *pcVar418;
  code *pcVar419;
  code *pcVar420;
  code *pcVar421;
  code *pcVar422;
  code *pcVar423;
  code *pcVar424;
  code *pcVar425;
  code *pcVar426;
  code *pcVar427;
  code *pcVar428;
  code *pcVar429;
  code *pcVar430;
  code *pcVar431;
  code *pcVar432;
  code *pcVar433;
  code *pcVar434;
  code *pcVar435;
  code *pcVar436;
  code *pcVar437;
  code *pcVar438;
  code *pcVar439;
  code *pcVar440;
  uint uVar441;
  code *pcVar442;
  code *pcVar443;
  code *pcVar444;
  bool bVar445;
  uint in_XCR0;
  
  pcVar4 = getenv("AOM_SIMD_CAPS");
  if ((pcVar4 == (char *)0x0) || (*pcVar4 == '\0')) {
    pcVar4 = getenv("AOM_SIMD_CAPS_MASK");
    uVar271 = 0xffffffff;
    if ((pcVar4 != (char *)0x0) && (*pcVar4 != '\0')) {
      uVar5 = strtoul(pcVar4,(char **)0x0,0);
      uVar271 = (uint)uVar5;
    }
    uVar5 = 0;
    puVar1 = (uint *)cpuid_basic_info(0);
    if (*puVar1 != 0) {
      lVar2 = cpuid_Version_info(1);
      uVar3 = *(uint *)(lVar2 + 0xc);
      uVar441 = uVar3 >> 0xe & 0x20 | uVar3 >> 5 & 0x10;
      if ((((~uVar3 & 0x18000000) == 0) && ((~in_XCR0 & 6) == 0)) &&
         (uVar441 = uVar441 | 0x40, 6 < *puVar1)) {
        lVar2 = cpuid_Extended_Feature_Enumeration_info(7);
        uVar441 = uVar441 + (*(uint *)(lVar2 + 4) & 0x20) * 4;
      }
      uVar5 = (ulong)(uVar441 & uVar271);
    }
  }
  else {
    uVar5 = strtol(pcVar4,(char **)0x0,0);
  }
  bVar445 = (uVar5 & 0x10) == 0;
  pcVar6 = aom_comp_mask_pred_ssse3;
  if (bVar445) {
    pcVar6 = aom_comp_mask_pred_c;
  }
  pcVar7 = aom_convolve8_horiz_ssse3;
  if (bVar445) {
    pcVar7 = aom_convolve8_horiz_c;
  }
  pcVar8 = aom_convolve8_vert_ssse3;
  if (bVar445) {
    pcVar8 = aom_convolve8_vert_c;
  }
  pcVar9 = aom_highbd_10_masked_sub_pixel_variance128x128_ssse3;
  if (bVar445) {
    pcVar9 = aom_highbd_10_masked_sub_pixel_variance128x128_c;
  }
  pcVar10 = aom_highbd_10_masked_sub_pixel_variance128x64_ssse3;
  if (bVar445) {
    pcVar10 = aom_highbd_10_masked_sub_pixel_variance128x64_c;
  }
  pcVar11 = aom_highbd_10_masked_sub_pixel_variance16x16_ssse3;
  if (bVar445) {
    pcVar11 = aom_highbd_10_masked_sub_pixel_variance16x16_c;
  }
  pcVar12 = aom_highbd_10_masked_sub_pixel_variance16x32_ssse3;
  if (bVar445) {
    pcVar12 = aom_highbd_10_masked_sub_pixel_variance16x32_c;
  }
  pcVar13 = aom_highbd_10_masked_sub_pixel_variance16x4_ssse3;
  if (bVar445) {
    pcVar13 = aom_highbd_10_masked_sub_pixel_variance16x4_c;
  }
  pcVar14 = aom_highbd_10_masked_sub_pixel_variance16x64_ssse3;
  if (bVar445) {
    pcVar14 = aom_highbd_10_masked_sub_pixel_variance16x64_c;
  }
  pcVar15 = aom_highbd_10_masked_sub_pixel_variance16x8_ssse3;
  if (bVar445) {
    pcVar15 = aom_highbd_10_masked_sub_pixel_variance16x8_c;
  }
  pcVar16 = aom_highbd_10_masked_sub_pixel_variance32x16_ssse3;
  if (bVar445) {
    pcVar16 = aom_highbd_10_masked_sub_pixel_variance32x16_c;
  }
  pcVar17 = aom_highbd_10_masked_sub_pixel_variance32x32_ssse3;
  if (bVar445) {
    pcVar17 = aom_highbd_10_masked_sub_pixel_variance32x32_c;
  }
  pcVar18 = aom_highbd_10_masked_sub_pixel_variance32x64_ssse3;
  if (bVar445) {
    pcVar18 = aom_highbd_10_masked_sub_pixel_variance32x64_c;
  }
  pcVar19 = aom_highbd_10_masked_sub_pixel_variance32x8_ssse3;
  if (bVar445) {
    pcVar19 = aom_highbd_10_masked_sub_pixel_variance32x8_c;
  }
  pcVar20 = aom_highbd_10_masked_sub_pixel_variance4x16_ssse3;
  if (bVar445) {
    pcVar20 = aom_highbd_10_masked_sub_pixel_variance4x16_c;
  }
  pcVar21 = aom_highbd_10_masked_sub_pixel_variance4x4_ssse3;
  if (bVar445) {
    pcVar21 = aom_highbd_10_masked_sub_pixel_variance4x4_c;
  }
  pcVar22 = aom_highbd_10_masked_sub_pixel_variance4x8_ssse3;
  if (bVar445) {
    pcVar22 = aom_highbd_10_masked_sub_pixel_variance4x8_c;
  }
  pcVar23 = aom_highbd_10_masked_sub_pixel_variance64x128_ssse3;
  if (bVar445) {
    pcVar23 = aom_highbd_10_masked_sub_pixel_variance64x128_c;
  }
  pcVar24 = aom_highbd_10_masked_sub_pixel_variance64x16_ssse3;
  if (bVar445) {
    pcVar24 = aom_highbd_10_masked_sub_pixel_variance64x16_c;
  }
  pcVar25 = aom_highbd_10_masked_sub_pixel_variance64x32_ssse3;
  if (bVar445) {
    pcVar25 = aom_highbd_10_masked_sub_pixel_variance64x32_c;
  }
  pcVar26 = aom_highbd_10_masked_sub_pixel_variance64x64_ssse3;
  if (bVar445) {
    pcVar26 = aom_highbd_10_masked_sub_pixel_variance64x64_c;
  }
  pcVar27 = aom_highbd_10_masked_sub_pixel_variance8x16_ssse3;
  if (bVar445) {
    pcVar27 = aom_highbd_10_masked_sub_pixel_variance8x16_c;
  }
  pcVar28 = aom_highbd_10_masked_sub_pixel_variance8x32_ssse3;
  if (bVar445) {
    pcVar28 = aom_highbd_10_masked_sub_pixel_variance8x32_c;
  }
  pcVar29 = aom_highbd_10_masked_sub_pixel_variance8x4_ssse3;
  if (bVar445) {
    pcVar29 = aom_highbd_10_masked_sub_pixel_variance8x4_c;
  }
  pcVar30 = aom_highbd_10_masked_sub_pixel_variance8x8_ssse3;
  if (bVar445) {
    pcVar30 = aom_highbd_10_masked_sub_pixel_variance8x8_c;
  }
  pcVar31 = aom_highbd_12_masked_sub_pixel_variance128x128_ssse3;
  if (bVar445) {
    pcVar31 = aom_highbd_12_masked_sub_pixel_variance128x128_c;
  }
  pcVar32 = aom_highbd_12_masked_sub_pixel_variance128x64_ssse3;
  if (bVar445) {
    pcVar32 = aom_highbd_12_masked_sub_pixel_variance128x64_c;
  }
  pcVar33 = aom_highbd_12_masked_sub_pixel_variance16x16_ssse3;
  if (bVar445) {
    pcVar33 = aom_highbd_12_masked_sub_pixel_variance16x16_c;
  }
  pcVar34 = aom_highbd_12_masked_sub_pixel_variance16x32_ssse3;
  if (bVar445) {
    pcVar34 = aom_highbd_12_masked_sub_pixel_variance16x32_c;
  }
  pcVar35 = aom_highbd_12_masked_sub_pixel_variance16x4_ssse3;
  if (bVar445) {
    pcVar35 = aom_highbd_12_masked_sub_pixel_variance16x4_c;
  }
  pcVar36 = aom_highbd_12_masked_sub_pixel_variance16x64_ssse3;
  if (bVar445) {
    pcVar36 = aom_highbd_12_masked_sub_pixel_variance16x64_c;
  }
  pcVar37 = aom_highbd_12_masked_sub_pixel_variance16x8_ssse3;
  if (bVar445) {
    pcVar37 = aom_highbd_12_masked_sub_pixel_variance16x8_c;
  }
  pcVar38 = aom_highbd_12_masked_sub_pixel_variance32x16_ssse3;
  if (bVar445) {
    pcVar38 = aom_highbd_12_masked_sub_pixel_variance32x16_c;
  }
  pcVar39 = aom_highbd_12_masked_sub_pixel_variance32x32_ssse3;
  if (bVar445) {
    pcVar39 = aom_highbd_12_masked_sub_pixel_variance32x32_c;
  }
  pcVar40 = aom_highbd_12_masked_sub_pixel_variance32x64_ssse3;
  if (bVar445) {
    pcVar40 = aom_highbd_12_masked_sub_pixel_variance32x64_c;
  }
  pcVar41 = aom_highbd_12_masked_sub_pixel_variance32x8_ssse3;
  if (bVar445) {
    pcVar41 = aom_highbd_12_masked_sub_pixel_variance32x8_c;
  }
  pcVar42 = aom_highbd_12_masked_sub_pixel_variance4x16_ssse3;
  if (bVar445) {
    pcVar42 = aom_highbd_12_masked_sub_pixel_variance4x16_c;
  }
  pcVar43 = aom_highbd_12_masked_sub_pixel_variance4x4_ssse3;
  if (bVar445) {
    pcVar43 = aom_highbd_12_masked_sub_pixel_variance4x4_c;
  }
  pcVar44 = aom_highbd_12_masked_sub_pixel_variance4x8_ssse3;
  if (bVar445) {
    pcVar44 = aom_highbd_12_masked_sub_pixel_variance4x8_c;
  }
  pcVar45 = aom_highbd_12_masked_sub_pixel_variance64x128_ssse3;
  if (bVar445) {
    pcVar45 = aom_highbd_12_masked_sub_pixel_variance64x128_c;
  }
  pcVar46 = aom_highbd_12_masked_sub_pixel_variance64x16_ssse3;
  if (bVar445) {
    pcVar46 = aom_highbd_12_masked_sub_pixel_variance64x16_c;
  }
  pcVar47 = aom_highbd_12_masked_sub_pixel_variance64x32_ssse3;
  if (bVar445) {
    pcVar47 = aom_highbd_12_masked_sub_pixel_variance64x32_c;
  }
  pcVar48 = aom_highbd_12_masked_sub_pixel_variance64x64_ssse3;
  if (bVar445) {
    pcVar48 = aom_highbd_12_masked_sub_pixel_variance64x64_c;
  }
  pcVar49 = aom_highbd_12_masked_sub_pixel_variance8x16_ssse3;
  if (bVar445) {
    pcVar49 = aom_highbd_12_masked_sub_pixel_variance8x16_c;
  }
  pcVar50 = aom_highbd_12_masked_sub_pixel_variance8x32_ssse3;
  if (bVar445) {
    pcVar50 = aom_highbd_12_masked_sub_pixel_variance8x32_c;
  }
  pcVar51 = aom_highbd_12_masked_sub_pixel_variance8x4_ssse3;
  if (bVar445) {
    pcVar51 = aom_highbd_12_masked_sub_pixel_variance8x4_c;
  }
  pcVar52 = aom_highbd_12_masked_sub_pixel_variance8x8_ssse3;
  if (bVar445) {
    pcVar52 = aom_highbd_12_masked_sub_pixel_variance8x8_c;
  }
  pcVar53 = aom_highbd_8_masked_sub_pixel_variance128x128_ssse3;
  if (bVar445) {
    pcVar53 = aom_highbd_8_masked_sub_pixel_variance128x128_c;
  }
  pcVar54 = aom_highbd_8_masked_sub_pixel_variance128x64_ssse3;
  if (bVar445) {
    pcVar54 = aom_highbd_8_masked_sub_pixel_variance128x64_c;
  }
  pcVar55 = aom_highbd_8_masked_sub_pixel_variance16x16_ssse3;
  if (bVar445) {
    pcVar55 = aom_highbd_8_masked_sub_pixel_variance16x16_c;
  }
  pcVar56 = aom_highbd_8_masked_sub_pixel_variance16x32_ssse3;
  if (bVar445) {
    pcVar56 = aom_highbd_8_masked_sub_pixel_variance16x32_c;
  }
  pcVar57 = aom_highbd_8_masked_sub_pixel_variance16x4_ssse3;
  if (bVar445) {
    pcVar57 = aom_highbd_8_masked_sub_pixel_variance16x4_c;
  }
  pcVar58 = aom_highbd_8_masked_sub_pixel_variance16x64_ssse3;
  if (bVar445) {
    pcVar58 = aom_highbd_8_masked_sub_pixel_variance16x64_c;
  }
  pcVar59 = aom_highbd_8_masked_sub_pixel_variance16x8_ssse3;
  if (bVar445) {
    pcVar59 = aom_highbd_8_masked_sub_pixel_variance16x8_c;
  }
  pcVar60 = aom_highbd_8_masked_sub_pixel_variance32x16_ssse3;
  if (bVar445) {
    pcVar60 = aom_highbd_8_masked_sub_pixel_variance32x16_c;
  }
  pcVar61 = aom_highbd_8_masked_sub_pixel_variance32x32_ssse3;
  if (bVar445) {
    pcVar61 = aom_highbd_8_masked_sub_pixel_variance32x32_c;
  }
  pcVar62 = aom_highbd_8_masked_sub_pixel_variance32x64_ssse3;
  if (bVar445) {
    pcVar62 = aom_highbd_8_masked_sub_pixel_variance32x64_c;
  }
  pcVar63 = aom_highbd_8_masked_sub_pixel_variance32x8_ssse3;
  if (bVar445) {
    pcVar63 = aom_highbd_8_masked_sub_pixel_variance32x8_c;
  }
  pcVar64 = aom_highbd_8_masked_sub_pixel_variance4x16_ssse3;
  if (bVar445) {
    pcVar64 = aom_highbd_8_masked_sub_pixel_variance4x16_c;
  }
  pcVar65 = aom_highbd_8_masked_sub_pixel_variance4x4_ssse3;
  if (bVar445) {
    pcVar65 = aom_highbd_8_masked_sub_pixel_variance4x4_c;
  }
  pcVar66 = aom_highbd_8_masked_sub_pixel_variance4x8_ssse3;
  if (bVar445) {
    pcVar66 = aom_highbd_8_masked_sub_pixel_variance4x8_c;
  }
  pcVar67 = aom_highbd_8_masked_sub_pixel_variance64x128_ssse3;
  if (bVar445) {
    pcVar67 = aom_highbd_8_masked_sub_pixel_variance64x128_c;
  }
  pcVar68 = aom_highbd_8_masked_sub_pixel_variance64x16_ssse3;
  if (bVar445) {
    pcVar68 = aom_highbd_8_masked_sub_pixel_variance64x16_c;
  }
  pcVar69 = aom_highbd_8_masked_sub_pixel_variance64x32_ssse3;
  if (bVar445) {
    pcVar69 = aom_highbd_8_masked_sub_pixel_variance64x32_c;
  }
  pcVar70 = aom_highbd_8_masked_sub_pixel_variance64x64_ssse3;
  if (bVar445) {
    pcVar70 = aom_highbd_8_masked_sub_pixel_variance64x64_c;
  }
  pcVar71 = aom_highbd_8_masked_sub_pixel_variance8x16_ssse3;
  if (bVar445) {
    pcVar71 = aom_highbd_8_masked_sub_pixel_variance8x16_c;
  }
  pcVar72 = aom_highbd_8_masked_sub_pixel_variance8x32_ssse3;
  if (bVar445) {
    pcVar72 = aom_highbd_8_masked_sub_pixel_variance8x32_c;
  }
  pcVar73 = aom_highbd_8_masked_sub_pixel_variance8x4_ssse3;
  if (bVar445) {
    pcVar73 = aom_highbd_8_masked_sub_pixel_variance8x4_c;
  }
  pcVar74 = aom_highbd_8_masked_sub_pixel_variance8x8_ssse3;
  if (bVar445) {
    pcVar74 = aom_highbd_8_masked_sub_pixel_variance8x8_c;
  }
  pcVar75 = aom_highbd_masked_sad128x128_ssse3;
  if (bVar445) {
    pcVar75 = aom_highbd_masked_sad128x128_c;
  }
  pcVar76 = aom_highbd_masked_sad128x64_ssse3;
  if (bVar445) {
    pcVar76 = aom_highbd_masked_sad128x64_c;
  }
  pcVar77 = aom_highbd_masked_sad16x16_ssse3;
  if (bVar445) {
    pcVar77 = aom_highbd_masked_sad16x16_c;
  }
  pcVar78 = aom_highbd_masked_sad16x32_ssse3;
  if (bVar445) {
    pcVar78 = aom_highbd_masked_sad16x32_c;
  }
  pcVar79 = aom_highbd_masked_sad16x4_ssse3;
  if (bVar445) {
    pcVar79 = aom_highbd_masked_sad16x4_c;
  }
  pcVar80 = aom_highbd_masked_sad16x64_ssse3;
  if (bVar445) {
    pcVar80 = aom_highbd_masked_sad16x64_c;
  }
  pcVar81 = aom_highbd_masked_sad16x8_ssse3;
  if (bVar445) {
    pcVar81 = aom_highbd_masked_sad16x8_c;
  }
  pcVar82 = aom_highbd_masked_sad32x16_ssse3;
  if (bVar445) {
    pcVar82 = aom_highbd_masked_sad32x16_c;
  }
  pcVar83 = aom_highbd_masked_sad32x32_ssse3;
  if (bVar445) {
    pcVar83 = aom_highbd_masked_sad32x32_c;
  }
  pcVar84 = aom_highbd_masked_sad32x64_ssse3;
  if (bVar445) {
    pcVar84 = aom_highbd_masked_sad32x64_c;
  }
  pcVar85 = aom_highbd_masked_sad32x8_ssse3;
  if (bVar445) {
    pcVar85 = aom_highbd_masked_sad32x8_c;
  }
  pcVar86 = aom_highbd_masked_sad4x16_ssse3;
  if (bVar445) {
    pcVar86 = aom_highbd_masked_sad4x16_c;
  }
  pcVar87 = aom_highbd_masked_sad4x4_ssse3;
  if (bVar445) {
    pcVar87 = aom_highbd_masked_sad4x4_c;
  }
  pcVar88 = aom_highbd_masked_sad4x8_ssse3;
  if (bVar445) {
    pcVar88 = aom_highbd_masked_sad4x8_c;
  }
  pcVar89 = aom_highbd_masked_sad64x128_ssse3;
  if (bVar445) {
    pcVar89 = aom_highbd_masked_sad64x128_c;
  }
  pcVar90 = aom_highbd_masked_sad64x16_ssse3;
  if (bVar445) {
    pcVar90 = aom_highbd_masked_sad64x16_c;
  }
  pcVar91 = aom_highbd_masked_sad64x32_ssse3;
  if (bVar445) {
    pcVar91 = aom_highbd_masked_sad64x32_c;
  }
  pcVar92 = aom_highbd_masked_sad64x64_ssse3;
  if (bVar445) {
    pcVar92 = aom_highbd_masked_sad64x64_c;
  }
  pcVar93 = aom_highbd_masked_sad8x16_ssse3;
  if (bVar445) {
    pcVar93 = aom_highbd_masked_sad8x16_c;
  }
  pcVar94 = aom_highbd_masked_sad8x32_ssse3;
  if (bVar445) {
    pcVar94 = aom_highbd_masked_sad8x32_c;
  }
  pcVar95 = aom_highbd_masked_sad8x4_ssse3;
  if (bVar445) {
    pcVar95 = aom_highbd_masked_sad8x4_c;
  }
  pcVar96 = aom_highbd_masked_sad8x8_ssse3;
  if (bVar445) {
    pcVar96 = aom_highbd_masked_sad8x8_c;
  }
  pcVar97 = aom_masked_sad128x128_ssse3;
  if (bVar445) {
    pcVar97 = aom_masked_sad128x128_c;
  }
  pcVar98 = aom_masked_sad128x64_ssse3;
  if (bVar445) {
    pcVar98 = aom_masked_sad128x64_c;
  }
  pcVar99 = aom_masked_sad16x16_ssse3;
  if (bVar445) {
    pcVar99 = aom_masked_sad16x16_c;
  }
  pcVar100 = aom_masked_sad16x32_ssse3;
  if (bVar445) {
    pcVar100 = aom_masked_sad16x32_c;
  }
  pcVar101 = aom_masked_sad16x4_ssse3;
  if (bVar445) {
    pcVar101 = aom_masked_sad16x4_c;
  }
  pcVar102 = aom_masked_sad16x64_ssse3;
  if (bVar445) {
    pcVar102 = aom_masked_sad16x64_c;
  }
  pcVar103 = aom_masked_sad16x8_ssse3;
  if (bVar445) {
    pcVar103 = aom_masked_sad16x8_c;
  }
  pcVar104 = aom_masked_sad32x16_ssse3;
  if (bVar445) {
    pcVar104 = aom_masked_sad32x16_c;
  }
  pcVar105 = aom_masked_sad32x32_ssse3;
  if (bVar445) {
    pcVar105 = aom_masked_sad32x32_c;
  }
  pcVar106 = aom_masked_sad32x64_ssse3;
  if (bVar445) {
    pcVar106 = aom_masked_sad32x64_c;
  }
  pcVar107 = aom_masked_sad32x8_ssse3;
  if (bVar445) {
    pcVar107 = aom_masked_sad32x8_c;
  }
  pcVar108 = aom_masked_sad4x16_ssse3;
  if (bVar445) {
    pcVar108 = aom_masked_sad4x16_c;
  }
  pcVar109 = aom_masked_sad4x4_ssse3;
  if (bVar445) {
    pcVar109 = aom_masked_sad4x4_c;
  }
  pcVar110 = aom_masked_sad4x8_ssse3;
  if (bVar445) {
    pcVar110 = aom_masked_sad4x8_c;
  }
  pcVar111 = aom_masked_sad64x128_ssse3;
  if (bVar445) {
    pcVar111 = aom_masked_sad64x128_c;
  }
  pcVar112 = aom_masked_sad64x16_ssse3;
  if (bVar445) {
    pcVar112 = aom_masked_sad64x16_c;
  }
  pcVar113 = aom_masked_sad64x32_ssse3;
  if (bVar445) {
    pcVar113 = aom_masked_sad64x32_c;
  }
  pcVar114 = aom_masked_sad64x64_ssse3;
  if (bVar445) {
    pcVar114 = aom_masked_sad64x64_c;
  }
  pcVar115 = aom_masked_sad8x16_ssse3;
  if (bVar445) {
    pcVar115 = aom_masked_sad8x16_c;
  }
  pcVar116 = aom_masked_sad8x32_ssse3;
  if (bVar445) {
    pcVar116 = aom_masked_sad8x32_c;
  }
  pcVar117 = aom_masked_sad8x4_ssse3;
  if (bVar445) {
    pcVar117 = aom_masked_sad8x4_c;
  }
  pcVar118 = aom_masked_sad8x8_ssse3;
  if (bVar445) {
    pcVar118 = aom_masked_sad8x8_c;
  }
  pcVar119 = aom_masked_sub_pixel_variance128x128_ssse3;
  if (bVar445) {
    pcVar119 = aom_masked_sub_pixel_variance128x128_c;
  }
  pcVar120 = aom_masked_sub_pixel_variance128x64_ssse3;
  if (bVar445) {
    pcVar120 = aom_masked_sub_pixel_variance128x64_c;
  }
  pcVar121 = aom_masked_sub_pixel_variance16x16_ssse3;
  if (bVar445) {
    pcVar121 = aom_masked_sub_pixel_variance16x16_c;
  }
  pcVar122 = aom_masked_sub_pixel_variance16x32_ssse3;
  if (bVar445) {
    pcVar122 = aom_masked_sub_pixel_variance16x32_c;
  }
  pcVar123 = aom_masked_sub_pixel_variance16x4_ssse3;
  if (bVar445) {
    pcVar123 = aom_masked_sub_pixel_variance16x4_c;
  }
  pcVar124 = aom_masked_sub_pixel_variance16x64_ssse3;
  if (bVar445) {
    pcVar124 = aom_masked_sub_pixel_variance16x64_c;
  }
  pcVar125 = aom_masked_sub_pixel_variance16x8_ssse3;
  if (bVar445) {
    pcVar125 = aom_masked_sub_pixel_variance16x8_c;
  }
  pcVar126 = aom_masked_sub_pixel_variance32x16_ssse3;
  if (bVar445) {
    pcVar126 = aom_masked_sub_pixel_variance32x16_c;
  }
  pcVar127 = aom_masked_sub_pixel_variance32x32_ssse3;
  if (bVar445) {
    pcVar127 = aom_masked_sub_pixel_variance32x32_c;
  }
  pcVar128 = aom_masked_sub_pixel_variance32x64_ssse3;
  if (bVar445) {
    pcVar128 = aom_masked_sub_pixel_variance32x64_c;
  }
  pcVar129 = aom_masked_sub_pixel_variance32x8_ssse3;
  if (bVar445) {
    pcVar129 = aom_masked_sub_pixel_variance32x8_c;
  }
  pcVar130 = aom_masked_sub_pixel_variance4x16_ssse3;
  if (bVar445) {
    pcVar130 = aom_masked_sub_pixel_variance4x16_c;
  }
  pcVar131 = aom_masked_sub_pixel_variance4x4_ssse3;
  if (bVar445) {
    pcVar131 = aom_masked_sub_pixel_variance4x4_c;
  }
  pcVar132 = aom_masked_sub_pixel_variance4x8_ssse3;
  if (bVar445) {
    pcVar132 = aom_masked_sub_pixel_variance4x8_c;
  }
  pcVar133 = aom_masked_sub_pixel_variance64x128_ssse3;
  if (bVar445) {
    pcVar133 = aom_masked_sub_pixel_variance64x128_c;
  }
  pcVar134 = aom_masked_sub_pixel_variance64x16_ssse3;
  if (bVar445) {
    pcVar134 = aom_masked_sub_pixel_variance64x16_c;
  }
  pcVar135 = aom_masked_sub_pixel_variance64x32_ssse3;
  if (bVar445) {
    pcVar135 = aom_masked_sub_pixel_variance64x32_c;
  }
  pcVar136 = aom_masked_sub_pixel_variance64x64_ssse3;
  if (bVar445) {
    pcVar136 = aom_masked_sub_pixel_variance64x64_c;
  }
  pcVar137 = aom_masked_sub_pixel_variance8x16_ssse3;
  if (bVar445) {
    pcVar137 = aom_masked_sub_pixel_variance8x16_c;
  }
  pcVar138 = aom_masked_sub_pixel_variance8x32_ssse3;
  if (bVar445) {
    pcVar138 = aom_masked_sub_pixel_variance8x32_c;
  }
  pcVar139 = aom_masked_sub_pixel_variance8x4_ssse3;
  if (bVar445) {
    pcVar139 = aom_masked_sub_pixel_variance8x4_c;
  }
  pcVar140 = aom_masked_sub_pixel_variance8x8_ssse3;
  if (bVar445) {
    pcVar140 = aom_masked_sub_pixel_variance8x8_c;
  }
  pcVar141 = aom_paeth_predictor_16x16_ssse3;
  if (bVar445) {
    pcVar141 = aom_paeth_predictor_16x16_c;
  }
  pcVar142 = aom_paeth_predictor_16x32_ssse3;
  if (bVar445) {
    pcVar142 = aom_paeth_predictor_16x32_c;
  }
  pcVar143 = aom_paeth_predictor_16x4_ssse3;
  if (bVar445) {
    pcVar143 = aom_paeth_predictor_16x4_c;
  }
  pcVar144 = aom_paeth_predictor_16x64_ssse3;
  if (bVar445) {
    pcVar144 = aom_paeth_predictor_16x64_c;
  }
  pcVar145 = aom_paeth_predictor_16x8_ssse3;
  if (bVar445) {
    pcVar145 = aom_paeth_predictor_16x8_c;
  }
  pcVar146 = aom_paeth_predictor_32x16_ssse3;
  if (bVar445) {
    pcVar146 = aom_paeth_predictor_32x16_c;
  }
  pcVar147 = aom_paeth_predictor_32x32_ssse3;
  if (bVar445) {
    pcVar147 = aom_paeth_predictor_32x32_c;
  }
  pcVar148 = aom_paeth_predictor_32x64_ssse3;
  if (bVar445) {
    pcVar148 = aom_paeth_predictor_32x64_c;
  }
  pcVar149 = aom_paeth_predictor_32x8_ssse3;
  if (bVar445) {
    pcVar149 = aom_paeth_predictor_32x8_c;
  }
  pcVar150 = aom_paeth_predictor_4x16_ssse3;
  if (bVar445) {
    pcVar150 = aom_paeth_predictor_4x16_c;
  }
  pcVar151 = aom_paeth_predictor_4x4_ssse3;
  if (bVar445) {
    pcVar151 = aom_paeth_predictor_4x4_c;
  }
  pcVar152 = aom_paeth_predictor_4x8_ssse3;
  if (bVar445) {
    pcVar152 = aom_paeth_predictor_4x8_c;
  }
  pcVar153 = aom_paeth_predictor_64x16_ssse3;
  if (bVar445) {
    pcVar153 = aom_paeth_predictor_64x16_c;
  }
  pcVar154 = aom_paeth_predictor_64x32_ssse3;
  if (bVar445) {
    pcVar154 = aom_paeth_predictor_64x32_c;
  }
  pcVar155 = aom_paeth_predictor_64x64_ssse3;
  if (bVar445) {
    pcVar155 = aom_paeth_predictor_64x64_c;
  }
  pcVar156 = aom_paeth_predictor_8x16_ssse3;
  if (bVar445) {
    pcVar156 = aom_paeth_predictor_8x16_c;
  }
  pcVar157 = aom_paeth_predictor_8x32_ssse3;
  if (bVar445) {
    pcVar157 = aom_paeth_predictor_8x32_c;
  }
  pcVar158 = aom_paeth_predictor_8x4_ssse3;
  if (bVar445) {
    pcVar158 = aom_paeth_predictor_8x4_c;
  }
  pcVar159 = aom_paeth_predictor_8x8_ssse3;
  if (bVar445) {
    pcVar159 = aom_paeth_predictor_8x8_c;
  }
  pcVar264 = aom_quantize_b_ssse3;
  if (bVar445) {
    pcVar264 = aom_quantize_b_sse2;
  }
  pcVar266 = aom_quantize_b_32x32_ssse3;
  if (bVar445) {
    pcVar266 = aom_quantize_b_32x32_c;
  }
  pcVar160 = aom_quantize_b_64x64_ssse3;
  if (bVar445) {
    pcVar160 = aom_quantize_b_64x64_c;
  }
  pcVar161 = aom_scaled_2d_ssse3;
  if (bVar445) {
    pcVar161 = aom_scaled_2d_c;
  }
  pcVar162 = aom_smooth_h_predictor_16x16_ssse3;
  if (bVar445) {
    pcVar162 = aom_smooth_h_predictor_16x16_c;
  }
  pcVar163 = aom_smooth_h_predictor_16x32_ssse3;
  if (bVar445) {
    pcVar163 = aom_smooth_h_predictor_16x32_c;
  }
  pcVar164 = aom_smooth_h_predictor_16x4_ssse3;
  if (bVar445) {
    pcVar164 = aom_smooth_h_predictor_16x4_c;
  }
  pcVar165 = aom_smooth_h_predictor_16x64_ssse3;
  if (bVar445) {
    pcVar165 = aom_smooth_h_predictor_16x64_c;
  }
  pcVar166 = aom_smooth_h_predictor_16x8_ssse3;
  if (bVar445) {
    pcVar166 = aom_smooth_h_predictor_16x8_c;
  }
  pcVar167 = aom_smooth_h_predictor_32x16_ssse3;
  if (bVar445) {
    pcVar167 = aom_smooth_h_predictor_32x16_c;
  }
  pcVar168 = aom_smooth_h_predictor_32x32_ssse3;
  if (bVar445) {
    pcVar168 = aom_smooth_h_predictor_32x32_c;
  }
  pcVar169 = aom_smooth_h_predictor_32x64_ssse3;
  if (bVar445) {
    pcVar169 = aom_smooth_h_predictor_32x64_c;
  }
  pcVar170 = aom_smooth_h_predictor_32x8_ssse3;
  if (bVar445) {
    pcVar170 = aom_smooth_h_predictor_32x8_c;
  }
  pcVar171 = aom_smooth_h_predictor_4x16_ssse3;
  if (bVar445) {
    pcVar171 = aom_smooth_h_predictor_4x16_c;
  }
  pcVar172 = aom_smooth_h_predictor_4x4_ssse3;
  if (bVar445) {
    pcVar172 = aom_smooth_h_predictor_4x4_c;
  }
  pcVar173 = aom_smooth_h_predictor_4x8_ssse3;
  if (bVar445) {
    pcVar173 = aom_smooth_h_predictor_4x8_c;
  }
  pcVar174 = aom_smooth_h_predictor_64x16_ssse3;
  if (bVar445) {
    pcVar174 = aom_smooth_h_predictor_64x16_c;
  }
  pcVar175 = aom_smooth_h_predictor_64x32_ssse3;
  if (bVar445) {
    pcVar175 = aom_smooth_h_predictor_64x32_c;
  }
  pcVar176 = aom_smooth_h_predictor_64x64_ssse3;
  if (bVar445) {
    pcVar176 = aom_smooth_h_predictor_64x64_c;
  }
  pcVar177 = aom_smooth_h_predictor_8x16_ssse3;
  if (bVar445) {
    pcVar177 = aom_smooth_h_predictor_8x16_c;
  }
  pcVar178 = aom_smooth_h_predictor_8x32_ssse3;
  if (bVar445) {
    pcVar178 = aom_smooth_h_predictor_8x32_c;
  }
  pcVar179 = aom_smooth_h_predictor_8x4_ssse3;
  if (bVar445) {
    pcVar179 = aom_smooth_h_predictor_8x4_c;
  }
  pcVar180 = aom_smooth_h_predictor_8x8_ssse3;
  if (bVar445) {
    pcVar180 = aom_smooth_h_predictor_8x8_c;
  }
  pcVar181 = aom_smooth_predictor_16x16_ssse3;
  if (bVar445) {
    pcVar181 = aom_smooth_predictor_16x16_c;
  }
  pcVar182 = aom_smooth_predictor_16x32_ssse3;
  if (bVar445) {
    pcVar182 = aom_smooth_predictor_16x32_c;
  }
  pcVar183 = aom_smooth_predictor_16x4_ssse3;
  if (bVar445) {
    pcVar183 = aom_smooth_predictor_16x4_c;
  }
  pcVar184 = aom_smooth_predictor_16x64_ssse3;
  if (bVar445) {
    pcVar184 = aom_smooth_predictor_16x64_c;
  }
  pcVar185 = aom_smooth_predictor_16x8_ssse3;
  if (bVar445) {
    pcVar185 = aom_smooth_predictor_16x8_c;
  }
  pcVar186 = aom_smooth_predictor_32x16_ssse3;
  if (bVar445) {
    pcVar186 = aom_smooth_predictor_32x16_c;
  }
  pcVar187 = aom_smooth_predictor_32x32_ssse3;
  if (bVar445) {
    pcVar187 = aom_smooth_predictor_32x32_c;
  }
  pcVar188 = aom_smooth_predictor_32x64_ssse3;
  if (bVar445) {
    pcVar188 = aom_smooth_predictor_32x64_c;
  }
  pcVar189 = aom_smooth_predictor_32x8_ssse3;
  if (bVar445) {
    pcVar189 = aom_smooth_predictor_32x8_c;
  }
  pcVar190 = aom_smooth_predictor_4x16_ssse3;
  if (bVar445) {
    pcVar190 = aom_smooth_predictor_4x16_c;
  }
  pcVar191 = aom_smooth_predictor_4x4_ssse3;
  if (bVar445) {
    pcVar191 = aom_smooth_predictor_4x4_c;
  }
  pcVar192 = aom_smooth_predictor_4x8_ssse3;
  if (bVar445) {
    pcVar192 = aom_smooth_predictor_4x8_c;
  }
  pcVar193 = aom_smooth_predictor_64x16_ssse3;
  if (bVar445) {
    pcVar193 = aom_smooth_predictor_64x16_c;
  }
  pcVar194 = aom_smooth_predictor_64x32_ssse3;
  if (bVar445) {
    pcVar194 = aom_smooth_predictor_64x32_c;
  }
  pcVar195 = aom_smooth_predictor_64x64_ssse3;
  if (bVar445) {
    pcVar195 = aom_smooth_predictor_64x64_c;
  }
  pcVar196 = aom_smooth_predictor_8x16_ssse3;
  if (bVar445) {
    pcVar196 = aom_smooth_predictor_8x16_c;
  }
  pcVar197 = aom_smooth_predictor_8x32_ssse3;
  if (bVar445) {
    pcVar197 = aom_smooth_predictor_8x32_c;
  }
  pcVar198 = aom_smooth_predictor_8x4_ssse3;
  if (bVar445) {
    pcVar198 = aom_smooth_predictor_8x4_c;
  }
  pcVar199 = aom_smooth_predictor_8x8_ssse3;
  if (bVar445) {
    pcVar199 = aom_smooth_predictor_8x8_c;
  }
  pcVar200 = aom_smooth_v_predictor_16x16_ssse3;
  if (bVar445) {
    pcVar200 = aom_smooth_v_predictor_16x16_c;
  }
  pcVar201 = aom_smooth_v_predictor_16x32_ssse3;
  if (bVar445) {
    pcVar201 = aom_smooth_v_predictor_16x32_c;
  }
  pcVar202 = aom_smooth_v_predictor_16x4_ssse3;
  if (bVar445) {
    pcVar202 = aom_smooth_v_predictor_16x4_c;
  }
  pcVar203 = aom_smooth_v_predictor_16x64_ssse3;
  if (bVar445) {
    pcVar203 = aom_smooth_v_predictor_16x64_c;
  }
  pcVar204 = aom_smooth_v_predictor_16x8_ssse3;
  if (bVar445) {
    pcVar204 = aom_smooth_v_predictor_16x8_c;
  }
  pcVar205 = aom_smooth_v_predictor_32x16_ssse3;
  if (bVar445) {
    pcVar205 = aom_smooth_v_predictor_32x16_c;
  }
  pcVar206 = aom_smooth_v_predictor_32x32_ssse3;
  if (bVar445) {
    pcVar206 = aom_smooth_v_predictor_32x32_c;
  }
  pcVar207 = aom_smooth_v_predictor_32x64_ssse3;
  if (bVar445) {
    pcVar207 = aom_smooth_v_predictor_32x64_c;
  }
  pcVar208 = aom_smooth_v_predictor_32x8_ssse3;
  if (bVar445) {
    pcVar208 = aom_smooth_v_predictor_32x8_c;
  }
  pcVar209 = aom_smooth_v_predictor_4x16_ssse3;
  if (bVar445) {
    pcVar209 = aom_smooth_v_predictor_4x16_c;
  }
  pcVar210 = aom_smooth_v_predictor_4x4_ssse3;
  if (bVar445) {
    pcVar210 = aom_smooth_v_predictor_4x4_c;
  }
  pcVar211 = aom_smooth_v_predictor_4x8_ssse3;
  if (bVar445) {
    pcVar211 = aom_smooth_v_predictor_4x8_c;
  }
  pcVar212 = aom_smooth_v_predictor_64x16_ssse3;
  if (bVar445) {
    pcVar212 = aom_smooth_v_predictor_64x16_c;
  }
  pcVar213 = aom_smooth_v_predictor_64x32_ssse3;
  if (bVar445) {
    pcVar213 = aom_smooth_v_predictor_64x32_c;
  }
  pcVar214 = aom_smooth_v_predictor_64x64_ssse3;
  if (bVar445) {
    pcVar214 = aom_smooth_v_predictor_64x64_c;
  }
  pcVar215 = aom_smooth_v_predictor_8x16_ssse3;
  if (bVar445) {
    pcVar215 = aom_smooth_v_predictor_8x16_c;
  }
  pcVar216 = aom_smooth_v_predictor_8x32_ssse3;
  if (bVar445) {
    pcVar216 = aom_smooth_v_predictor_8x32_c;
  }
  pcVar217 = aom_smooth_v_predictor_8x4_ssse3;
  if (bVar445) {
    pcVar217 = aom_smooth_v_predictor_8x4_c;
  }
  pcVar218 = aom_smooth_v_predictor_8x8_ssse3;
  if (bVar445) {
    pcVar218 = aom_smooth_v_predictor_8x8_c;
  }
  pcVar219 = aom_sub_pixel_avg_variance128x128_ssse3;
  if (bVar445) {
    pcVar219 = aom_sub_pixel_avg_variance128x128_c;
  }
  pcVar220 = aom_sub_pixel_avg_variance128x64_ssse3;
  if (bVar445) {
    pcVar220 = aom_sub_pixel_avg_variance128x64_c;
  }
  pcVar221 = aom_sub_pixel_avg_variance16x16_ssse3;
  if (bVar445) {
    pcVar221 = aom_sub_pixel_avg_variance16x16_c;
  }
  pcVar222 = aom_sub_pixel_avg_variance16x32_ssse3;
  if (bVar445) {
    pcVar222 = aom_sub_pixel_avg_variance16x32_c;
  }
  pcVar223 = aom_sub_pixel_avg_variance16x4_ssse3;
  if (bVar445) {
    pcVar223 = aom_sub_pixel_avg_variance16x4_c;
  }
  pcVar224 = aom_sub_pixel_avg_variance16x64_ssse3;
  if (bVar445) {
    pcVar224 = aom_sub_pixel_avg_variance16x64_c;
  }
  pcVar225 = aom_sub_pixel_avg_variance16x8_ssse3;
  if (bVar445) {
    pcVar225 = aom_sub_pixel_avg_variance16x8_c;
  }
  pcVar226 = aom_sub_pixel_avg_variance32x16_ssse3;
  if (bVar445) {
    pcVar226 = aom_sub_pixel_avg_variance32x16_c;
  }
  pcVar227 = aom_sub_pixel_avg_variance32x32_ssse3;
  if (bVar445) {
    pcVar227 = aom_sub_pixel_avg_variance32x32_c;
  }
  pcVar228 = aom_sub_pixel_avg_variance32x64_ssse3;
  if (bVar445) {
    pcVar228 = aom_sub_pixel_avg_variance32x64_c;
  }
  pcVar229 = aom_sub_pixel_avg_variance32x8_ssse3;
  if (bVar445) {
    pcVar229 = aom_sub_pixel_avg_variance32x8_c;
  }
  pcVar230 = aom_sub_pixel_avg_variance4x16_ssse3;
  if (bVar445) {
    pcVar230 = aom_sub_pixel_avg_variance4x16_c;
  }
  pcVar231 = aom_sub_pixel_avg_variance4x4_ssse3;
  if (bVar445) {
    pcVar231 = aom_sub_pixel_avg_variance4x4_c;
  }
  pcVar232 = aom_sub_pixel_avg_variance4x8_ssse3;
  if (bVar445) {
    pcVar232 = aom_sub_pixel_avg_variance4x8_c;
  }
  pcVar233 = aom_sub_pixel_avg_variance64x128_ssse3;
  if (bVar445) {
    pcVar233 = aom_sub_pixel_avg_variance64x128_c;
  }
  pcVar234 = aom_sub_pixel_avg_variance64x16_ssse3;
  if (bVar445) {
    pcVar234 = aom_sub_pixel_avg_variance64x16_c;
  }
  pcVar235 = aom_sub_pixel_avg_variance64x32_ssse3;
  if (bVar445) {
    pcVar235 = aom_sub_pixel_avg_variance64x32_c;
  }
  pcVar236 = aom_sub_pixel_avg_variance64x64_ssse3;
  if (bVar445) {
    pcVar236 = aom_sub_pixel_avg_variance64x64_c;
  }
  pcVar237 = aom_sub_pixel_avg_variance8x16_ssse3;
  if (bVar445) {
    pcVar237 = aom_sub_pixel_avg_variance8x16_c;
  }
  pcVar238 = aom_sub_pixel_avg_variance8x32_ssse3;
  if (bVar445) {
    pcVar238 = aom_sub_pixel_avg_variance8x32_c;
  }
  pcVar239 = aom_sub_pixel_avg_variance8x4_ssse3;
  if (bVar445) {
    pcVar239 = aom_sub_pixel_avg_variance8x4_c;
  }
  pcVar240 = aom_sub_pixel_avg_variance8x8_ssse3;
  if (bVar445) {
    pcVar240 = aom_sub_pixel_avg_variance8x8_c;
  }
  pcVar241 = aom_sub_pixel_variance128x128_ssse3;
  if (bVar445) {
    pcVar241 = aom_sub_pixel_variance128x128_c;
  }
  pcVar242 = aom_sub_pixel_variance128x64_ssse3;
  if (bVar445) {
    pcVar242 = aom_sub_pixel_variance128x64_c;
  }
  pcVar243 = aom_sub_pixel_variance16x16_ssse3;
  if (bVar445) {
    pcVar243 = aom_sub_pixel_variance16x16_c;
  }
  pcVar244 = aom_sub_pixel_variance16x32_ssse3;
  if (bVar445) {
    pcVar244 = aom_sub_pixel_variance16x32_c;
  }
  pcVar245 = aom_sub_pixel_variance16x4_ssse3;
  if (bVar445) {
    pcVar245 = aom_sub_pixel_variance16x4_c;
  }
  pcVar246 = aom_sub_pixel_variance16x64_ssse3;
  if (bVar445) {
    pcVar246 = aom_sub_pixel_variance16x64_c;
  }
  pcVar247 = aom_sub_pixel_variance16x8_ssse3;
  if (bVar445) {
    pcVar247 = aom_sub_pixel_variance16x8_c;
  }
  pcVar248 = aom_sub_pixel_variance32x16_ssse3;
  if (bVar445) {
    pcVar248 = aom_sub_pixel_variance32x16_c;
  }
  pcVar249 = aom_sub_pixel_variance32x32_ssse3;
  if (bVar445) {
    pcVar249 = aom_sub_pixel_variance32x32_c;
  }
  pcVar250 = aom_sub_pixel_variance32x64_ssse3;
  if (bVar445) {
    pcVar250 = aom_sub_pixel_variance32x64_c;
  }
  pcVar251 = aom_sub_pixel_variance32x8_ssse3;
  if (bVar445) {
    pcVar251 = aom_sub_pixel_variance32x8_c;
  }
  pcVar252 = aom_sub_pixel_variance4x16_ssse3;
  if (bVar445) {
    pcVar252 = aom_sub_pixel_variance4x16_c;
  }
  pcVar253 = aom_sub_pixel_variance4x4_ssse3;
  if (bVar445) {
    pcVar253 = aom_sub_pixel_variance4x4_c;
  }
  pcVar254 = aom_sub_pixel_variance4x8_ssse3;
  if (bVar445) {
    pcVar254 = aom_sub_pixel_variance4x8_c;
  }
  pcVar255 = aom_sub_pixel_variance64x128_ssse3;
  if (bVar445) {
    pcVar255 = aom_sub_pixel_variance64x128_c;
  }
  pcVar256 = aom_sub_pixel_variance64x16_ssse3;
  if (bVar445) {
    pcVar256 = aom_sub_pixel_variance64x16_c;
  }
  pcVar257 = aom_sub_pixel_variance64x32_ssse3;
  if (bVar445) {
    pcVar257 = aom_sub_pixel_variance64x32_c;
  }
  pcVar258 = aom_sub_pixel_variance64x64_ssse3;
  if (bVar445) {
    pcVar258 = aom_sub_pixel_variance64x64_c;
  }
  pcVar259 = aom_sub_pixel_variance8x16_ssse3;
  if (bVar445) {
    pcVar259 = aom_sub_pixel_variance8x16_c;
  }
  pcVar260 = aom_sub_pixel_variance8x32_ssse3;
  if (bVar445) {
    pcVar260 = aom_sub_pixel_variance8x32_c;
  }
  pcVar261 = aom_sub_pixel_variance8x4_ssse3;
  if (bVar445) {
    pcVar261 = aom_sub_pixel_variance8x4_c;
  }
  pcVar262 = aom_sub_pixel_variance8x8_ssse3;
  if (bVar445) {
    pcVar262 = aom_sub_pixel_variance8x8_c;
  }
  if ((uVar5 & 0x40) != 0) {
    pcVar264 = aom_quantize_b_avx;
    pcVar266 = aom_quantize_b_32x32_avx;
  }
  bVar445 = (uVar5 & 0x20) == 0;
  pcVar267 = aom_blend_a64_hmask_sse4_1;
  if (bVar445) {
    pcVar267 = aom_blend_a64_hmask_c;
  }
  pcVar269 = aom_blend_a64_mask_sse4_1;
  if (bVar445) {
    pcVar269 = aom_blend_a64_mask_c;
  }
  pcVar272 = aom_blend_a64_vmask_sse4_1;
  if (bVar445) {
    pcVar272 = aom_blend_a64_vmask_c;
  }
  pcVar263 = aom_compute_correlation_sse4_1;
  if (bVar445) {
    pcVar263 = aom_compute_correlation_c;
  }
  pcVar270 = aom_compute_flow_at_point_sse4_1;
  if (bVar445) {
    pcVar270 = aom_compute_flow_at_point_c;
  }
  pcVar265 = aom_compute_mean_stddev_sse4_1;
  if (bVar445) {
    pcVar265 = aom_compute_mean_stddev_c;
  }
  pcVar273 = aom_highbd_10_obmc_variance128x128_sse4_1;
  if (bVar445) {
    pcVar273 = aom_highbd_10_obmc_variance128x128_c;
  }
  pcVar274 = aom_highbd_10_obmc_variance128x64_sse4_1;
  if (bVar445) {
    pcVar274 = aom_highbd_10_obmc_variance128x64_c;
  }
  pcVar275 = aom_highbd_10_obmc_variance16x16_sse4_1;
  if (bVar445) {
    pcVar275 = aom_highbd_10_obmc_variance16x16_c;
  }
  pcVar276 = aom_highbd_10_obmc_variance16x32_sse4_1;
  if (bVar445) {
    pcVar276 = aom_highbd_10_obmc_variance16x32_c;
  }
  pcVar277 = aom_highbd_10_obmc_variance16x4_sse4_1;
  if (bVar445) {
    pcVar277 = aom_highbd_10_obmc_variance16x4_c;
  }
  pcVar278 = aom_highbd_10_obmc_variance16x64_sse4_1;
  if (bVar445) {
    pcVar278 = aom_highbd_10_obmc_variance16x64_c;
  }
  pcVar279 = aom_highbd_10_obmc_variance16x8_sse4_1;
  if (bVar445) {
    pcVar279 = aom_highbd_10_obmc_variance16x8_c;
  }
  pcVar280 = aom_highbd_10_obmc_variance32x16_sse4_1;
  if (bVar445) {
    pcVar280 = aom_highbd_10_obmc_variance32x16_c;
  }
  pcVar281 = aom_highbd_10_obmc_variance32x32_sse4_1;
  if (bVar445) {
    pcVar281 = aom_highbd_10_obmc_variance32x32_c;
  }
  pcVar282 = aom_highbd_10_obmc_variance32x64_sse4_1;
  if (bVar445) {
    pcVar282 = aom_highbd_10_obmc_variance32x64_c;
  }
  pcVar283 = aom_highbd_10_obmc_variance32x8_sse4_1;
  if (bVar445) {
    pcVar283 = aom_highbd_10_obmc_variance32x8_c;
  }
  pcVar284 = aom_highbd_10_obmc_variance4x16_sse4_1;
  if (bVar445) {
    pcVar284 = aom_highbd_10_obmc_variance4x16_c;
  }
  pcVar285 = aom_highbd_10_obmc_variance4x4_sse4_1;
  if (bVar445) {
    pcVar285 = aom_highbd_10_obmc_variance4x4_c;
  }
  pcVar286 = aom_highbd_10_obmc_variance4x8_sse4_1;
  if (bVar445) {
    pcVar286 = aom_highbd_10_obmc_variance4x8_c;
  }
  pcVar287 = aom_highbd_10_obmc_variance64x128_sse4_1;
  if (bVar445) {
    pcVar287 = aom_highbd_10_obmc_variance64x128_c;
  }
  pcVar288 = aom_highbd_10_obmc_variance64x16_sse4_1;
  if (bVar445) {
    pcVar288 = aom_highbd_10_obmc_variance64x16_c;
  }
  pcVar289 = aom_highbd_10_obmc_variance64x32_sse4_1;
  if (bVar445) {
    pcVar289 = aom_highbd_10_obmc_variance64x32_c;
  }
  pcVar444 = aom_highbd_10_obmc_variance64x64_sse4_1;
  if (bVar445) {
    pcVar444 = aom_highbd_10_obmc_variance64x64_c;
  }
  pcVar443 = aom_highbd_10_obmc_variance8x16_sse4_1;
  if (bVar445) {
    pcVar443 = aom_highbd_10_obmc_variance8x16_c;
  }
  pcVar268 = aom_highbd_10_obmc_variance8x32_sse4_1;
  if (bVar445) {
    pcVar268 = aom_highbd_10_obmc_variance8x32_c;
  }
  pcVar345 = aom_highbd_10_obmc_variance8x4_sse4_1;
  if (bVar445) {
    pcVar345 = aom_highbd_10_obmc_variance8x4_c;
  }
  pcVar344 = aom_highbd_10_obmc_variance8x8_sse4_1;
  if (bVar445) {
    pcVar344 = aom_highbd_10_obmc_variance8x8_c;
  }
  pcVar343 = aom_highbd_10_sub_pixel_avg_variance4x4_sse4_1;
  if (bVar445) {
    pcVar343 = aom_highbd_10_sub_pixel_avg_variance4x4_c;
  }
  pcVar290 = aom_highbd_10_sub_pixel_variance4x4_sse4_1;
  if (bVar445) {
    pcVar290 = aom_highbd_10_sub_pixel_variance4x4_c;
  }
  pcVar291 = aom_highbd_10_variance4x4_sse4_1;
  if (bVar445) {
    pcVar291 = aom_highbd_10_variance4x4_c;
  }
  pcVar292 = aom_highbd_12_obmc_variance128x128_sse4_1;
  if (bVar445) {
    pcVar292 = aom_highbd_12_obmc_variance128x128_c;
  }
  pcVar293 = aom_highbd_12_obmc_variance128x64_sse4_1;
  if (bVar445) {
    pcVar293 = aom_highbd_12_obmc_variance128x64_c;
  }
  pcVar294 = aom_highbd_12_obmc_variance16x16_sse4_1;
  if (bVar445) {
    pcVar294 = aom_highbd_12_obmc_variance16x16_c;
  }
  pcVar295 = aom_highbd_12_obmc_variance16x32_sse4_1;
  if (bVar445) {
    pcVar295 = aom_highbd_12_obmc_variance16x32_c;
  }
  pcVar296 = aom_highbd_12_obmc_variance16x4_sse4_1;
  if (bVar445) {
    pcVar296 = aom_highbd_12_obmc_variance16x4_c;
  }
  pcVar297 = aom_highbd_12_obmc_variance16x64_sse4_1;
  if (bVar445) {
    pcVar297 = aom_highbd_12_obmc_variance16x64_c;
  }
  pcVar298 = aom_highbd_12_obmc_variance16x8_sse4_1;
  if (bVar445) {
    pcVar298 = aom_highbd_12_obmc_variance16x8_c;
  }
  pcVar299 = aom_highbd_12_obmc_variance32x16_sse4_1;
  if (bVar445) {
    pcVar299 = aom_highbd_12_obmc_variance32x16_c;
  }
  pcVar300 = aom_highbd_12_obmc_variance32x32_sse4_1;
  if (bVar445) {
    pcVar300 = aom_highbd_12_obmc_variance32x32_c;
  }
  pcVar301 = aom_highbd_12_obmc_variance32x64_sse4_1;
  if (bVar445) {
    pcVar301 = aom_highbd_12_obmc_variance32x64_c;
  }
  pcVar302 = aom_highbd_12_obmc_variance32x8_sse4_1;
  if (bVar445) {
    pcVar302 = aom_highbd_12_obmc_variance32x8_c;
  }
  pcVar303 = aom_highbd_12_obmc_variance4x16_sse4_1;
  if (bVar445) {
    pcVar303 = aom_highbd_12_obmc_variance4x16_c;
  }
  pcVar304 = aom_highbd_12_obmc_variance4x4_sse4_1;
  if (bVar445) {
    pcVar304 = aom_highbd_12_obmc_variance4x4_c;
  }
  pcVar305 = aom_highbd_12_obmc_variance4x8_sse4_1;
  if (bVar445) {
    pcVar305 = aom_highbd_12_obmc_variance4x8_c;
  }
  pcVar306 = aom_highbd_12_obmc_variance64x128_sse4_1;
  if (bVar445) {
    pcVar306 = aom_highbd_12_obmc_variance64x128_c;
  }
  pcVar307 = aom_highbd_12_obmc_variance64x16_sse4_1;
  if (bVar445) {
    pcVar307 = aom_highbd_12_obmc_variance64x16_c;
  }
  pcVar308 = aom_highbd_12_obmc_variance64x32_sse4_1;
  if (bVar445) {
    pcVar308 = aom_highbd_12_obmc_variance64x32_c;
  }
  pcVar309 = aom_highbd_12_obmc_variance64x64_sse4_1;
  if (bVar445) {
    pcVar309 = aom_highbd_12_obmc_variance64x64_c;
  }
  pcVar310 = aom_highbd_12_obmc_variance8x16_sse4_1;
  if (bVar445) {
    pcVar310 = aom_highbd_12_obmc_variance8x16_c;
  }
  pcVar311 = aom_highbd_12_obmc_variance8x32_sse4_1;
  if (bVar445) {
    pcVar311 = aom_highbd_12_obmc_variance8x32_c;
  }
  pcVar312 = aom_highbd_12_obmc_variance8x4_sse4_1;
  if (bVar445) {
    pcVar312 = aom_highbd_12_obmc_variance8x4_c;
  }
  pcVar313 = aom_highbd_12_obmc_variance8x8_sse4_1;
  if (bVar445) {
    pcVar313 = aom_highbd_12_obmc_variance8x8_c;
  }
  pcVar314 = aom_highbd_12_sub_pixel_avg_variance4x4_sse4_1;
  if (bVar445) {
    pcVar314 = aom_highbd_12_sub_pixel_avg_variance4x4_c;
  }
  pcVar315 = aom_highbd_12_sub_pixel_variance4x4_sse4_1;
  if (bVar445) {
    pcVar315 = aom_highbd_12_sub_pixel_variance4x4_c;
  }
  pcVar316 = aom_highbd_12_variance4x4_sse4_1;
  if (bVar445) {
    pcVar316 = aom_highbd_12_variance4x4_c;
  }
  pcVar317 = aom_highbd_8_obmc_variance128x128_sse4_1;
  if (bVar445) {
    pcVar317 = aom_highbd_8_obmc_variance128x128_c;
  }
  pcVar318 = aom_highbd_8_obmc_variance128x64_sse4_1;
  if (bVar445) {
    pcVar318 = aom_highbd_8_obmc_variance128x64_c;
  }
  pcVar319 = aom_highbd_8_obmc_variance16x16_sse4_1;
  if (bVar445) {
    pcVar319 = aom_highbd_8_obmc_variance16x16_c;
  }
  pcVar320 = aom_highbd_8_obmc_variance16x32_sse4_1;
  if (bVar445) {
    pcVar320 = aom_highbd_8_obmc_variance16x32_c;
  }
  pcVar321 = aom_highbd_8_obmc_variance16x4_sse4_1;
  if (bVar445) {
    pcVar321 = aom_highbd_8_obmc_variance16x4_c;
  }
  pcVar322 = aom_highbd_8_obmc_variance16x64_sse4_1;
  if (bVar445) {
    pcVar322 = aom_highbd_8_obmc_variance16x64_c;
  }
  pcVar323 = aom_highbd_8_obmc_variance16x8_sse4_1;
  if (bVar445) {
    pcVar323 = aom_highbd_8_obmc_variance16x8_c;
  }
  pcVar324 = aom_highbd_8_obmc_variance32x16_sse4_1;
  if (bVar445) {
    pcVar324 = aom_highbd_8_obmc_variance32x16_c;
  }
  pcVar325 = aom_highbd_8_obmc_variance32x32_sse4_1;
  if (bVar445) {
    pcVar325 = aom_highbd_8_obmc_variance32x32_c;
  }
  pcVar326 = aom_highbd_8_obmc_variance32x64_sse4_1;
  if (bVar445) {
    pcVar326 = aom_highbd_8_obmc_variance32x64_c;
  }
  pcVar327 = aom_highbd_8_obmc_variance32x8_sse4_1;
  if (bVar445) {
    pcVar327 = aom_highbd_8_obmc_variance32x8_c;
  }
  pcVar328 = aom_highbd_8_obmc_variance4x16_sse4_1;
  if (bVar445) {
    pcVar328 = aom_highbd_8_obmc_variance4x16_c;
  }
  pcVar329 = aom_highbd_8_obmc_variance4x4_sse4_1;
  if (bVar445) {
    pcVar329 = aom_highbd_8_obmc_variance4x4_c;
  }
  pcVar330 = aom_highbd_8_obmc_variance4x8_sse4_1;
  if (bVar445) {
    pcVar330 = aom_highbd_8_obmc_variance4x8_c;
  }
  pcVar331 = aom_highbd_8_obmc_variance64x128_sse4_1;
  if (bVar445) {
    pcVar331 = aom_highbd_8_obmc_variance64x128_c;
  }
  pcVar332 = aom_highbd_8_obmc_variance64x16_sse4_1;
  if (bVar445) {
    pcVar332 = aom_highbd_8_obmc_variance64x16_c;
  }
  pcVar333 = aom_highbd_8_obmc_variance64x32_sse4_1;
  if (bVar445) {
    pcVar333 = aom_highbd_8_obmc_variance64x32_c;
  }
  pcVar334 = aom_highbd_8_obmc_variance64x64_sse4_1;
  if (bVar445) {
    pcVar334 = aom_highbd_8_obmc_variance64x64_c;
  }
  pcVar335 = aom_highbd_8_obmc_variance8x16_sse4_1;
  if (bVar445) {
    pcVar335 = aom_highbd_8_obmc_variance8x16_c;
  }
  pcVar336 = aom_highbd_8_obmc_variance8x32_sse4_1;
  if (bVar445) {
    pcVar336 = aom_highbd_8_obmc_variance8x32_c;
  }
  pcVar337 = aom_highbd_8_obmc_variance8x4_sse4_1;
  if (bVar445) {
    pcVar337 = aom_highbd_8_obmc_variance8x4_c;
  }
  pcVar338 = aom_highbd_8_obmc_variance8x8_sse4_1;
  if (bVar445) {
    pcVar338 = aom_highbd_8_obmc_variance8x8_c;
  }
  pcVar339 = aom_highbd_8_sub_pixel_avg_variance4x4_sse4_1;
  if (bVar445) {
    pcVar339 = aom_highbd_8_sub_pixel_avg_variance4x4_c;
  }
  pcVar340 = aom_highbd_8_sub_pixel_variance4x4_sse4_1;
  if (bVar445) {
    pcVar340 = aom_highbd_8_sub_pixel_variance4x4_c;
  }
  pcVar341 = aom_highbd_8_variance4x4_sse4_1;
  if (bVar445) {
    pcVar341 = aom_highbd_8_variance4x4_c;
  }
  pcVar342 = aom_highbd_blend_a64_d16_mask_sse4_1;
  if (bVar445) {
    pcVar342 = aom_highbd_blend_a64_d16_mask_c;
  }
  pcVar346 = aom_highbd_blend_a64_hmask_sse4_1;
  if (bVar445) {
    pcVar346 = aom_highbd_blend_a64_hmask_c;
  }
  pcVar347 = aom_highbd_blend_a64_mask_sse4_1;
  if (bVar445) {
    pcVar347 = aom_highbd_blend_a64_mask_c;
  }
  pcVar348 = aom_highbd_blend_a64_vmask_sse4_1;
  if (bVar445) {
    pcVar348 = aom_highbd_blend_a64_vmask_c;
  }
  pcVar349 = aom_highbd_obmc_sad128x128_sse4_1;
  if (bVar445) {
    pcVar349 = aom_highbd_obmc_sad128x128_c;
  }
  pcVar350 = aom_highbd_obmc_sad128x64_sse4_1;
  if (bVar445) {
    pcVar350 = aom_highbd_obmc_sad128x64_c;
  }
  pcVar351 = aom_highbd_obmc_sad16x16_sse4_1;
  if (bVar445) {
    pcVar351 = aom_highbd_obmc_sad16x16_c;
  }
  pcVar352 = aom_highbd_obmc_sad16x32_sse4_1;
  if (bVar445) {
    pcVar352 = aom_highbd_obmc_sad16x32_c;
  }
  pcVar353 = aom_highbd_obmc_sad16x4_sse4_1;
  if (bVar445) {
    pcVar353 = aom_highbd_obmc_sad16x4_c;
  }
  pcVar354 = aom_highbd_obmc_sad16x64_sse4_1;
  if (bVar445) {
    pcVar354 = aom_highbd_obmc_sad16x64_c;
  }
  pcVar355 = aom_highbd_obmc_sad16x8_sse4_1;
  if (bVar445) {
    pcVar355 = aom_highbd_obmc_sad16x8_c;
  }
  pcVar356 = aom_highbd_obmc_sad32x16_sse4_1;
  if (bVar445) {
    pcVar356 = aom_highbd_obmc_sad32x16_c;
  }
  pcVar357 = aom_highbd_obmc_sad32x32_sse4_1;
  if (bVar445) {
    pcVar357 = aom_highbd_obmc_sad32x32_c;
  }
  pcVar358 = aom_highbd_obmc_sad32x64_sse4_1;
  if (bVar445) {
    pcVar358 = aom_highbd_obmc_sad32x64_c;
  }
  pcVar359 = aom_highbd_obmc_sad32x8_sse4_1;
  if (bVar445) {
    pcVar359 = aom_highbd_obmc_sad32x8_c;
  }
  pcVar360 = aom_highbd_obmc_sad4x16_sse4_1;
  if (bVar445) {
    pcVar360 = aom_highbd_obmc_sad4x16_c;
  }
  pcVar361 = aom_highbd_obmc_sad4x4_sse4_1;
  if (bVar445) {
    pcVar361 = aom_highbd_obmc_sad4x4_c;
  }
  pcVar362 = aom_highbd_obmc_sad4x8_sse4_1;
  if (bVar445) {
    pcVar362 = aom_highbd_obmc_sad4x8_c;
  }
  pcVar363 = aom_highbd_obmc_sad64x128_sse4_1;
  if (bVar445) {
    pcVar363 = aom_highbd_obmc_sad64x128_c;
  }
  pcVar364 = aom_highbd_obmc_sad64x16_sse4_1;
  if (bVar445) {
    pcVar364 = aom_highbd_obmc_sad64x16_c;
  }
  pcVar365 = aom_highbd_obmc_sad64x32_sse4_1;
  if (bVar445) {
    pcVar365 = aom_highbd_obmc_sad64x32_c;
  }
  pcVar366 = aom_highbd_obmc_sad64x64_sse4_1;
  if (bVar445) {
    pcVar366 = aom_highbd_obmc_sad64x64_c;
  }
  pcVar367 = aom_highbd_obmc_sad8x16_sse4_1;
  if (bVar445) {
    pcVar367 = aom_highbd_obmc_sad8x16_c;
  }
  pcVar368 = aom_highbd_obmc_sad8x32_sse4_1;
  if (bVar445) {
    pcVar368 = aom_highbd_obmc_sad8x32_c;
  }
  pcVar369 = aom_highbd_obmc_sad8x4_sse4_1;
  if (bVar445) {
    pcVar369 = aom_highbd_obmc_sad8x4_c;
  }
  pcVar370 = aom_highbd_obmc_sad8x8_sse4_1;
  if (bVar445) {
    pcVar370 = aom_highbd_obmc_sad8x8_c;
  }
  pcVar371 = aom_highbd_sse_sse4_1;
  if (bVar445) {
    pcVar371 = aom_highbd_sse_c;
  }
  pcVar372 = aom_lowbd_blend_a64_d16_mask_sse4_1;
  if (bVar445) {
    pcVar372 = aom_lowbd_blend_a64_d16_mask_c;
  }
  pcVar373 = aom_obmc_sad128x128_sse4_1;
  if (bVar445) {
    pcVar373 = aom_obmc_sad128x128_c;
  }
  pcVar374 = aom_obmc_sad128x64_sse4_1;
  if (bVar445) {
    pcVar374 = aom_obmc_sad128x64_c;
  }
  pcVar375 = aom_obmc_sad16x16_sse4_1;
  if (bVar445) {
    pcVar375 = aom_obmc_sad16x16_c;
  }
  pcVar376 = aom_obmc_sad16x32_sse4_1;
  if (bVar445) {
    pcVar376 = aom_obmc_sad16x32_c;
  }
  pcVar377 = aom_obmc_sad16x4_sse4_1;
  if (bVar445) {
    pcVar377 = aom_obmc_sad16x4_c;
  }
  pcVar378 = aom_obmc_sad16x64_sse4_1;
  if (bVar445) {
    pcVar378 = aom_obmc_sad16x64_c;
  }
  pcVar379 = aom_obmc_sad16x8_sse4_1;
  if (bVar445) {
    pcVar379 = aom_obmc_sad16x8_c;
  }
  pcVar380 = aom_obmc_sad32x16_sse4_1;
  if (bVar445) {
    pcVar380 = aom_obmc_sad32x16_c;
  }
  pcVar381 = aom_obmc_sad32x32_sse4_1;
  if (bVar445) {
    pcVar381 = aom_obmc_sad32x32_c;
  }
  pcVar382 = aom_obmc_sad32x64_sse4_1;
  if (bVar445) {
    pcVar382 = aom_obmc_sad32x64_c;
  }
  pcVar383 = aom_obmc_sad32x8_sse4_1;
  if (bVar445) {
    pcVar383 = aom_obmc_sad32x8_c;
  }
  pcVar384 = aom_obmc_sad4x16_sse4_1;
  if (bVar445) {
    pcVar384 = aom_obmc_sad4x16_c;
  }
  pcVar385 = aom_obmc_sad4x4_sse4_1;
  if (bVar445) {
    pcVar385 = aom_obmc_sad4x4_c;
  }
  pcVar386 = aom_obmc_sad4x8_sse4_1;
  if (bVar445) {
    pcVar386 = aom_obmc_sad4x8_c;
  }
  pcVar387 = aom_obmc_sad64x128_sse4_1;
  if (bVar445) {
    pcVar387 = aom_obmc_sad64x128_c;
  }
  pcVar388 = aom_obmc_sad64x16_sse4_1;
  if (bVar445) {
    pcVar388 = aom_obmc_sad64x16_c;
  }
  pcVar389 = aom_obmc_sad64x32_sse4_1;
  if (bVar445) {
    pcVar389 = aom_obmc_sad64x32_c;
  }
  pcVar390 = aom_obmc_sad64x64_sse4_1;
  if (bVar445) {
    pcVar390 = aom_obmc_sad64x64_c;
  }
  pcVar391 = aom_obmc_sad8x16_sse4_1;
  if (bVar445) {
    pcVar391 = aom_obmc_sad8x16_c;
  }
  pcVar392 = aom_obmc_sad8x32_sse4_1;
  if (bVar445) {
    pcVar392 = aom_obmc_sad8x32_c;
  }
  pcVar393 = aom_obmc_sad8x4_sse4_1;
  if (bVar445) {
    pcVar393 = aom_obmc_sad8x4_c;
  }
  pcVar394 = aom_obmc_sad8x8_sse4_1;
  if (bVar445) {
    pcVar394 = aom_obmc_sad8x8_c;
  }
  pcVar395 = aom_obmc_sub_pixel_variance128x128_sse4_1;
  if (bVar445) {
    pcVar395 = aom_obmc_sub_pixel_variance128x128_c;
  }
  pcVar396 = aom_obmc_sub_pixel_variance128x64_sse4_1;
  if (bVar445) {
    pcVar396 = aom_obmc_sub_pixel_variance128x64_c;
  }
  pcVar397 = aom_obmc_sub_pixel_variance16x16_sse4_1;
  if (bVar445) {
    pcVar397 = aom_obmc_sub_pixel_variance16x16_c;
  }
  pcVar398 = aom_obmc_sub_pixel_variance16x32_sse4_1;
  if (bVar445) {
    pcVar398 = aom_obmc_sub_pixel_variance16x32_c;
  }
  pcVar399 = aom_obmc_sub_pixel_variance16x4_sse4_1;
  if (bVar445) {
    pcVar399 = aom_obmc_sub_pixel_variance16x4_c;
  }
  pcVar400 = aom_obmc_sub_pixel_variance16x64_sse4_1;
  if (bVar445) {
    pcVar400 = aom_obmc_sub_pixel_variance16x64_c;
  }
  pcVar401 = aom_obmc_sub_pixel_variance16x8_sse4_1;
  if (bVar445) {
    pcVar401 = aom_obmc_sub_pixel_variance16x8_c;
  }
  pcVar402 = aom_obmc_sub_pixel_variance32x16_sse4_1;
  if (bVar445) {
    pcVar402 = aom_obmc_sub_pixel_variance32x16_c;
  }
  pcVar403 = aom_obmc_sub_pixel_variance32x32_sse4_1;
  if (bVar445) {
    pcVar403 = aom_obmc_sub_pixel_variance32x32_c;
  }
  pcVar404 = aom_obmc_sub_pixel_variance32x64_sse4_1;
  if (bVar445) {
    pcVar404 = aom_obmc_sub_pixel_variance32x64_c;
  }
  pcVar405 = aom_obmc_sub_pixel_variance32x8_sse4_1;
  if (bVar445) {
    pcVar405 = aom_obmc_sub_pixel_variance32x8_c;
  }
  pcVar406 = aom_obmc_sub_pixel_variance4x16_sse4_1;
  if (bVar445) {
    pcVar406 = aom_obmc_sub_pixel_variance4x16_c;
  }
  pcVar407 = aom_obmc_sub_pixel_variance4x4_sse4_1;
  if (bVar445) {
    pcVar407 = aom_obmc_sub_pixel_variance4x4_c;
  }
  pcVar408 = aom_obmc_sub_pixel_variance4x8_sse4_1;
  if (bVar445) {
    pcVar408 = aom_obmc_sub_pixel_variance4x8_c;
  }
  pcVar409 = aom_obmc_sub_pixel_variance64x128_sse4_1;
  if (bVar445) {
    pcVar409 = aom_obmc_sub_pixel_variance64x128_c;
  }
  pcVar410 = aom_obmc_sub_pixel_variance64x16_sse4_1;
  if (bVar445) {
    pcVar410 = aom_obmc_sub_pixel_variance64x16_c;
  }
  pcVar411 = aom_obmc_sub_pixel_variance64x32_sse4_1;
  if (bVar445) {
    pcVar411 = aom_obmc_sub_pixel_variance64x32_c;
  }
  pcVar412 = aom_obmc_sub_pixel_variance64x64_sse4_1;
  if (bVar445) {
    pcVar412 = aom_obmc_sub_pixel_variance64x64_c;
  }
  pcVar413 = aom_obmc_sub_pixel_variance8x16_sse4_1;
  if (bVar445) {
    pcVar413 = aom_obmc_sub_pixel_variance8x16_c;
  }
  pcVar414 = aom_obmc_sub_pixel_variance8x32_sse4_1;
  if (bVar445) {
    pcVar414 = aom_obmc_sub_pixel_variance8x32_c;
  }
  pcVar415 = aom_obmc_sub_pixel_variance8x4_sse4_1;
  if (bVar445) {
    pcVar415 = aom_obmc_sub_pixel_variance8x4_c;
  }
  pcVar416 = aom_obmc_sub_pixel_variance8x8_sse4_1;
  if (bVar445) {
    pcVar416 = aom_obmc_sub_pixel_variance8x8_c;
  }
  pcVar417 = aom_obmc_variance128x128_sse4_1;
  if (bVar445) {
    pcVar417 = aom_obmc_variance128x128_c;
  }
  pcVar418 = aom_obmc_variance128x64_sse4_1;
  if (bVar445) {
    pcVar418 = aom_obmc_variance128x64_c;
  }
  pcVar419 = aom_obmc_variance16x16_sse4_1;
  if (bVar445) {
    pcVar419 = aom_obmc_variance16x16_c;
  }
  pcVar420 = aom_obmc_variance16x32_sse4_1;
  if (bVar445) {
    pcVar420 = aom_obmc_variance16x32_c;
  }
  pcVar421 = aom_obmc_variance16x4_sse4_1;
  if (bVar445) {
    pcVar421 = aom_obmc_variance16x4_c;
  }
  pcVar422 = aom_obmc_variance16x64_sse4_1;
  if (bVar445) {
    pcVar422 = aom_obmc_variance16x64_c;
  }
  pcVar423 = aom_obmc_variance16x8_sse4_1;
  if (bVar445) {
    pcVar423 = aom_obmc_variance16x8_c;
  }
  pcVar424 = aom_obmc_variance32x16_sse4_1;
  if (bVar445) {
    pcVar424 = aom_obmc_variance32x16_c;
  }
  pcVar425 = aom_obmc_variance32x32_sse4_1;
  if (bVar445) {
    pcVar425 = aom_obmc_variance32x32_c;
  }
  pcVar426 = aom_obmc_variance32x64_sse4_1;
  if (bVar445) {
    pcVar426 = aom_obmc_variance32x64_c;
  }
  pcVar427 = aom_obmc_variance32x8_sse4_1;
  if (bVar445) {
    pcVar427 = aom_obmc_variance32x8_c;
  }
  pcVar428 = aom_obmc_variance4x16_sse4_1;
  if (bVar445) {
    pcVar428 = aom_obmc_variance4x16_c;
  }
  pcVar429 = aom_obmc_variance4x4_sse4_1;
  if (bVar445) {
    pcVar429 = aom_obmc_variance4x4_c;
  }
  pcVar430 = aom_obmc_variance4x8_sse4_1;
  if (bVar445) {
    pcVar430 = aom_obmc_variance4x8_c;
  }
  pcVar431 = aom_obmc_variance64x128_sse4_1;
  if (bVar445) {
    pcVar431 = aom_obmc_variance64x128_c;
  }
  pcVar432 = aom_obmc_variance64x16_sse4_1;
  if (bVar445) {
    pcVar432 = aom_obmc_variance64x16_c;
  }
  pcVar433 = aom_obmc_variance64x32_sse4_1;
  if (bVar445) {
    pcVar433 = aom_obmc_variance64x32_c;
  }
  pcVar434 = aom_obmc_variance64x64_sse4_1;
  if (bVar445) {
    pcVar434 = aom_obmc_variance64x64_c;
  }
  pcVar435 = aom_obmc_variance8x16_sse4_1;
  if (bVar445) {
    pcVar435 = aom_obmc_variance8x16_c;
  }
  pcVar436 = aom_obmc_variance8x32_sse4_1;
  if (bVar445) {
    pcVar436 = aom_obmc_variance8x32_c;
  }
  pcVar437 = aom_obmc_variance8x4_sse4_1;
  if (bVar445) {
    pcVar437 = aom_obmc_variance8x4_c;
  }
  pcVar438 = aom_obmc_variance8x8_sse4_1;
  if (bVar445) {
    pcVar438 = aom_obmc_variance8x8_c;
  }
  pcVar439 = aom_sse_sse4_1;
  if (bVar445) {
    pcVar439 = aom_sse_c;
  }
  pcVar440 = aom_vector_var_sse4_1;
  if (bVar445) {
    pcVar440 = aom_vector_var_c;
  }
  bVar445 = -1 < (char)uVar5;
  pcVar442 = aom_avg_8x8_quad_avx2;
  if (bVar445) {
    pcVar442 = aom_avg_8x8_quad_sse2;
  }
  aom_avg_8x8_quad = pcVar442;
  aom_blend_a64_hmask = pcVar267;
  if (!bVar445) {
    pcVar269 = aom_blend_a64_mask_avx2;
  }
  aom_blend_a64_mask = pcVar269;
  aom_blend_a64_vmask = pcVar272;
  pcVar267 = aom_comp_avg_pred_avx2;
  if (bVar445) {
    pcVar267 = aom_comp_avg_pred_c;
  }
  aom_comp_avg_pred = pcVar267;
  if (!bVar445) {
    pcVar6 = aom_comp_mask_pred_avx2;
    pcVar263 = aom_compute_correlation_avx2;
  }
  aom_comp_mask_pred = pcVar6;
  if (!bVar445) {
    pcVar270 = aom_compute_flow_at_point_avx2;
  }
  aom_compute_correlation = pcVar263;
  aom_compute_flow_at_point = pcVar270;
  if (!bVar445) {
    pcVar265 = aom_compute_mean_stddev_avx2;
  }
  aom_compute_mean_stddev = pcVar265;
  if (!bVar445) {
    pcVar7 = aom_convolve8_horiz_avx2;
    pcVar8 = aom_convolve8_vert_avx2;
  }
  aom_convolve8_horiz = pcVar7;
  aom_convolve8_vert = pcVar8;
  pcVar6 = aom_convolve_copy_avx2;
  if (bVar445) {
    pcVar6 = aom_convolve_copy_sse2;
  }
  pcVar7 = aom_dc_128_predictor_32x16_avx2;
  if (bVar445) {
    pcVar7 = aom_dc_128_predictor_32x16_sse2;
  }
  aom_convolve_copy = pcVar6;
  aom_dc_128_predictor_32x16 = pcVar7;
  pcVar6 = aom_dc_128_predictor_32x32_avx2;
  if (bVar445) {
    pcVar6 = aom_dc_128_predictor_32x32_sse2;
  }
  pcVar7 = aom_dc_128_predictor_32x64_avx2;
  if (bVar445) {
    pcVar7 = aom_dc_128_predictor_32x64_sse2;
  }
  aom_dc_128_predictor_32x32 = pcVar6;
  aom_dc_128_predictor_32x64 = pcVar7;
  pcVar6 = aom_dc_128_predictor_64x16_avx2;
  if (bVar445) {
    pcVar6 = aom_dc_128_predictor_64x16_sse2;
  }
  pcVar7 = aom_dc_128_predictor_64x32_avx2;
  if (bVar445) {
    pcVar7 = aom_dc_128_predictor_64x32_sse2;
  }
  aom_dc_128_predictor_64x16 = pcVar6;
  aom_dc_128_predictor_64x32 = pcVar7;
  pcVar6 = aom_dc_128_predictor_64x64_avx2;
  if (bVar445) {
    pcVar6 = aom_dc_128_predictor_64x64_sse2;
  }
  pcVar7 = aom_dc_left_predictor_32x16_avx2;
  if (bVar445) {
    pcVar7 = aom_dc_left_predictor_32x16_sse2;
  }
  aom_dc_128_predictor_64x64 = pcVar6;
  aom_dc_left_predictor_32x16 = pcVar7;
  pcVar6 = aom_dc_left_predictor_32x32_avx2;
  if (bVar445) {
    pcVar6 = aom_dc_left_predictor_32x32_sse2;
  }
  pcVar7 = aom_dc_left_predictor_32x64_avx2;
  if (bVar445) {
    pcVar7 = aom_dc_left_predictor_32x64_sse2;
  }
  aom_dc_left_predictor_32x32 = pcVar6;
  aom_dc_left_predictor_32x64 = pcVar7;
  pcVar6 = aom_dc_left_predictor_64x16_avx2;
  if (bVar445) {
    pcVar6 = aom_dc_left_predictor_64x16_sse2;
  }
  pcVar7 = aom_dc_left_predictor_64x32_avx2;
  if (bVar445) {
    pcVar7 = aom_dc_left_predictor_64x32_sse2;
  }
  aom_dc_left_predictor_64x16 = pcVar6;
  aom_dc_left_predictor_64x32 = pcVar7;
  pcVar6 = aom_dc_left_predictor_64x64_avx2;
  if (bVar445) {
    pcVar6 = aom_dc_left_predictor_64x64_sse2;
  }
  pcVar7 = aom_dc_predictor_32x16_avx2;
  if (bVar445) {
    pcVar7 = aom_dc_predictor_32x16_sse2;
  }
  aom_dc_left_predictor_64x64 = pcVar6;
  aom_dc_predictor_32x16 = pcVar7;
  pcVar6 = aom_dc_predictor_32x32_avx2;
  if (bVar445) {
    pcVar6 = aom_dc_predictor_32x32_sse2;
  }
  pcVar7 = aom_dc_predictor_32x64_avx2;
  if (bVar445) {
    pcVar7 = aom_dc_predictor_32x64_sse2;
  }
  aom_dc_predictor_32x32 = pcVar6;
  aom_dc_predictor_32x64 = pcVar7;
  pcVar6 = aom_dc_predictor_64x16_avx2;
  if (bVar445) {
    pcVar6 = aom_dc_predictor_64x16_sse2;
  }
  pcVar7 = aom_dc_predictor_64x32_avx2;
  if (bVar445) {
    pcVar7 = aom_dc_predictor_64x32_sse2;
  }
  aom_dc_predictor_64x16 = pcVar6;
  aom_dc_predictor_64x32 = pcVar7;
  pcVar6 = aom_dc_predictor_64x64_avx2;
  if (bVar445) {
    pcVar6 = aom_dc_predictor_64x64_sse2;
  }
  pcVar7 = aom_dc_top_predictor_32x16_avx2;
  if (bVar445) {
    pcVar7 = aom_dc_top_predictor_32x16_sse2;
  }
  aom_dc_predictor_64x64 = pcVar6;
  aom_dc_top_predictor_32x16 = pcVar7;
  pcVar6 = aom_dc_top_predictor_32x32_avx2;
  if (bVar445) {
    pcVar6 = aom_dc_top_predictor_32x32_sse2;
  }
  pcVar7 = aom_dc_top_predictor_32x64_avx2;
  if (bVar445) {
    pcVar7 = aom_dc_top_predictor_32x64_sse2;
  }
  aom_dc_top_predictor_32x32 = pcVar6;
  aom_dc_top_predictor_32x64 = pcVar7;
  pcVar6 = aom_dc_top_predictor_64x16_avx2;
  if (bVar445) {
    pcVar6 = aom_dc_top_predictor_64x16_sse2;
  }
  pcVar7 = aom_dc_top_predictor_64x32_avx2;
  if (bVar445) {
    pcVar7 = aom_dc_top_predictor_64x32_sse2;
  }
  aom_dc_top_predictor_64x16 = pcVar6;
  aom_dc_top_predictor_64x32 = pcVar7;
  pcVar6 = aom_dc_top_predictor_64x64_avx2;
  if (bVar445) {
    pcVar6 = aom_dc_top_predictor_64x64_sse2;
  }
  pcVar7 = aom_fft16x16_float_avx2;
  if (bVar445) {
    pcVar7 = aom_fft16x16_float_sse2;
  }
  aom_dc_top_predictor_64x64 = pcVar6;
  aom_fft16x16_float = pcVar7;
  pcVar6 = aom_fft32x32_float_avx2;
  if (bVar445) {
    pcVar6 = aom_fft32x32_float_sse2;
  }
  pcVar7 = aom_fft8x8_float_avx2;
  if (bVar445) {
    pcVar7 = aom_fft8x8_float_sse2;
  }
  aom_fft32x32_float = pcVar6;
  aom_fft8x8_float = pcVar7;
  pcVar6 = aom_get_blk_sse_sum_avx2;
  if (bVar445) {
    pcVar6 = aom_get_blk_sse_sum_sse2;
  }
  pcVar7 = aom_get_var_sse_sum_16x16_dual_avx2;
  if (bVar445) {
    pcVar7 = aom_get_var_sse_sum_16x16_dual_sse2;
  }
  aom_get_blk_sse_sum = pcVar6;
  aom_get_var_sse_sum_16x16_dual = pcVar7;
  pcVar6 = aom_get_var_sse_sum_8x8_quad_avx2;
  if (bVar445) {
    pcVar6 = aom_get_var_sse_sum_8x8_quad_sse2;
  }
  pcVar7 = aom_h_predictor_32x32_avx2;
  if (bVar445) {
    pcVar7 = aom_h_predictor_32x32_sse2;
  }
  aom_get_var_sse_sum_8x8_quad = pcVar6;
  aom_h_predictor_32x32 = pcVar7;
  pcVar6 = aom_hadamard_16x16_avx2;
  if (bVar445) {
    pcVar6 = aom_hadamard_16x16_sse2;
  }
  pcVar7 = aom_hadamard_32x32_avx2;
  if (bVar445) {
    pcVar7 = aom_hadamard_32x32_sse2;
  }
  aom_hadamard_16x16 = pcVar6;
  aom_hadamard_32x32 = pcVar7;
  pcVar6 = aom_hadamard_lp_16x16_avx2;
  if (bVar445) {
    pcVar6 = aom_hadamard_lp_16x16_sse2;
  }
  pcVar7 = aom_hadamard_lp_8x8_dual_avx2;
  if (bVar445) {
    pcVar7 = aom_hadamard_lp_8x8_dual_sse2;
  }
  aom_hadamard_lp_16x16 = pcVar6;
  aom_hadamard_lp_8x8_dual = pcVar7;
  aom_highbd_10_masked_sub_pixel_variance128x128 = pcVar9;
  aom_highbd_10_masked_sub_pixel_variance128x64 = pcVar10;
  aom_highbd_10_masked_sub_pixel_variance16x16 = pcVar11;
  aom_highbd_10_masked_sub_pixel_variance16x32 = pcVar12;
  aom_highbd_10_masked_sub_pixel_variance16x4 = pcVar13;
  aom_highbd_10_masked_sub_pixel_variance16x64 = pcVar14;
  aom_highbd_10_masked_sub_pixel_variance16x8 = pcVar15;
  aom_highbd_10_masked_sub_pixel_variance32x16 = pcVar16;
  aom_highbd_10_masked_sub_pixel_variance32x32 = pcVar17;
  aom_highbd_10_masked_sub_pixel_variance32x64 = pcVar18;
  aom_highbd_10_masked_sub_pixel_variance32x8 = pcVar19;
  aom_highbd_10_masked_sub_pixel_variance4x16 = pcVar20;
  aom_highbd_10_masked_sub_pixel_variance4x4 = pcVar21;
  aom_highbd_10_masked_sub_pixel_variance4x8 = pcVar22;
  aom_highbd_10_masked_sub_pixel_variance64x128 = pcVar23;
  aom_highbd_10_masked_sub_pixel_variance64x16 = pcVar24;
  aom_highbd_10_masked_sub_pixel_variance64x32 = pcVar25;
  aom_highbd_10_masked_sub_pixel_variance64x64 = pcVar26;
  aom_highbd_10_masked_sub_pixel_variance8x16 = pcVar27;
  aom_highbd_10_masked_sub_pixel_variance8x32 = pcVar28;
  aom_highbd_10_masked_sub_pixel_variance8x4 = pcVar29;
  aom_highbd_10_masked_sub_pixel_variance8x8 = pcVar30;
  pcVar6 = aom_highbd_10_mse16x16_avx2;
  if (bVar445) {
    pcVar6 = aom_highbd_10_mse16x16_sse2;
  }
  aom_highbd_10_mse16x16 = pcVar6;
  aom_highbd_10_obmc_variance128x128 = pcVar273;
  aom_highbd_10_obmc_variance128x64 = pcVar274;
  aom_highbd_10_obmc_variance16x16 = pcVar275;
  aom_highbd_10_obmc_variance16x32 = pcVar276;
  aom_highbd_10_obmc_variance16x4 = pcVar277;
  aom_highbd_10_obmc_variance16x64 = pcVar278;
  aom_highbd_10_obmc_variance16x8 = pcVar279;
  aom_highbd_10_obmc_variance32x16 = pcVar280;
  aom_highbd_10_obmc_variance32x32 = pcVar281;
  aom_highbd_10_obmc_variance32x64 = pcVar282;
  aom_highbd_10_obmc_variance32x8 = pcVar283;
  aom_highbd_10_obmc_variance4x16 = pcVar284;
  aom_highbd_10_obmc_variance4x4 = pcVar285;
  aom_highbd_10_obmc_variance4x8 = pcVar286;
  aom_highbd_10_obmc_variance64x128 = pcVar287;
  aom_highbd_10_obmc_variance64x16 = pcVar288;
  aom_highbd_10_obmc_variance64x32 = pcVar289;
  aom_highbd_10_obmc_variance64x64 = pcVar444;
  aom_highbd_10_obmc_variance8x16 = pcVar443;
  aom_highbd_10_obmc_variance8x32 = pcVar268;
  aom_highbd_10_obmc_variance8x4 = pcVar345;
  aom_highbd_10_obmc_variance8x8 = pcVar344;
  aom_highbd_10_sub_pixel_avg_variance4x4 = pcVar343;
  pcVar6 = aom_highbd_10_sub_pixel_variance128x128_avx2;
  if (bVar445) {
    pcVar6 = aom_highbd_10_sub_pixel_variance128x128_sse2;
  }
  pcVar7 = aom_highbd_10_sub_pixel_variance128x64_avx2;
  if (bVar445) {
    pcVar7 = aom_highbd_10_sub_pixel_variance128x64_sse2;
  }
  aom_highbd_10_sub_pixel_variance128x128 = pcVar6;
  aom_highbd_10_sub_pixel_variance128x64 = pcVar7;
  pcVar6 = aom_highbd_10_sub_pixel_variance16x16_avx2;
  if (bVar445) {
    pcVar6 = aom_highbd_10_sub_pixel_variance16x16_sse2;
  }
  pcVar7 = aom_highbd_10_sub_pixel_variance16x32_avx2;
  if (bVar445) {
    pcVar7 = aom_highbd_10_sub_pixel_variance16x32_sse2;
  }
  aom_highbd_10_sub_pixel_variance16x16 = pcVar6;
  aom_highbd_10_sub_pixel_variance16x32 = pcVar7;
  pcVar6 = aom_highbd_10_sub_pixel_variance16x8_avx2;
  if (bVar445) {
    pcVar6 = aom_highbd_10_sub_pixel_variance16x8_sse2;
  }
  pcVar7 = aom_highbd_10_sub_pixel_variance32x16_avx2;
  if (bVar445) {
    pcVar7 = aom_highbd_10_sub_pixel_variance32x16_sse2;
  }
  aom_highbd_10_sub_pixel_variance16x8 = pcVar6;
  aom_highbd_10_sub_pixel_variance32x16 = pcVar7;
  pcVar6 = aom_highbd_10_sub_pixel_variance32x32_avx2;
  if (bVar445) {
    pcVar6 = aom_highbd_10_sub_pixel_variance32x32_sse2;
  }
  pcVar7 = aom_highbd_10_sub_pixel_variance32x64_avx2;
  if (bVar445) {
    pcVar7 = aom_highbd_10_sub_pixel_variance32x64_sse2;
  }
  aom_highbd_10_sub_pixel_variance32x32 = pcVar6;
  aom_highbd_10_sub_pixel_variance32x64 = pcVar7;
  pcVar6 = aom_highbd_10_sub_pixel_variance64x128_avx2;
  if (bVar445) {
    pcVar6 = aom_highbd_10_sub_pixel_variance64x128_sse2;
  }
  aom_highbd_10_sub_pixel_variance4x4 = pcVar290;
  aom_highbd_10_sub_pixel_variance64x128 = pcVar6;
  pcVar6 = aom_highbd_10_sub_pixel_variance64x32_avx2;
  if (bVar445) {
    pcVar6 = aom_highbd_10_sub_pixel_variance64x32_sse2;
  }
  pcVar7 = aom_highbd_10_sub_pixel_variance64x64_avx2;
  if (bVar445) {
    pcVar7 = aom_highbd_10_sub_pixel_variance64x64_sse2;
  }
  aom_highbd_10_sub_pixel_variance64x32 = pcVar6;
  aom_highbd_10_sub_pixel_variance64x64 = pcVar7;
  pcVar6 = aom_highbd_10_sub_pixel_variance8x16_avx2;
  if (bVar445) {
    pcVar6 = aom_highbd_10_sub_pixel_variance8x16_sse2;
  }
  pcVar7 = aom_highbd_10_sub_pixel_variance8x8_avx2;
  if (bVar445) {
    pcVar7 = aom_highbd_10_sub_pixel_variance8x8_sse2;
  }
  aom_highbd_10_sub_pixel_variance8x16 = pcVar6;
  aom_highbd_10_sub_pixel_variance8x8 = pcVar7;
  pcVar6 = aom_highbd_10_variance128x128_avx2;
  if (bVar445) {
    pcVar6 = aom_highbd_10_variance128x128_sse2;
  }
  pcVar7 = aom_highbd_10_variance128x64_avx2;
  if (bVar445) {
    pcVar7 = aom_highbd_10_variance128x64_sse2;
  }
  aom_highbd_10_variance128x128 = pcVar6;
  aom_highbd_10_variance128x64 = pcVar7;
  pcVar6 = aom_highbd_10_variance16x16_avx2;
  if (bVar445) {
    pcVar6 = aom_highbd_10_variance16x16_sse2;
  }
  pcVar7 = aom_highbd_10_variance16x32_avx2;
  if (bVar445) {
    pcVar7 = aom_highbd_10_variance16x32_sse2;
  }
  aom_highbd_10_variance16x16 = pcVar6;
  aom_highbd_10_variance16x32 = pcVar7;
  pcVar6 = aom_highbd_10_variance16x64_avx2;
  if (bVar445) {
    pcVar6 = aom_highbd_10_variance16x64_sse2;
  }
  pcVar7 = aom_highbd_10_variance16x8_avx2;
  if (bVar445) {
    pcVar7 = aom_highbd_10_variance16x8_sse2;
  }
  aom_highbd_10_variance16x64 = pcVar6;
  aom_highbd_10_variance16x8 = pcVar7;
  pcVar6 = aom_highbd_10_variance32x16_avx2;
  if (bVar445) {
    pcVar6 = aom_highbd_10_variance32x16_sse2;
  }
  pcVar7 = aom_highbd_10_variance32x32_avx2;
  if (bVar445) {
    pcVar7 = aom_highbd_10_variance32x32_sse2;
  }
  aom_highbd_10_variance32x16 = pcVar6;
  aom_highbd_10_variance32x32 = pcVar7;
  pcVar6 = aom_highbd_10_variance32x64_avx2;
  if (bVar445) {
    pcVar6 = aom_highbd_10_variance32x64_sse2;
  }
  pcVar7 = aom_highbd_10_variance32x8_avx2;
  if (bVar445) {
    pcVar7 = aom_highbd_10_variance32x8_sse2;
  }
  aom_highbd_10_variance32x64 = pcVar6;
  aom_highbd_10_variance32x8 = pcVar7;
  pcVar6 = aom_highbd_10_variance64x128_avx2;
  if (bVar445) {
    pcVar6 = aom_highbd_10_variance64x128_sse2;
  }
  aom_highbd_10_variance4x4 = pcVar291;
  aom_highbd_10_variance64x128 = pcVar6;
  pcVar6 = aom_highbd_10_variance64x16_avx2;
  if (bVar445) {
    pcVar6 = aom_highbd_10_variance64x16_sse2;
  }
  pcVar7 = aom_highbd_10_variance64x32_avx2;
  if (bVar445) {
    pcVar7 = aom_highbd_10_variance64x32_sse2;
  }
  aom_highbd_10_variance64x16 = pcVar6;
  aom_highbd_10_variance64x32 = pcVar7;
  pcVar6 = aom_highbd_10_variance64x64_avx2;
  if (bVar445) {
    pcVar6 = aom_highbd_10_variance64x64_sse2;
  }
  pcVar7 = aom_highbd_10_variance8x16_avx2;
  if (bVar445) {
    pcVar7 = aom_highbd_10_variance8x16_sse2;
  }
  aom_highbd_10_variance64x64 = pcVar6;
  aom_highbd_10_variance8x16 = pcVar7;
  pcVar6 = aom_highbd_10_variance8x32_avx2;
  if (bVar445) {
    pcVar6 = aom_highbd_10_variance8x32_sse2;
  }
  pcVar7 = aom_highbd_10_variance8x8_avx2;
  if (bVar445) {
    pcVar7 = aom_highbd_10_variance8x8_sse2;
  }
  aom_highbd_10_variance8x32 = pcVar6;
  aom_highbd_10_variance8x8 = pcVar7;
  aom_highbd_12_masked_sub_pixel_variance128x128 = pcVar31;
  aom_highbd_12_masked_sub_pixel_variance128x64 = pcVar32;
  aom_highbd_12_masked_sub_pixel_variance16x16 = pcVar33;
  aom_highbd_12_masked_sub_pixel_variance16x32 = pcVar34;
  aom_highbd_12_masked_sub_pixel_variance16x4 = pcVar35;
  aom_highbd_12_masked_sub_pixel_variance16x64 = pcVar36;
  aom_highbd_12_masked_sub_pixel_variance16x8 = pcVar37;
  aom_highbd_12_masked_sub_pixel_variance32x16 = pcVar38;
  aom_highbd_12_masked_sub_pixel_variance32x32 = pcVar39;
  aom_highbd_12_masked_sub_pixel_variance32x64 = pcVar40;
  aom_highbd_12_masked_sub_pixel_variance32x8 = pcVar41;
  aom_highbd_12_masked_sub_pixel_variance4x16 = pcVar42;
  aom_highbd_12_masked_sub_pixel_variance4x4 = pcVar43;
  aom_highbd_12_masked_sub_pixel_variance4x8 = pcVar44;
  aom_highbd_12_masked_sub_pixel_variance64x128 = pcVar45;
  aom_highbd_12_masked_sub_pixel_variance64x16 = pcVar46;
  aom_highbd_12_masked_sub_pixel_variance64x32 = pcVar47;
  aom_highbd_12_masked_sub_pixel_variance64x64 = pcVar48;
  aom_highbd_12_masked_sub_pixel_variance8x16 = pcVar49;
  aom_highbd_12_masked_sub_pixel_variance8x32 = pcVar50;
  aom_highbd_12_masked_sub_pixel_variance8x4 = pcVar51;
  aom_highbd_12_masked_sub_pixel_variance8x8 = pcVar52;
  aom_highbd_12_obmc_variance128x128 = pcVar292;
  aom_highbd_12_obmc_variance128x64 = pcVar293;
  aom_highbd_12_obmc_variance16x16 = pcVar294;
  aom_highbd_12_obmc_variance16x32 = pcVar295;
  aom_highbd_12_obmc_variance16x4 = pcVar296;
  aom_highbd_12_obmc_variance16x64 = pcVar297;
  aom_highbd_12_obmc_variance16x8 = pcVar298;
  aom_highbd_12_obmc_variance32x16 = pcVar299;
  aom_highbd_12_obmc_variance32x32 = pcVar300;
  aom_highbd_12_obmc_variance32x64 = pcVar301;
  aom_highbd_12_obmc_variance32x8 = pcVar302;
  aom_highbd_12_obmc_variance4x16 = pcVar303;
  aom_highbd_12_obmc_variance4x4 = pcVar304;
  aom_highbd_12_obmc_variance4x8 = pcVar305;
  aom_highbd_12_obmc_variance64x128 = pcVar306;
  aom_highbd_12_obmc_variance64x16 = pcVar307;
  aom_highbd_12_obmc_variance64x32 = pcVar308;
  aom_highbd_12_obmc_variance64x64 = pcVar309;
  aom_highbd_12_obmc_variance8x16 = pcVar310;
  aom_highbd_12_obmc_variance8x32 = pcVar311;
  aom_highbd_12_obmc_variance8x4 = pcVar312;
  aom_highbd_12_obmc_variance8x8 = pcVar313;
  aom_highbd_12_sub_pixel_avg_variance4x4 = pcVar314;
  aom_highbd_12_sub_pixel_variance4x4 = pcVar315;
  aom_highbd_12_variance4x4 = pcVar316;
  aom_highbd_8_masked_sub_pixel_variance128x128 = pcVar53;
  aom_highbd_8_masked_sub_pixel_variance128x64 = pcVar54;
  aom_highbd_8_masked_sub_pixel_variance16x16 = pcVar55;
  aom_highbd_8_masked_sub_pixel_variance16x32 = pcVar56;
  aom_highbd_8_masked_sub_pixel_variance16x4 = pcVar57;
  aom_highbd_8_masked_sub_pixel_variance16x64 = pcVar58;
  aom_highbd_8_masked_sub_pixel_variance16x8 = pcVar59;
  aom_highbd_8_masked_sub_pixel_variance32x16 = pcVar60;
  aom_highbd_8_masked_sub_pixel_variance32x32 = pcVar61;
  aom_highbd_8_masked_sub_pixel_variance32x64 = pcVar62;
  aom_highbd_8_masked_sub_pixel_variance32x8 = pcVar63;
  aom_highbd_8_masked_sub_pixel_variance4x16 = pcVar64;
  aom_highbd_8_masked_sub_pixel_variance4x4 = pcVar65;
  aom_highbd_8_masked_sub_pixel_variance4x8 = pcVar66;
  aom_highbd_8_masked_sub_pixel_variance64x128 = pcVar67;
  aom_highbd_8_masked_sub_pixel_variance64x16 = pcVar68;
  aom_highbd_8_masked_sub_pixel_variance64x32 = pcVar69;
  aom_highbd_8_masked_sub_pixel_variance64x64 = pcVar70;
  aom_highbd_8_masked_sub_pixel_variance8x16 = pcVar71;
  aom_highbd_8_masked_sub_pixel_variance8x32 = pcVar72;
  aom_highbd_8_masked_sub_pixel_variance8x4 = pcVar73;
  aom_highbd_8_masked_sub_pixel_variance8x8 = pcVar74;
  aom_highbd_8_obmc_variance128x128 = pcVar317;
  aom_highbd_8_obmc_variance128x64 = pcVar318;
  aom_highbd_8_obmc_variance16x16 = pcVar319;
  aom_highbd_8_obmc_variance16x32 = pcVar320;
  aom_highbd_8_obmc_variance16x4 = pcVar321;
  aom_highbd_8_obmc_variance16x64 = pcVar322;
  aom_highbd_8_obmc_variance16x8 = pcVar323;
  aom_highbd_8_obmc_variance32x16 = pcVar324;
  aom_highbd_8_obmc_variance32x32 = pcVar325;
  aom_highbd_8_obmc_variance32x64 = pcVar326;
  aom_highbd_8_obmc_variance32x8 = pcVar327;
  aom_highbd_8_obmc_variance4x16 = pcVar328;
  aom_highbd_8_obmc_variance4x4 = pcVar329;
  aom_highbd_8_obmc_variance4x8 = pcVar330;
  aom_highbd_8_obmc_variance64x128 = pcVar331;
  aom_highbd_8_obmc_variance64x16 = pcVar332;
  aom_highbd_8_obmc_variance64x32 = pcVar333;
  aom_highbd_8_obmc_variance64x64 = pcVar334;
  aom_highbd_8_obmc_variance8x16 = pcVar335;
  aom_highbd_8_obmc_variance8x32 = pcVar336;
  aom_highbd_8_obmc_variance8x4 = pcVar337;
  aom_highbd_8_obmc_variance8x8 = pcVar338;
  aom_highbd_8_sub_pixel_avg_variance4x4 = pcVar339;
  aom_highbd_8_sub_pixel_variance4x4 = pcVar340;
  if (!bVar445) {
    pcVar342 = aom_highbd_blend_a64_d16_mask_avx2;
  }
  aom_highbd_8_variance4x4 = pcVar341;
  aom_highbd_blend_a64_d16_mask = pcVar342;
  aom_highbd_blend_a64_hmask = pcVar346;
  aom_highbd_blend_a64_mask = pcVar347;
  pcVar6 = aom_highbd_comp_mask_pred_avx2;
  if (bVar445) {
    pcVar6 = aom_highbd_comp_mask_pred_sse2;
  }
  aom_highbd_blend_a64_vmask = pcVar348;
  aom_highbd_comp_mask_pred = pcVar6;
  pcVar6 = aom_highbd_convolve8_horiz_avx2;
  if (bVar445) {
    pcVar6 = aom_highbd_convolve8_horiz_sse2;
  }
  pcVar7 = aom_highbd_convolve8_vert_avx2;
  if (bVar445) {
    pcVar7 = aom_highbd_convolve8_vert_sse2;
  }
  aom_highbd_convolve8_horiz = pcVar6;
  aom_highbd_convolve8_vert = pcVar7;
  pcVar6 = aom_highbd_convolve_copy_avx2;
  if (bVar445) {
    pcVar6 = aom_highbd_convolve_copy_sse2;
  }
  pcVar7 = aom_highbd_hadamard_16x16_avx2;
  if (bVar445) {
    pcVar7 = aom_highbd_hadamard_16x16_c;
  }
  aom_highbd_convolve_copy = pcVar6;
  aom_highbd_hadamard_16x16 = pcVar7;
  pcVar6 = aom_highbd_hadamard_32x32_avx2;
  if (bVar445) {
    pcVar6 = aom_highbd_hadamard_32x32_c;
  }
  pcVar7 = aom_highbd_hadamard_8x8_avx2;
  if (bVar445) {
    pcVar7 = aom_highbd_hadamard_8x8_c;
  }
  aom_highbd_hadamard_32x32 = pcVar6;
  aom_highbd_hadamard_8x8 = pcVar7;
  pcVar6 = aom_highbd_lpf_horizontal_14_dual_avx2;
  if (bVar445) {
    pcVar6 = aom_highbd_lpf_horizontal_14_dual_sse2;
  }
  pcVar7 = aom_highbd_lpf_horizontal_4_dual_avx2;
  if (bVar445) {
    pcVar7 = aom_highbd_lpf_horizontal_4_dual_sse2;
  }
  aom_highbd_lpf_horizontal_14_dual = pcVar6;
  aom_highbd_lpf_horizontal_4_dual = pcVar7;
  pcVar6 = aom_highbd_lpf_horizontal_8_dual_avx2;
  if (bVar445) {
    pcVar6 = aom_highbd_lpf_horizontal_8_dual_sse2;
  }
  pcVar7 = aom_highbd_lpf_vertical_14_dual_avx2;
  if (bVar445) {
    pcVar7 = aom_highbd_lpf_vertical_14_dual_sse2;
  }
  aom_highbd_lpf_horizontal_8_dual = pcVar6;
  aom_highbd_lpf_vertical_14_dual = pcVar7;
  pcVar6 = aom_highbd_lpf_vertical_4_dual_avx2;
  if (bVar445) {
    pcVar6 = aom_highbd_lpf_vertical_4_dual_sse2;
  }
  pcVar7 = aom_highbd_lpf_vertical_8_dual_avx2;
  if (bVar445) {
    pcVar7 = aom_highbd_lpf_vertical_8_dual_sse2;
  }
  aom_highbd_lpf_vertical_4_dual = pcVar6;
  aom_highbd_lpf_vertical_8_dual = pcVar7;
  if (!bVar445) {
    pcVar75 = aom_highbd_masked_sad128x128_avx2;
  }
  aom_highbd_masked_sad128x128 = pcVar75;
  if (!bVar445) {
    pcVar76 = aom_highbd_masked_sad128x64_avx2;
    pcVar77 = aom_highbd_masked_sad16x16_avx2;
  }
  aom_highbd_masked_sad128x64 = pcVar76;
  if (!bVar445) {
    pcVar78 = aom_highbd_masked_sad16x32_avx2;
  }
  aom_highbd_masked_sad16x16 = pcVar77;
  aom_highbd_masked_sad16x32 = pcVar78;
  if (!bVar445) {
    pcVar79 = aom_highbd_masked_sad16x4_avx2;
  }
  aom_highbd_masked_sad16x4 = pcVar79;
  if (!bVar445) {
    pcVar80 = aom_highbd_masked_sad16x64_avx2;
    pcVar81 = aom_highbd_masked_sad16x8_avx2;
  }
  aom_highbd_masked_sad16x64 = pcVar80;
  if (!bVar445) {
    pcVar82 = aom_highbd_masked_sad32x16_avx2;
  }
  aom_highbd_masked_sad16x8 = pcVar81;
  aom_highbd_masked_sad32x16 = pcVar82;
  if (!bVar445) {
    pcVar83 = aom_highbd_masked_sad32x32_avx2;
  }
  aom_highbd_masked_sad32x32 = pcVar83;
  if (!bVar445) {
    pcVar84 = aom_highbd_masked_sad32x64_avx2;
    pcVar85 = aom_highbd_masked_sad32x8_avx2;
  }
  aom_highbd_masked_sad32x64 = pcVar84;
  if (!bVar445) {
    pcVar86 = aom_highbd_masked_sad4x16_avx2;
  }
  aom_highbd_masked_sad32x8 = pcVar85;
  aom_highbd_masked_sad4x16 = pcVar86;
  if (!bVar445) {
    pcVar87 = aom_highbd_masked_sad4x4_avx2;
  }
  aom_highbd_masked_sad4x4 = pcVar87;
  if (!bVar445) {
    pcVar88 = aom_highbd_masked_sad4x8_avx2;
    pcVar89 = aom_highbd_masked_sad64x128_avx2;
  }
  aom_highbd_masked_sad4x8 = pcVar88;
  if (!bVar445) {
    pcVar90 = aom_highbd_masked_sad64x16_avx2;
  }
  aom_highbd_masked_sad64x128 = pcVar89;
  aom_highbd_masked_sad64x16 = pcVar90;
  if (!bVar445) {
    pcVar389 = aom_obmc_sad64x32_avx2;
  }
  aom_obmc_sad64x32 = pcVar389;
  if (!bVar445) {
    pcVar391 = aom_obmc_sad8x16_avx2;
  }
  aom_obmc_sad8x16 = pcVar391;
  aom_obmc_sub_pixel_variance32x16 = pcVar402;
  aom_obmc_sub_pixel_variance16x64 = pcVar400;
  aom_obmc_sub_pixel_variance16x8 = pcVar401;
  aom_obmc_sub_pixel_variance16x32 = pcVar398;
  aom_obmc_sub_pixel_variance16x4 = pcVar399;
  aom_obmc_sub_pixel_variance128x64 = pcVar396;
  aom_obmc_sub_pixel_variance16x16 = pcVar397;
  if (!bVar445) {
    pcVar393 = aom_obmc_sad8x4_avx2;
  }
  aom_obmc_sad8x4 = pcVar393;
  aom_obmc_sub_pixel_variance128x128 = pcVar395;
  if (!bVar445) {
    pcVar394 = aom_obmc_sad8x8_avx2;
  }
  aom_obmc_sad8x8 = pcVar394;
  if (!bVar445) {
    pcVar392 = aom_obmc_sad8x32_avx2;
  }
  aom_obmc_sad8x32 = pcVar392;
  if (!bVar445) {
    pcVar381 = aom_obmc_sad32x32_avx2;
    pcVar390 = aom_obmc_sad64x64_avx2;
  }
  aom_obmc_sad64x64 = pcVar390;
  if (!bVar445) {
    pcVar383 = aom_obmc_sad32x8_avx2;
    pcVar388 = aom_obmc_sad64x16_avx2;
  }
  aom_obmc_sad64x16 = pcVar388;
  if (!bVar445) {
    pcVar385 = aom_obmc_sad4x4_avx2;
  }
  aom_obmc_sad32x32 = pcVar381;
  aom_obmc_sad32x8 = pcVar383;
  aom_obmc_sad4x4 = pcVar385;
  if (!bVar445) {
    pcVar387 = aom_obmc_sad64x128_avx2;
  }
  aom_obmc_sad64x128 = pcVar387;
  if (!bVar445) {
    pcVar386 = aom_obmc_sad4x8_avx2;
  }
  aom_obmc_sad4x8 = pcVar386;
  if (!bVar445) {
    pcVar384 = aom_obmc_sad4x16_avx2;
  }
  aom_obmc_sad4x16 = pcVar384;
  if (!bVar445) {
    pcVar375 = aom_obmc_sad16x16_avx2;
    pcVar382 = aom_obmc_sad32x64_avx2;
  }
  aom_obmc_sad32x64 = pcVar382;
  if (!bVar445) {
    pcVar376 = aom_obmc_sad16x32_avx2;
    pcVar380 = aom_obmc_sad32x16_avx2;
  }
  aom_obmc_sad32x16 = pcVar380;
  if (!bVar445) {
    pcVar377 = aom_obmc_sad16x4_avx2;
  }
  aom_obmc_sad16x16 = pcVar375;
  aom_obmc_sad16x32 = pcVar376;
  aom_obmc_sad16x4 = pcVar377;
  if (!bVar445) {
    pcVar379 = aom_obmc_sad16x8_avx2;
  }
  aom_obmc_sad16x8 = pcVar379;
  if (!bVar445) {
    pcVar378 = aom_obmc_sad16x64_avx2;
  }
  aom_obmc_sad16x64 = pcVar378;
  pcVar6 = aom_mse_wxh_16bit_avx2;
  if (bVar445) {
    pcVar6 = aom_mse_wxh_16bit_sse2;
  }
  pcVar7 = aom_mse_wxh_16bit_highbd_avx2;
  if (bVar445) {
    pcVar7 = aom_mse_wxh_16bit_highbd_sse2;
  }
  aom_masked_sub_pixel_variance128x128 = pcVar119;
  aom_mse_wxh_16bit = pcVar6;
  aom_mse_wxh_16bit_highbd = pcVar7;
  if (!bVar445) {
    pcVar374 = aom_obmc_sad128x64_avx2;
  }
  aom_obmc_sad128x64 = pcVar374;
  if (!bVar445) {
    pcVar373 = aom_obmc_sad128x128_avx2;
  }
  aom_obmc_sad128x128 = pcVar373;
  pcVar6 = aom_mse_16xh_16bit_avx2;
  if (bVar445) {
    pcVar6 = aom_mse_16xh_16bit_sse2;
  }
  aom_mse_16xh_16bit = pcVar6;
  aom_masked_sub_pixel_variance16x16 = pcVar121;
  aom_masked_sub_pixel_variance8x8 = pcVar140;
  pcVar6 = aom_mse16x16_avx2;
  if (bVar445) {
    pcVar6 = aom_mse16x16_sse2;
  }
  aom_mse16x16 = pcVar6;
  aom_masked_sub_pixel_variance8x32 = pcVar138;
  aom_masked_sub_pixel_variance8x4 = pcVar139;
  aom_masked_sub_pixel_variance64x64 = pcVar136;
  aom_masked_sub_pixel_variance8x16 = pcVar137;
  aom_masked_sub_pixel_variance64x16 = pcVar134;
  aom_masked_sub_pixel_variance64x32 = pcVar135;
  aom_masked_sub_pixel_variance4x8 = pcVar132;
  aom_masked_sub_pixel_variance64x128 = pcVar133;
  aom_masked_sub_pixel_variance4x16 = pcVar130;
  aom_masked_sub_pixel_variance4x4 = pcVar131;
  aom_masked_sub_pixel_variance32x64 = pcVar128;
  aom_masked_sub_pixel_variance32x8 = pcVar129;
  aom_masked_sub_pixel_variance32x16 = pcVar126;
  aom_masked_sub_pixel_variance32x32 = pcVar127;
  aom_masked_sub_pixel_variance16x64 = pcVar124;
  aom_masked_sub_pixel_variance16x8 = pcVar125;
  aom_masked_sub_pixel_variance16x32 = pcVar122;
  aom_masked_sub_pixel_variance16x4 = pcVar123;
  if (!bVar445) {
    pcVar111 = aom_masked_sad64x128_avx2;
  }
  aom_masked_sub_pixel_variance128x64 = pcVar120;
  if (!bVar445) {
    pcVar113 = aom_masked_sad64x32_avx2;
    pcVar118 = aom_masked_sad8x8_avx2;
  }
  aom_masked_sad8x8 = pcVar118;
  if (!bVar445) {
    pcVar115 = aom_masked_sad8x16_avx2;
  }
  aom_masked_sad64x128 = pcVar111;
  aom_masked_sad64x32 = pcVar113;
  aom_masked_sad8x16 = pcVar115;
  if (!bVar445) {
    pcVar117 = aom_masked_sad8x4_avx2;
  }
  aom_masked_sad8x4 = pcVar117;
  if (!bVar445) {
    pcVar116 = aom_masked_sad8x32_avx2;
  }
  aom_masked_sad8x32 = pcVar116;
  if (!bVar445) {
    pcVar114 = aom_masked_sad64x64_avx2;
  }
  aom_masked_sad64x64 = pcVar114;
  if (!bVar445) {
    pcVar104 = aom_masked_sad32x16_avx2;
    pcVar112 = aom_masked_sad64x16_avx2;
  }
  aom_masked_sad64x16 = pcVar112;
  if (!bVar445) {
    pcVar106 = aom_masked_sad32x64_avx2;
    pcVar110 = aom_masked_sad4x8_avx2;
  }
  aom_masked_sad4x8 = pcVar110;
  if (!bVar445) {
    pcVar107 = aom_masked_sad32x8_avx2;
  }
  aom_masked_sad32x16 = pcVar104;
  aom_masked_sad32x64 = pcVar106;
  aom_masked_sad32x8 = pcVar107;
  if (!bVar445) {
    pcVar109 = aom_masked_sad4x4_avx2;
  }
  aom_masked_sad4x4 = pcVar109;
  if (!bVar445) {
    pcVar108 = aom_masked_sad4x16_avx2;
  }
  aom_masked_sad4x16 = pcVar108;
  pcVar6 = aom_highbd_quantize_b_32x32_avx2;
  if (bVar445) {
    pcVar6 = aom_highbd_quantize_b_32x32_sse2;
  }
  else {
    pcVar105 = aom_masked_sad32x32_avx2;
  }
  aom_masked_sad32x32 = pcVar105;
  if (!bVar445) {
    pcVar98 = aom_masked_sad128x64_avx2;
    pcVar103 = aom_masked_sad16x8_avx2;
  }
  aom_masked_sad16x8 = pcVar103;
  if (!bVar445) {
    pcVar100 = aom_masked_sad16x32_avx2;
  }
  aom_highbd_quantize_b_32x32 = pcVar6;
  aom_masked_sad128x64 = pcVar98;
  aom_masked_sad16x32 = pcVar100;
  if (!bVar445) {
    pcVar102 = aom_masked_sad16x64_avx2;
  }
  aom_masked_sad16x64 = pcVar102;
  if (!bVar445) {
    pcVar101 = aom_masked_sad16x4_avx2;
  }
  aom_masked_sad16x4 = pcVar101;
  if (!bVar445) {
    pcVar99 = aom_masked_sad16x16_avx2;
  }
  aom_masked_sad16x16 = pcVar99;
  if (!bVar445) {
    pcVar97 = aom_masked_sad128x128_avx2;
  }
  aom_masked_sad128x128 = pcVar97;
  pcVar6 = aom_lpf_horizontal_8_quad_avx2;
  if (bVar445) {
    pcVar6 = aom_lpf_horizontal_8_quad_sse2;
  }
  pcVar7 = aom_lpf_horizontal_6_quad_avx2;
  if (bVar445) {
    pcVar7 = aom_lpf_horizontal_6_quad_sse2;
  }
  aom_lpf_horizontal_6_quad = pcVar7;
  aom_lpf_horizontal_8_quad = pcVar6;
  pcVar6 = aom_lpf_vertical_14_quad_avx2;
  if (bVar445) {
    pcVar6 = aom_lpf_vertical_14_quad_sse2;
  }
  aom_lpf_vertical_14_quad = pcVar6;
  pcVar6 = aom_lpf_horizontal_14_quad_avx2;
  if (bVar445) {
    pcVar6 = aom_lpf_horizontal_14_quad_sse2;
  }
  else {
    pcVar372 = aom_lowbd_blend_a64_d16_mask_avx2;
  }
  aom_lowbd_blend_a64_d16_mask = pcVar372;
  aom_lpf_horizontal_14_quad = pcVar6;
  pcVar6 = aom_int_pro_row_avx2;
  if (bVar445) {
    pcVar6 = aom_int_pro_row_sse2;
  }
  pcVar7 = aom_int_pro_col_avx2;
  if (bVar445) {
    pcVar7 = aom_int_pro_col_sse2;
  }
  aom_int_pro_col = pcVar7;
  aom_int_pro_row = pcVar6;
  pcVar6 = aom_ifft8x8_float_avx2;
  if (bVar445) {
    pcVar6 = aom_ifft8x8_float_sse2;
  }
  pcVar7 = aom_ifft32x32_float_avx2;
  if (bVar445) {
    pcVar7 = aom_ifft32x32_float_sse2;
  }
  aom_ifft32x32_float = pcVar7;
  aom_ifft8x8_float = pcVar6;
  if (!bVar445) {
    pcVar371 = aom_highbd_sse_avx2;
  }
  pcVar6 = aom_highbd_sad_skip_64x64x4d_avx2;
  if (bVar445) {
    pcVar6 = aom_highbd_sad_skip_64x64x4d_sse2;
  }
  aom_highbd_sad_skip_64x64x4d = pcVar6;
  aom_highbd_sse = pcVar371;
  pcVar6 = aom_ifft16x16_float_avx2;
  if (bVar445) {
    pcVar6 = aom_ifft16x16_float_sse2;
  }
  aom_ifft16x16_float = pcVar6;
  pcVar6 = aom_highbd_sad_skip_64x64_avx2;
  if (bVar445) {
    pcVar6 = aom_highbd_sad_skip_64x64_sse2;
  }
  aom_highbd_sad_skip_64x64 = pcVar6;
  pcVar6 = aom_highbd_sad_skip_64x32_avx2;
  if (bVar445) {
    pcVar6 = aom_highbd_sad_skip_64x32_sse2;
  }
  pcVar7 = aom_highbd_sad_skip_64x16x4d_avx2;
  if (bVar445) {
    pcVar7 = aom_highbd_sad_skip_64x16x4d_sse2;
  }
  aom_highbd_sad_skip_64x16x4d = pcVar7;
  aom_highbd_sad_skip_64x32 = pcVar6;
  pcVar6 = aom_highbd_sad_skip_64x32x4d_avx2;
  if (bVar445) {
    pcVar6 = aom_highbd_sad_skip_64x32x4d_sse2;
  }
  aom_highbd_sad_skip_64x32x4d = pcVar6;
  pcVar6 = aom_highbd_sad_skip_64x16_avx2;
  if (bVar445) {
    pcVar6 = aom_highbd_sad_skip_64x16_sse2;
  }
  aom_highbd_sad_skip_64x16 = pcVar6;
  pcVar6 = aom_highbd_sad_skip_64x128_avx2;
  if (bVar445) {
    pcVar6 = aom_highbd_sad_skip_64x128_c;
  }
  pcVar7 = aom_highbd_sad_skip_32x64x4d_avx2;
  if (bVar445) {
    pcVar7 = aom_highbd_sad_skip_32x64x4d_sse2;
  }
  aom_highbd_sad_skip_32x64x4d = pcVar7;
  aom_highbd_sad_skip_64x128 = pcVar6;
  pcVar6 = aom_highbd_sad_skip_64x128x4d_avx2;
  if (bVar445) {
    pcVar6 = aom_highbd_sad_skip_64x128x4d_c;
  }
  aom_highbd_sad_skip_64x128x4d = pcVar6;
  pcVar6 = aom_highbd_sad_skip_32x64_avx2;
  if (bVar445) {
    pcVar6 = aom_highbd_sad_skip_32x64_sse2;
  }
  aom_highbd_sad_skip_32x64 = pcVar6;
  pcVar6 = aom_highbd_sad_skip_32x32_avx2;
  if (bVar445) {
    pcVar6 = aom_highbd_sad_skip_32x32_sse2;
  }
  pcVar7 = aom_highbd_sad_skip_32x16x4d_avx2;
  if (bVar445) {
    pcVar7 = aom_highbd_sad_skip_32x16x4d_sse2;
  }
  aom_highbd_sad_skip_32x16x4d = pcVar7;
  aom_highbd_sad_skip_32x32 = pcVar6;
  pcVar6 = aom_highbd_sad_skip_32x32x4d_avx2;
  if (bVar445) {
    pcVar6 = aom_highbd_sad_skip_32x32x4d_sse2;
  }
  aom_highbd_sad_skip_32x32x4d = pcVar6;
  pcVar6 = aom_highbd_sad_skip_32x16_avx2;
  if (bVar445) {
    pcVar6 = aom_highbd_sad_skip_32x16_sse2;
  }
  aom_highbd_sad_skip_32x16 = pcVar6;
  pcVar6 = aom_highbd_sad_skip_16x64_avx2;
  if (bVar445) {
    pcVar6 = aom_highbd_sad_skip_16x64_sse2;
  }
  pcVar7 = aom_highbd_sad_skip_16x32x4d_avx2;
  if (bVar445) {
    pcVar7 = aom_highbd_sad_skip_16x32x4d_sse2;
  }
  aom_highbd_sad_skip_16x32x4d = pcVar7;
  aom_highbd_sad_skip_16x64 = pcVar6;
  pcVar6 = aom_highbd_sad_skip_16x64x4d_avx2;
  if (bVar445) {
    pcVar6 = aom_highbd_sad_skip_16x64x4d_sse2;
  }
  aom_highbd_sad_skip_16x64x4d = pcVar6;
  pcVar6 = aom_highbd_sad_skip_16x32_avx2;
  if (bVar445) {
    pcVar6 = aom_highbd_sad_skip_16x32_sse2;
  }
  aom_highbd_sad_skip_16x32 = pcVar6;
  pcVar6 = aom_highbd_sad_skip_16x16_avx2;
  if (bVar445) {
    pcVar6 = aom_highbd_sad_skip_16x16_sse2;
  }
  pcVar7 = aom_highbd_sad_skip_128x64x4d_avx2;
  if (bVar445) {
    pcVar7 = aom_highbd_sad_skip_128x64x4d_c;
  }
  aom_highbd_sad_skip_128x64x4d = pcVar7;
  aom_highbd_sad_skip_16x16 = pcVar6;
  pcVar6 = aom_highbd_sad_skip_16x16x4d_avx2;
  if (bVar445) {
    pcVar6 = aom_highbd_sad_skip_16x16x4d_sse2;
  }
  aom_highbd_sad_skip_16x16x4d = pcVar6;
  pcVar6 = aom_highbd_sad_skip_128x64_avx2;
  if (bVar445) {
    pcVar6 = aom_highbd_sad_skip_128x64_c;
  }
  aom_highbd_sad_skip_128x64 = pcVar6;
  pcVar6 = aom_highbd_sad_skip_128x128_avx2;
  if (bVar445) {
    pcVar6 = aom_highbd_sad_skip_128x128_c;
  }
  pcVar7 = aom_highbd_sad64x64x4d_avx2;
  if (bVar445) {
    pcVar7 = aom_highbd_sad64x64x4d_sse2;
  }
  aom_highbd_sad64x64x4d = pcVar7;
  aom_highbd_sad_skip_128x128 = pcVar6;
  pcVar6 = aom_highbd_sad_skip_128x128x4d_avx2;
  if (bVar445) {
    pcVar6 = aom_highbd_sad_skip_128x128x4d_c;
  }
  aom_highbd_sad_skip_128x128x4d = pcVar6;
  pcVar6 = aom_highbd_sad64x64x3d_avx2;
  if (bVar445) {
    pcVar6 = aom_highbd_sad64x64x3d_c;
  }
  aom_highbd_sad64x64x3d = pcVar6;
  pcVar6 = aom_highbd_sad64x64_avx2;
  if (bVar445) {
    pcVar6 = aom_highbd_sad64x64_sse2;
  }
  pcVar7 = aom_highbd_sad64x32x4d_avx2;
  if (bVar445) {
    pcVar7 = aom_highbd_sad64x32x4d_sse2;
  }
  aom_highbd_sad64x32x4d = pcVar7;
  aom_highbd_sad64x64 = pcVar6;
  pcVar6 = aom_highbd_sad64x64_avg_avx2;
  if (bVar445) {
    pcVar6 = aom_highbd_sad64x64_avg_sse2;
  }
  aom_highbd_sad64x64_avg = pcVar6;
  pcVar6 = aom_highbd_sad64x32x3d_avx2;
  if (bVar445) {
    pcVar6 = aom_highbd_sad64x32x3d_c;
  }
  aom_highbd_sad64x32x3d = pcVar6;
  pcVar6 = aom_highbd_sad64x32_avx2;
  if (bVar445) {
    pcVar6 = aom_highbd_sad64x32_sse2;
  }
  pcVar7 = aom_highbd_sad64x16x4d_avx2;
  if (bVar445) {
    pcVar7 = aom_highbd_sad64x16x4d_sse2;
  }
  aom_highbd_sad64x16x4d = pcVar7;
  aom_highbd_sad64x32 = pcVar6;
  pcVar6 = aom_highbd_sad64x32_avg_avx2;
  if (bVar445) {
    pcVar6 = aom_highbd_sad64x32_avg_sse2;
  }
  aom_highbd_sad64x32_avg = pcVar6;
  pcVar6 = aom_highbd_sad64x16x3d_avx2;
  if (bVar445) {
    pcVar6 = aom_highbd_sad64x16x3d_c;
  }
  aom_highbd_sad64x16x3d = pcVar6;
  pcVar6 = aom_highbd_sad64x16_avx2;
  if (bVar445) {
    pcVar6 = aom_highbd_sad64x16_sse2;
  }
  pcVar7 = aom_highbd_sad64x128x4d_avx2;
  if (bVar445) {
    pcVar7 = aom_highbd_sad64x128x4d_c;
  }
  aom_highbd_sad64x128x4d = pcVar7;
  aom_highbd_sad64x16 = pcVar6;
  pcVar6 = aom_highbd_sad64x16_avg_avx2;
  if (bVar445) {
    pcVar6 = aom_highbd_sad64x16_avg_sse2;
  }
  aom_highbd_sad64x16_avg = pcVar6;
  pcVar6 = aom_highbd_sad64x128x3d_avx2;
  if (bVar445) {
    pcVar6 = aom_highbd_sad64x128x3d_c;
  }
  aom_highbd_sad64x128x3d = pcVar6;
  pcVar6 = aom_highbd_sad64x128_avx2;
  if (bVar445) {
    pcVar6 = aom_highbd_sad64x128_c;
  }
  pcVar7 = aom_highbd_sad32x8x4d_avx2;
  if (bVar445) {
    pcVar7 = aom_highbd_sad32x8x4d_sse2;
  }
  aom_highbd_sad32x8x4d = pcVar7;
  aom_highbd_sad64x128 = pcVar6;
  pcVar6 = aom_highbd_sad64x128_avg_avx2;
  if (bVar445) {
    pcVar6 = aom_highbd_sad64x128_avg_c;
  }
  aom_highbd_sad64x128_avg = pcVar6;
  pcVar6 = aom_highbd_sad32x8x3d_avx2;
  if (bVar445) {
    pcVar6 = aom_highbd_sad32x8x3d_c;
  }
  aom_highbd_sad32x8x3d = pcVar6;
  pcVar6 = aom_highbd_sad32x8_avx2;
  if (bVar445) {
    pcVar6 = aom_highbd_sad32x8_sse2;
  }
  pcVar7 = aom_highbd_sad32x64x4d_avx2;
  if (bVar445) {
    pcVar7 = aom_highbd_sad32x64x4d_sse2;
  }
  aom_highbd_sad32x64x4d = pcVar7;
  aom_highbd_sad32x8 = pcVar6;
  pcVar6 = aom_highbd_sad32x8_avg_avx2;
  if (bVar445) {
    pcVar6 = aom_highbd_sad32x8_avg_sse2;
  }
  aom_highbd_sad32x8_avg = pcVar6;
  pcVar6 = aom_highbd_sad32x64x3d_avx2;
  if (bVar445) {
    pcVar6 = aom_highbd_sad32x64x3d_c;
  }
  aom_highbd_sad32x64x3d = pcVar6;
  pcVar6 = aom_highbd_sad32x64_avx2;
  if (bVar445) {
    pcVar6 = aom_highbd_sad32x64_sse2;
  }
  pcVar7 = aom_highbd_sad32x32x4d_avx2;
  if (bVar445) {
    pcVar7 = aom_highbd_sad32x32x4d_sse2;
  }
  aom_highbd_sad32x32x4d = pcVar7;
  aom_highbd_sad32x64 = pcVar6;
  pcVar6 = aom_highbd_sad32x64_avg_avx2;
  if (bVar445) {
    pcVar6 = aom_highbd_sad32x64_avg_sse2;
  }
  aom_highbd_sad32x64_avg = pcVar6;
  pcVar6 = aom_highbd_sad32x32x3d_avx2;
  if (bVar445) {
    pcVar6 = aom_highbd_sad32x32x3d_c;
  }
  aom_highbd_sad32x32x3d = pcVar6;
  pcVar6 = aom_highbd_sad32x32_avx2;
  if (bVar445) {
    pcVar6 = aom_highbd_sad32x32_sse2;
  }
  pcVar7 = aom_highbd_sad32x16x4d_avx2;
  if (bVar445) {
    pcVar7 = aom_highbd_sad32x16x4d_sse2;
  }
  aom_highbd_sad32x16x4d = pcVar7;
  aom_highbd_sad32x32 = pcVar6;
  pcVar6 = aom_highbd_sad32x32_avg_avx2;
  if (bVar445) {
    pcVar6 = aom_highbd_sad32x32_avg_sse2;
  }
  aom_highbd_sad32x32_avg = pcVar6;
  pcVar6 = aom_highbd_sad32x16x3d_avx2;
  if (bVar445) {
    pcVar6 = aom_highbd_sad32x16x3d_c;
  }
  aom_highbd_sad32x16x3d = pcVar6;
  pcVar6 = aom_highbd_sad32x16_avx2;
  if (bVar445) {
    pcVar6 = aom_highbd_sad32x16_sse2;
  }
  pcVar7 = aom_highbd_sad16x8x4d_avx2;
  if (bVar445) {
    pcVar7 = aom_highbd_sad16x8x4d_sse2;
  }
  aom_highbd_sad16x8x4d = pcVar7;
  aom_highbd_sad32x16 = pcVar6;
  pcVar6 = aom_highbd_sad32x16_avg_avx2;
  if (bVar445) {
    pcVar6 = aom_highbd_sad32x16_avg_sse2;
  }
  aom_highbd_sad32x16_avg = pcVar6;
  pcVar6 = aom_highbd_sad16x8x3d_avx2;
  if (bVar445) {
    pcVar6 = aom_highbd_sad16x8x3d_c;
  }
  aom_highbd_sad16x8x3d = pcVar6;
  pcVar6 = aom_highbd_sad16x8_avx2;
  if (bVar445) {
    pcVar6 = aom_highbd_sad16x8_sse2;
  }
  pcVar7 = aom_highbd_sad16x64x4d_avx2;
  if (bVar445) {
    pcVar7 = aom_highbd_sad16x64x4d_sse2;
  }
  aom_highbd_sad16x64x4d = pcVar7;
  aom_highbd_sad16x8 = pcVar6;
  pcVar6 = aom_highbd_sad16x8_avg_avx2;
  if (bVar445) {
    pcVar6 = aom_highbd_sad16x8_avg_sse2;
  }
  aom_highbd_sad16x8_avg = pcVar6;
  pcVar6 = aom_highbd_sad16x64x3d_avx2;
  if (bVar445) {
    pcVar6 = aom_highbd_sad16x64x3d_c;
  }
  aom_highbd_sad16x64x3d = pcVar6;
  pcVar6 = aom_highbd_sad16x64_avx2;
  if (bVar445) {
    pcVar6 = aom_highbd_sad16x64_sse2;
  }
  pcVar7 = aom_highbd_sad16x4x4d_avx2;
  if (bVar445) {
    pcVar7 = aom_highbd_sad16x4x4d_sse2;
  }
  aom_highbd_sad16x4x4d = pcVar7;
  aom_highbd_sad16x64 = pcVar6;
  pcVar6 = aom_highbd_sad16x64_avg_avx2;
  if (bVar445) {
    pcVar6 = aom_highbd_sad16x64_avg_sse2;
  }
  aom_highbd_sad16x64_avg = pcVar6;
  pcVar6 = aom_highbd_sad16x4x3d_avx2;
  if (bVar445) {
    pcVar6 = aom_highbd_sad16x4x3d_c;
  }
  aom_highbd_sad16x4x3d = pcVar6;
  pcVar6 = aom_highbd_sad16x32x4d_avx2;
  if (bVar445) {
    pcVar6 = aom_highbd_sad16x32x4d_sse2;
  }
  pcVar7 = aom_highbd_sad16x32x3d_avx2;
  if (bVar445) {
    pcVar7 = aom_highbd_sad16x32x3d_c;
  }
  aom_highbd_sad16x32x3d = pcVar7;
  aom_highbd_sad16x32x4d = pcVar6;
  pcVar6 = aom_highbd_sad16x4_avx2;
  if (bVar445) {
    pcVar6 = aom_highbd_sad16x4_sse2;
  }
  aom_highbd_sad16x4 = pcVar6;
  pcVar6 = aom_highbd_sad16x32_avg_avx2;
  if (bVar445) {
    pcVar6 = aom_highbd_sad16x32_avg_sse2;
  }
  aom_highbd_sad16x32_avg = pcVar6;
  pcVar6 = aom_highbd_sad16x16x4d_avx2;
  if (bVar445) {
    pcVar6 = aom_highbd_sad16x16x4d_sse2;
  }
  pcVar7 = aom_highbd_sad16x16x3d_avx2;
  if (bVar445) {
    pcVar7 = aom_highbd_sad16x16x3d_c;
  }
  aom_highbd_sad16x16x3d = pcVar7;
  aom_highbd_sad16x16x4d = pcVar6;
  pcVar6 = aom_highbd_sad16x32_avx2;
  if (bVar445) {
    pcVar6 = aom_highbd_sad16x32_sse2;
  }
  aom_highbd_sad16x32 = pcVar6;
  pcVar6 = aom_highbd_sad16x16_avg_avx2;
  if (bVar445) {
    pcVar6 = aom_highbd_sad16x16_avg_sse2;
  }
  aom_highbd_sad16x16_avg = pcVar6;
  pcVar6 = aom_highbd_sad128x64x4d_avx2;
  if (bVar445) {
    pcVar6 = aom_highbd_sad128x64x4d_c;
  }
  pcVar7 = aom_highbd_sad128x64x3d_avx2;
  if (bVar445) {
    pcVar7 = aom_highbd_sad128x64x3d_c;
  }
  aom_highbd_sad128x64x3d = pcVar7;
  aom_highbd_sad128x64x4d = pcVar6;
  pcVar6 = aom_highbd_sad16x16_avx2;
  if (bVar445) {
    pcVar6 = aom_highbd_sad16x16_sse2;
  }
  aom_highbd_sad16x16 = pcVar6;
  pcVar6 = aom_highbd_sad128x64_avg_avx2;
  if (bVar445) {
    pcVar6 = aom_highbd_sad128x64_avg_c;
  }
  aom_highbd_sad128x64_avg = pcVar6;
  pcVar6 = aom_highbd_sad128x128x4d_avx2;
  if (bVar445) {
    pcVar6 = aom_highbd_sad128x128x4d_c;
  }
  pcVar7 = aom_highbd_sad128x128x3d_avx2;
  if (bVar445) {
    pcVar7 = aom_highbd_sad128x128x3d_c;
  }
  aom_highbd_sad128x128x3d = pcVar7;
  aom_highbd_sad128x128x4d = pcVar6;
  pcVar6 = aom_highbd_sad128x64_avx2;
  if (bVar445) {
    pcVar6 = aom_highbd_sad128x64_c;
  }
  aom_highbd_sad128x64 = pcVar6;
  pcVar6 = aom_highbd_sad128x128_avg_avx2;
  if (bVar445) {
    pcVar6 = aom_highbd_sad128x128_avg_c;
  }
  aom_highbd_sad128x128_avg = pcVar6;
  pcVar6 = aom_highbd_quantize_b_adaptive_avx2;
  if (bVar445) {
    pcVar6 = aom_highbd_quantize_b_adaptive_sse2;
  }
  pcVar7 = aom_highbd_quantize_b_64x64_avx2;
  if (bVar445) {
    pcVar7 = aom_highbd_quantize_b_64x64_sse2;
  }
  aom_highbd_quantize_b_64x64 = pcVar7;
  aom_highbd_quantize_b_adaptive = pcVar6;
  pcVar6 = aom_highbd_sad128x128_avx2;
  if (bVar445) {
    pcVar6 = aom_highbd_sad128x128_c;
  }
  aom_highbd_sad128x128 = pcVar6;
  if (!bVar445) {
    pcVar365 = aom_highbd_obmc_sad64x32_avx2;
  }
  pcVar6 = aom_highbd_quantize_b_32x32_adaptive_avx2;
  if (bVar445) {
    pcVar6 = aom_highbd_quantize_b_32x32_adaptive_sse2;
  }
  aom_highbd_quantize_b_32x32_adaptive = pcVar6;
  if (!bVar445) {
    pcVar367 = aom_highbd_obmc_sad8x16_avx2;
    pcVar369 = aom_highbd_obmc_sad8x4_avx2;
  }
  aom_highbd_obmc_sad64x32 = pcVar365;
  aom_highbd_obmc_sad8x16 = pcVar367;
  aom_highbd_obmc_sad8x4 = pcVar369;
  pcVar6 = aom_highbd_quantize_b_avx2;
  if (bVar445) {
    pcVar6 = aom_highbd_quantize_b_sse2;
  }
  aom_highbd_quantize_b = pcVar6;
  if (!bVar445) {
    pcVar370 = aom_highbd_obmc_sad8x8_avx2;
  }
  aom_highbd_obmc_sad8x8 = pcVar370;
  if (!bVar445) {
    pcVar368 = aom_highbd_obmc_sad8x32_avx2;
  }
  aom_highbd_obmc_sad8x32 = pcVar368;
  if (!bVar445) {
    pcVar357 = aom_highbd_obmc_sad32x32_avx2;
    pcVar366 = aom_highbd_obmc_sad64x64_avx2;
  }
  aom_highbd_obmc_sad64x64 = pcVar366;
  if (!bVar445) {
    pcVar359 = aom_highbd_obmc_sad32x8_avx2;
    pcVar364 = aom_highbd_obmc_sad64x16_avx2;
  }
  aom_highbd_obmc_sad64x16 = pcVar364;
  if (!bVar445) {
    pcVar361 = aom_highbd_obmc_sad4x4_avx2;
  }
  aom_highbd_obmc_sad32x32 = pcVar357;
  aom_highbd_obmc_sad32x8 = pcVar359;
  aom_highbd_obmc_sad4x4 = pcVar361;
  if (!bVar445) {
    pcVar363 = aom_highbd_obmc_sad64x128_avx2;
  }
  aom_highbd_obmc_sad64x128 = pcVar363;
  if (!bVar445) {
    pcVar362 = aom_highbd_obmc_sad4x8_avx2;
  }
  aom_highbd_obmc_sad4x8 = pcVar362;
  if (!bVar445) {
    pcVar360 = aom_highbd_obmc_sad4x16_avx2;
  }
  aom_highbd_obmc_sad4x16 = pcVar360;
  if (!bVar445) {
    pcVar349 = aom_highbd_obmc_sad128x128_avx2;
    pcVar358 = aom_highbd_obmc_sad32x64_avx2;
  }
  aom_highbd_obmc_sad32x64 = pcVar358;
  if (!bVar445) {
    pcVar351 = aom_highbd_obmc_sad16x16_avx2;
    pcVar356 = aom_highbd_obmc_sad32x16_avx2;
  }
  aom_highbd_obmc_sad32x16 = pcVar356;
  if (!bVar445) {
    pcVar353 = aom_highbd_obmc_sad16x4_avx2;
  }
  aom_highbd_obmc_sad128x128 = pcVar349;
  aom_highbd_obmc_sad16x16 = pcVar351;
  aom_highbd_obmc_sad16x4 = pcVar353;
  if (!bVar445) {
    pcVar355 = aom_highbd_obmc_sad16x8_avx2;
  }
  aom_highbd_obmc_sad16x8 = pcVar355;
  if (!bVar445) {
    pcVar354 = aom_highbd_obmc_sad16x64_avx2;
  }
  aom_highbd_obmc_sad16x64 = pcVar354;
  if (!bVar445) {
    pcVar352 = aom_highbd_obmc_sad16x32_avx2;
  }
  aom_highbd_obmc_sad16x32 = pcVar352;
  if (!bVar445) {
    pcVar91 = aom_highbd_masked_sad64x32_avx2;
    pcVar350 = aom_highbd_obmc_sad128x64_avx2;
  }
  aom_highbd_obmc_sad128x64 = pcVar350;
  if (!bVar445) {
    pcVar92 = aom_highbd_masked_sad64x64_avx2;
    pcVar96 = aom_highbd_masked_sad8x8_avx2;
  }
  aom_highbd_masked_sad8x8 = pcVar96;
  if (!bVar445) {
    pcVar93 = aom_highbd_masked_sad8x16_avx2;
  }
  aom_highbd_masked_sad64x32 = pcVar91;
  aom_highbd_masked_sad64x64 = pcVar92;
  aom_highbd_masked_sad8x16 = pcVar93;
  if (!bVar445) {
    pcVar95 = aom_highbd_masked_sad8x4_avx2;
  }
  aom_highbd_masked_sad8x4 = pcVar95;
  if (!bVar445) {
    pcVar94 = aom_highbd_masked_sad8x32_avx2;
  }
  aom_highbd_masked_sad8x32 = pcVar94;
  aom_obmc_sub_pixel_variance32x32 = pcVar403;
  aom_obmc_sub_pixel_variance32x64 = pcVar404;
  aom_obmc_sub_pixel_variance32x8 = pcVar405;
  aom_obmc_sub_pixel_variance4x16 = pcVar406;
  aom_obmc_sub_pixel_variance4x4 = pcVar407;
  aom_obmc_sub_pixel_variance4x8 = pcVar408;
  aom_obmc_sub_pixel_variance64x128 = pcVar409;
  aom_obmc_sub_pixel_variance64x16 = pcVar410;
  aom_obmc_sub_pixel_variance64x32 = pcVar411;
  aom_obmc_sub_pixel_variance64x64 = pcVar412;
  aom_obmc_sub_pixel_variance8x16 = pcVar413;
  aom_obmc_sub_pixel_variance8x32 = pcVar414;
  if (!bVar445) {
    pcVar417 = aom_obmc_variance128x128_avx2;
  }
  aom_obmc_sub_pixel_variance8x4 = pcVar415;
  if (!bVar445) {
    pcVar418 = aom_obmc_variance128x64_avx2;
  }
  aom_obmc_sub_pixel_variance8x8 = pcVar416;
  aom_obmc_variance128x128 = pcVar417;
  aom_obmc_variance128x64 = pcVar418;
  if (!bVar445) {
    pcVar419 = aom_obmc_variance16x16_avx2;
  }
  aom_obmc_variance16x16 = pcVar419;
  if (!bVar445) {
    pcVar420 = aom_obmc_variance16x32_avx2;
  }
  aom_obmc_variance16x32 = pcVar420;
  if (!bVar445) {
    pcVar421 = aom_obmc_variance16x4_avx2;
  }
  aom_obmc_variance16x4 = pcVar421;
  if (!bVar445) {
    pcVar423 = aom_obmc_variance16x8_avx2;
    pcVar422 = aom_obmc_variance16x64_avx2;
  }
  aom_obmc_variance16x64 = pcVar422;
  if (!bVar445) {
    pcVar424 = aom_obmc_variance32x16_avx2;
    pcVar425 = aom_obmc_variance32x32_avx2;
  }
  aom_obmc_variance16x8 = pcVar423;
  if (!bVar445) {
    pcVar426 = aom_obmc_variance32x64_avx2;
  }
  aom_obmc_variance32x16 = pcVar424;
  aom_obmc_variance32x32 = pcVar425;
  aom_obmc_variance32x64 = pcVar426;
  if (!bVar445) {
    pcVar427 = aom_obmc_variance32x8_avx2;
  }
  aom_obmc_variance32x8 = pcVar427;
  if (!bVar445) {
    pcVar428 = aom_obmc_variance4x16_avx2;
  }
  aom_obmc_variance4x16 = pcVar428;
  if (!bVar445) {
    pcVar429 = aom_obmc_variance4x4_avx2;
  }
  aom_obmc_variance4x4 = pcVar429;
  if (!bVar445) {
    pcVar431 = aom_obmc_variance64x128_avx2;
    pcVar430 = aom_obmc_variance4x8_avx2;
  }
  aom_obmc_variance4x8 = pcVar430;
  if (!bVar445) {
    pcVar432 = aom_obmc_variance64x16_avx2;
    pcVar433 = aom_obmc_variance64x32_avx2;
  }
  aom_obmc_variance64x128 = pcVar431;
  if (!bVar445) {
    pcVar434 = aom_obmc_variance64x64_avx2;
  }
  aom_obmc_variance64x16 = pcVar432;
  aom_obmc_variance64x32 = pcVar433;
  aom_obmc_variance64x64 = pcVar434;
  if (!bVar445) {
    pcVar435 = aom_obmc_variance8x16_avx2;
  }
  aom_obmc_variance8x16 = pcVar435;
  if (!bVar445) {
    pcVar436 = aom_obmc_variance8x32_avx2;
  }
  aom_obmc_variance8x32 = pcVar436;
  if (!bVar445) {
    pcVar437 = aom_obmc_variance8x4_avx2;
  }
  aom_obmc_variance8x4 = pcVar437;
  if (!bVar445) {
    pcVar141 = aom_paeth_predictor_16x16_avx2;
    pcVar438 = aom_obmc_variance8x8_avx2;
  }
  aom_obmc_variance8x8 = pcVar438;
  if (!bVar445) {
    pcVar142 = aom_paeth_predictor_16x32_avx2;
  }
  aom_paeth_predictor_16x16 = pcVar141;
  aom_paeth_predictor_16x32 = pcVar142;
  aom_paeth_predictor_16x4 = pcVar143;
  if (!bVar445) {
    pcVar144 = aom_paeth_predictor_16x64_avx2;
  }
  aom_paeth_predictor_16x64 = pcVar144;
  if (!bVar445) {
    pcVar145 = aom_paeth_predictor_16x8_avx2;
  }
  aom_paeth_predictor_16x8 = pcVar145;
  if (!bVar445) {
    pcVar146 = aom_paeth_predictor_32x16_avx2;
  }
  aom_paeth_predictor_32x16 = pcVar146;
  if (!bVar445) {
    pcVar148 = aom_paeth_predictor_32x64_avx2;
    pcVar147 = aom_paeth_predictor_32x32_avx2;
  }
  aom_paeth_predictor_32x32 = pcVar147;
  aom_paeth_predictor_32x64 = pcVar148;
  aom_paeth_predictor_32x8 = pcVar149;
  aom_paeth_predictor_4x16 = pcVar150;
  aom_paeth_predictor_4x4 = pcVar151;
  aom_paeth_predictor_4x8 = pcVar152;
  if (!bVar445) {
    pcVar153 = aom_paeth_predictor_64x16_avx2;
  }
  aom_paeth_predictor_64x16 = pcVar153;
  if (!bVar445) {
    pcVar154 = aom_paeth_predictor_64x32_avx2;
  }
  aom_paeth_predictor_64x32 = pcVar154;
  if (!bVar445) {
    pcVar155 = aom_paeth_predictor_64x64_avx2;
  }
  aom_paeth_predictor_64x64 = pcVar155;
  aom_paeth_predictor_8x16 = pcVar156;
  aom_paeth_predictor_8x32 = pcVar157;
  aom_paeth_predictor_8x4 = pcVar158;
  aom_paeth_predictor_8x8 = pcVar159;
  if (!bVar445) {
    pcVar264 = aom_quantize_b_avx2;
  }
  aom_quantize_b = pcVar264;
  if (!bVar445) {
    pcVar266 = aom_quantize_b_32x32_avx2;
  }
  aom_quantize_b_32x32 = pcVar266;
  pcVar6 = aom_quantize_b_adaptive_avx2;
  if (bVar445) {
    pcVar6 = aom_quantize_b_adaptive_sse2;
  }
  else {
    pcVar160 = aom_quantize_b_64x64_avx2;
  }
  aom_quantize_b_64x64 = pcVar160;
  aom_quantize_b_adaptive = pcVar6;
  pcVar6 = aom_sad128x128_avg_avx2;
  if (bVar445) {
    pcVar6 = aom_sad128x128_avg_sse2;
  }
  pcVar7 = aom_sad128x128_avx2;
  if (bVar445) {
    pcVar7 = aom_sad128x128_sse2;
  }
  aom_sad128x128 = pcVar7;
  aom_sad128x128_avg = pcVar6;
  pcVar6 = aom_sad128x128x4d_avx2;
  if (bVar445) {
    pcVar6 = aom_sad128x128x4d_sse2;
  }
  pcVar7 = aom_sad128x128x3d_avx2;
  if (bVar445) {
    pcVar7 = aom_sad128x128x3d_c;
  }
  aom_sad128x128x3d = pcVar7;
  aom_sad128x128x4d = pcVar6;
  pcVar6 = aom_sad128x64_avg_avx2;
  if (bVar445) {
    pcVar6 = aom_sad128x64_avg_sse2;
  }
  pcVar7 = aom_sad128x64_avx2;
  if (bVar445) {
    pcVar7 = aom_sad128x64_sse2;
  }
  aom_sad128x64 = pcVar7;
  aom_sad128x64_avg = pcVar6;
  pcVar6 = aom_sad128x64x4d_avx2;
  if (bVar445) {
    pcVar6 = aom_sad128x64x4d_sse2;
  }
  pcVar7 = aom_sad128x64x3d_avx2;
  if (bVar445) {
    pcVar7 = aom_sad128x64x3d_c;
  }
  aom_sad128x64x3d = pcVar7;
  aom_sad128x64x4d = pcVar6;
  pcVar6 = aom_sad16x16x4d_avx2;
  if (bVar445) {
    pcVar6 = aom_sad16x16x4d_sse2;
  }
  pcVar7 = aom_sad16x16x3d_avx2;
  if (bVar445) {
    pcVar7 = aom_sad16x16x3d_c;
  }
  aom_sad16x16x3d = pcVar7;
  aom_sad16x16x4d = pcVar6;
  pcVar6 = aom_sad16x32x4d_avx2;
  if (bVar445) {
    pcVar6 = aom_sad16x32x4d_sse2;
  }
  pcVar7 = aom_sad16x32x3d_avx2;
  if (bVar445) {
    pcVar7 = aom_sad16x32x3d_c;
  }
  aom_sad16x32x3d = pcVar7;
  aom_sad16x32x4d = pcVar6;
  pcVar6 = aom_sad16x4x4d_avx2;
  if (bVar445) {
    pcVar6 = aom_sad16x4x4d_sse2;
  }
  pcVar7 = aom_sad16x4x3d_avx2;
  if (bVar445) {
    pcVar7 = aom_sad16x4x3d_c;
  }
  aom_sad16x4x3d = pcVar7;
  aom_sad16x4x4d = pcVar6;
  pcVar6 = aom_sad16x64x4d_avx2;
  if (bVar445) {
    pcVar6 = aom_sad16x64x4d_sse2;
  }
  pcVar7 = aom_sad16x64x3d_avx2;
  if (bVar445) {
    pcVar7 = aom_sad16x64x3d_c;
  }
  aom_sad16x64x3d = pcVar7;
  aom_sad16x64x4d = pcVar6;
  pcVar6 = aom_sad16x8x4d_avx2;
  if (bVar445) {
    pcVar6 = aom_sad16x8x4d_sse2;
  }
  pcVar7 = aom_sad16x8x3d_avx2;
  if (bVar445) {
    pcVar7 = aom_sad16x8x3d_c;
  }
  aom_sad16x8x3d = pcVar7;
  aom_sad16x8x4d = pcVar6;
  pcVar6 = aom_sad32x16_avg_avx2;
  if (bVar445) {
    pcVar6 = aom_sad32x16_avg_sse2;
  }
  pcVar7 = aom_sad32x16_avx2;
  if (bVar445) {
    pcVar7 = aom_sad32x16_sse2;
  }
  aom_sad32x16 = pcVar7;
  aom_sad32x16_avg = pcVar6;
  pcVar6 = aom_sad32x16x4d_avx2;
  if (bVar445) {
    pcVar6 = aom_sad32x16x4d_sse2;
  }
  pcVar7 = aom_sad32x16x3d_avx2;
  if (bVar445) {
    pcVar7 = aom_sad32x16x3d_c;
  }
  aom_sad32x16x3d = pcVar7;
  aom_sad32x16x4d = pcVar6;
  pcVar6 = aom_sad32x32_avg_avx2;
  if (bVar445) {
    pcVar6 = aom_sad32x32_avg_sse2;
  }
  pcVar7 = aom_sad32x32_avx2;
  if (bVar445) {
    pcVar7 = aom_sad32x32_sse2;
  }
  aom_sad32x32 = pcVar7;
  aom_sad32x32_avg = pcVar6;
  pcVar6 = aom_sad32x32x4d_avx2;
  if (bVar445) {
    pcVar6 = aom_sad32x32x4d_sse2;
  }
  pcVar7 = aom_sad32x32x3d_avx2;
  if (bVar445) {
    pcVar7 = aom_sad32x32x3d_c;
  }
  aom_sad32x32x3d = pcVar7;
  aom_sad32x32x4d = pcVar6;
  pcVar6 = aom_sad32x64_avg_avx2;
  if (bVar445) {
    pcVar6 = aom_sad32x64_avg_sse2;
  }
  pcVar7 = aom_sad32x64_avx2;
  if (bVar445) {
    pcVar7 = aom_sad32x64_sse2;
  }
  aom_sad32x64 = pcVar7;
  aom_sad32x64_avg = pcVar6;
  pcVar6 = aom_sad32x64x4d_avx2;
  if (bVar445) {
    pcVar6 = aom_sad32x64x4d_sse2;
  }
  pcVar7 = aom_sad32x64x3d_avx2;
  if (bVar445) {
    pcVar7 = aom_sad32x64x3d_c;
  }
  aom_sad32x64x3d = pcVar7;
  aom_sad32x64x4d = pcVar6;
  pcVar6 = aom_sad32x8x4d_avx2;
  if (bVar445) {
    pcVar6 = aom_sad32x8x4d_sse2;
  }
  pcVar7 = aom_sad32x8x3d_avx2;
  if (bVar445) {
    pcVar7 = aom_sad32x8x3d_c;
  }
  aom_sad32x8x3d = pcVar7;
  aom_sad32x8x4d = pcVar6;
  pcVar6 = aom_sad64x128_avg_avx2;
  if (bVar445) {
    pcVar6 = aom_sad64x128_avg_sse2;
  }
  pcVar7 = aom_sad64x128_avx2;
  if (bVar445) {
    pcVar7 = aom_sad64x128_sse2;
  }
  aom_sad64x128 = pcVar7;
  aom_sad64x128_avg = pcVar6;
  pcVar6 = aom_sad64x128x4d_avx2;
  if (bVar445) {
    pcVar6 = aom_sad64x128x4d_sse2;
  }
  pcVar7 = aom_sad64x128x3d_avx2;
  if (bVar445) {
    pcVar7 = aom_sad64x128x3d_c;
  }
  aom_sad64x128x3d = pcVar7;
  aom_sad64x128x4d = pcVar6;
  pcVar6 = aom_sad64x16x4d_avx2;
  if (bVar445) {
    pcVar6 = aom_sad64x16x4d_sse2;
  }
  pcVar7 = aom_sad64x16x3d_avx2;
  if (bVar445) {
    pcVar7 = aom_sad64x16x3d_c;
  }
  aom_sad64x16x3d = pcVar7;
  aom_sad64x16x4d = pcVar6;
  pcVar6 = aom_sad64x32_avg_avx2;
  if (bVar445) {
    pcVar6 = aom_sad64x32_avg_sse2;
  }
  pcVar7 = aom_sad64x32_avx2;
  if (bVar445) {
    pcVar7 = aom_sad64x32_sse2;
  }
  aom_sad64x32 = pcVar7;
  aom_sad64x32_avg = pcVar6;
  pcVar6 = aom_sad64x32x4d_avx2;
  if (bVar445) {
    pcVar6 = aom_sad64x32x4d_sse2;
  }
  pcVar7 = aom_sad64x32x3d_avx2;
  if (bVar445) {
    pcVar7 = aom_sad64x32x3d_c;
  }
  aom_sad64x32x3d = pcVar7;
  aom_sad64x32x4d = pcVar6;
  pcVar6 = aom_sad64x64_avg_avx2;
  if (bVar445) {
    pcVar6 = aom_sad64x64_avg_sse2;
  }
  pcVar7 = aom_sad64x64_avx2;
  if (bVar445) {
    pcVar7 = aom_sad64x64_sse2;
  }
  aom_sad64x64 = pcVar7;
  aom_sad64x64_avg = pcVar6;
  pcVar6 = aom_sad64x64x4d_avx2;
  if (bVar445) {
    pcVar6 = aom_sad64x64x4d_sse2;
  }
  pcVar7 = aom_sad64x64x3d_avx2;
  if (bVar445) {
    pcVar7 = aom_sad64x64x3d_c;
  }
  aom_sad64x64x3d = pcVar7;
  aom_sad64x64x4d = pcVar6;
  pcVar6 = aom_sad_skip_128x128x4d_avx2;
  if (bVar445) {
    pcVar6 = aom_sad_skip_128x128x4d_sse2;
  }
  pcVar7 = aom_sad_skip_128x128_avx2;
  if (bVar445) {
    pcVar7 = aom_sad_skip_128x128_sse2;
  }
  aom_sad_skip_128x128 = pcVar7;
  aom_sad_skip_128x128x4d = pcVar6;
  pcVar6 = aom_sad_skip_128x64x4d_avx2;
  if (bVar445) {
    pcVar6 = aom_sad_skip_128x64x4d_sse2;
  }
  pcVar7 = aom_sad_skip_128x64_avx2;
  if (bVar445) {
    pcVar7 = aom_sad_skip_128x64_sse2;
  }
  aom_sad_skip_128x64 = pcVar7;
  aom_sad_skip_128x64x4d = pcVar6;
  pcVar6 = aom_sad_skip_16x32x4d_avx2;
  if (bVar445) {
    pcVar6 = aom_sad_skip_16x32x4d_sse2;
  }
  pcVar7 = aom_sad_skip_16x16x4d_avx2;
  if (bVar445) {
    pcVar7 = aom_sad_skip_16x16x4d_sse2;
  }
  aom_sad_skip_16x16x4d = pcVar7;
  aom_sad_skip_16x32x4d = pcVar6;
  pcVar6 = aom_sad_skip_32x16_avx2;
  if (bVar445) {
    pcVar6 = aom_sad_skip_32x16_sse2;
  }
  pcVar7 = aom_sad_skip_16x64x4d_avx2;
  if (bVar445) {
    pcVar7 = aom_sad_skip_16x64x4d_sse2;
  }
  aom_sad_skip_16x64x4d = pcVar7;
  aom_sad_skip_32x16 = pcVar6;
  pcVar6 = aom_sad_skip_32x32_avx2;
  if (bVar445) {
    pcVar6 = aom_sad_skip_32x32_sse2;
  }
  pcVar7 = aom_sad_skip_32x16x4d_avx2;
  if (bVar445) {
    pcVar7 = aom_sad_skip_32x16x4d_sse2;
  }
  aom_sad_skip_32x16x4d = pcVar7;
  aom_sad_skip_32x32 = pcVar6;
  pcVar6 = aom_sad_skip_32x64_avx2;
  if (bVar445) {
    pcVar6 = aom_sad_skip_32x64_sse2;
  }
  pcVar7 = aom_sad_skip_32x32x4d_avx2;
  if (bVar445) {
    pcVar7 = aom_sad_skip_32x32x4d_sse2;
  }
  aom_sad_skip_32x32x4d = pcVar7;
  aom_sad_skip_32x64 = pcVar6;
  pcVar6 = aom_sad_skip_64x128_avx2;
  if (bVar445) {
    pcVar6 = aom_sad_skip_64x128_sse2;
  }
  pcVar7 = aom_sad_skip_32x64x4d_avx2;
  if (bVar445) {
    pcVar7 = aom_sad_skip_32x64x4d_sse2;
  }
  aom_sad_skip_32x64x4d = pcVar7;
  aom_sad_skip_64x128 = pcVar6;
  pcVar6 = aom_sad_skip_64x16x4d_avx2;
  if (bVar445) {
    pcVar6 = aom_sad_skip_64x16x4d_sse2;
  }
  pcVar7 = aom_sad_skip_64x128x4d_avx2;
  if (bVar445) {
    pcVar7 = aom_sad_skip_64x128x4d_sse2;
  }
  aom_sad_skip_64x128x4d = pcVar7;
  aom_sad_skip_64x16x4d = pcVar6;
  pcVar6 = aom_sad_skip_64x32x4d_avx2;
  if (bVar445) {
    pcVar6 = aom_sad_skip_64x32x4d_sse2;
  }
  pcVar7 = aom_sad_skip_64x32_avx2;
  if (bVar445) {
    pcVar7 = aom_sad_skip_64x32_sse2;
  }
  aom_sad_skip_64x32 = pcVar7;
  aom_sad_skip_64x32x4d = pcVar6;
  pcVar6 = aom_sad_skip_64x64x4d_avx2;
  if (bVar445) {
    pcVar6 = aom_sad_skip_64x64x4d_sse2;
  }
  pcVar7 = aom_sad_skip_64x64_avx2;
  if (bVar445) {
    pcVar7 = aom_sad_skip_64x64_sse2;
  }
  aom_sad_skip_64x64 = pcVar7;
  aom_sad_skip_64x64x4d = pcVar6;
  pcVar6 = aom_satd_lp_avx2;
  if (bVar445) {
    pcVar6 = aom_satd_lp_sse2;
  }
  pcVar7 = aom_satd_avx2;
  if (bVar445) {
    pcVar7 = aom_satd_sse2;
  }
  aom_satd = pcVar7;
  aom_satd_lp = pcVar6;
  aom_scaled_2d = pcVar161;
  aom_smooth_h_predictor_16x16 = pcVar162;
  aom_smooth_h_predictor_16x32 = pcVar163;
  aom_smooth_h_predictor_16x4 = pcVar164;
  aom_smooth_h_predictor_16x64 = pcVar165;
  aom_smooth_h_predictor_16x8 = pcVar166;
  aom_smooth_h_predictor_32x16 = pcVar167;
  aom_smooth_h_predictor_32x32 = pcVar168;
  aom_smooth_h_predictor_32x64 = pcVar169;
  aom_smooth_h_predictor_32x8 = pcVar170;
  aom_smooth_h_predictor_4x16 = pcVar171;
  aom_smooth_h_predictor_4x4 = pcVar172;
  aom_smooth_h_predictor_4x8 = pcVar173;
  aom_smooth_h_predictor_64x16 = pcVar174;
  aom_smooth_h_predictor_64x32 = pcVar175;
  aom_smooth_h_predictor_64x64 = pcVar176;
  aom_smooth_h_predictor_8x16 = pcVar177;
  aom_smooth_h_predictor_8x32 = pcVar178;
  aom_smooth_h_predictor_8x4 = pcVar179;
  aom_smooth_h_predictor_8x8 = pcVar180;
  aom_smooth_predictor_16x16 = pcVar181;
  aom_smooth_predictor_16x32 = pcVar182;
  aom_smooth_predictor_16x4 = pcVar183;
  aom_smooth_predictor_16x64 = pcVar184;
  aom_smooth_predictor_16x8 = pcVar185;
  aom_smooth_predictor_32x16 = pcVar186;
  aom_smooth_predictor_32x32 = pcVar187;
  aom_smooth_predictor_32x64 = pcVar188;
  aom_smooth_predictor_32x8 = pcVar189;
  aom_smooth_predictor_4x16 = pcVar190;
  aom_smooth_predictor_4x4 = pcVar191;
  aom_smooth_predictor_4x8 = pcVar192;
  aom_smooth_predictor_64x16 = pcVar193;
  aom_smooth_predictor_64x32 = pcVar194;
  aom_smooth_predictor_64x64 = pcVar195;
  aom_smooth_predictor_8x16 = pcVar196;
  aom_smooth_predictor_8x32 = pcVar197;
  aom_smooth_predictor_8x4 = pcVar198;
  aom_smooth_predictor_8x8 = pcVar199;
  aom_smooth_v_predictor_16x16 = pcVar200;
  aom_smooth_v_predictor_16x32 = pcVar201;
  aom_smooth_v_predictor_16x4 = pcVar202;
  aom_smooth_v_predictor_16x64 = pcVar203;
  aom_smooth_v_predictor_16x8 = pcVar204;
  aom_smooth_v_predictor_32x16 = pcVar205;
  aom_smooth_v_predictor_32x32 = pcVar206;
  aom_smooth_v_predictor_32x64 = pcVar207;
  aom_smooth_v_predictor_32x8 = pcVar208;
  aom_smooth_v_predictor_4x16 = pcVar209;
  aom_smooth_v_predictor_4x4 = pcVar210;
  aom_smooth_v_predictor_4x8 = pcVar211;
  aom_smooth_v_predictor_64x16 = pcVar212;
  aom_smooth_v_predictor_64x32 = pcVar213;
  aom_smooth_v_predictor_64x64 = pcVar214;
  aom_smooth_v_predictor_8x16 = pcVar215;
  aom_smooth_v_predictor_8x32 = pcVar216;
  aom_smooth_v_predictor_8x4 = pcVar217;
  aom_smooth_v_predictor_8x8 = pcVar218;
  if (!bVar445) {
    pcVar439 = aom_sse_avx2;
  }
  aom_sse = pcVar439;
  if (!bVar445) {
    pcVar219 = aom_sub_pixel_avg_variance128x128_avx2;
  }
  aom_sub_pixel_avg_variance128x128 = pcVar219;
  if (!bVar445) {
    pcVar220 = aom_sub_pixel_avg_variance128x64_avx2;
  }
  aom_sub_pixel_avg_variance128x64 = pcVar220;
  aom_sub_pixel_avg_variance16x16 = pcVar221;
  aom_sub_pixel_avg_variance16x32 = pcVar222;
  aom_sub_pixel_avg_variance16x4 = pcVar223;
  aom_sub_pixel_avg_variance16x64 = pcVar224;
  aom_sub_pixel_avg_variance16x8 = pcVar225;
  if (!bVar445) {
    pcVar226 = aom_sub_pixel_avg_variance32x16_avx2;
  }
  aom_sub_pixel_avg_variance32x16 = pcVar226;
  if (!bVar445) {
    pcVar228 = aom_sub_pixel_avg_variance32x64_avx2;
    pcVar227 = aom_sub_pixel_avg_variance32x32_avx2;
  }
  aom_sub_pixel_avg_variance32x32 = pcVar227;
  aom_sub_pixel_avg_variance32x64 = pcVar228;
  aom_sub_pixel_avg_variance32x8 = pcVar229;
  aom_sub_pixel_avg_variance4x16 = pcVar230;
  aom_sub_pixel_avg_variance4x4 = pcVar231;
  if (!bVar445) {
    pcVar233 = aom_sub_pixel_avg_variance64x128_avx2;
  }
  aom_sub_pixel_avg_variance4x8 = pcVar232;
  aom_sub_pixel_avg_variance64x128 = pcVar233;
  aom_sub_pixel_avg_variance64x16 = pcVar234;
  if (!bVar445) {
    pcVar235 = aom_sub_pixel_avg_variance64x32_avx2;
  }
  aom_sub_pixel_avg_variance64x32 = pcVar235;
  if (!bVar445) {
    pcVar236 = aom_sub_pixel_avg_variance64x64_avx2;
  }
  aom_sub_pixel_avg_variance64x64 = pcVar236;
  aom_sub_pixel_avg_variance8x16 = pcVar237;
  aom_sub_pixel_avg_variance8x32 = pcVar238;
  aom_sub_pixel_avg_variance8x4 = pcVar239;
  aom_sub_pixel_avg_variance8x8 = pcVar240;
  if (!bVar445) {
    pcVar241 = aom_sub_pixel_variance128x128_avx2;
  }
  aom_sub_pixel_variance128x128 = pcVar241;
  if (!bVar445) {
    pcVar243 = aom_sub_pixel_variance16x16_avx2;
    pcVar242 = aom_sub_pixel_variance128x64_avx2;
  }
  aom_sub_pixel_variance128x64 = pcVar242;
  if (!bVar445) {
    pcVar244 = aom_sub_pixel_variance16x32_avx2;
    pcVar245 = aom_sub_pixel_variance16x4_avx2;
  }
  aom_sub_pixel_variance16x16 = pcVar243;
  if (!bVar445) {
    pcVar246 = aom_sub_pixel_variance16x64_avx2;
  }
  aom_sub_pixel_variance16x32 = pcVar244;
  aom_sub_pixel_variance16x4 = pcVar245;
  aom_sub_pixel_variance16x64 = pcVar246;
  if (!bVar445) {
    pcVar247 = aom_sub_pixel_variance16x8_avx2;
  }
  aom_sub_pixel_variance16x8 = pcVar247;
  if (!bVar445) {
    pcVar248 = aom_sub_pixel_variance32x16_avx2;
  }
  aom_sub_pixel_variance32x16 = pcVar248;
  if (!bVar445) {
    pcVar249 = aom_sub_pixel_variance32x32_avx2;
  }
  aom_sub_pixel_variance32x32 = pcVar249;
  if (!bVar445) {
    pcVar250 = aom_sub_pixel_variance32x64_avx2;
  }
  aom_sub_pixel_variance32x64 = pcVar250;
  aom_sub_pixel_variance32x8 = pcVar251;
  aom_sub_pixel_variance4x16 = pcVar252;
  aom_sub_pixel_variance4x4 = pcVar253;
  if (!bVar445) {
    pcVar255 = aom_sub_pixel_variance64x128_avx2;
  }
  aom_sub_pixel_variance4x8 = pcVar254;
  aom_sub_pixel_variance64x128 = pcVar255;
  aom_sub_pixel_variance64x16 = pcVar256;
  if (!bVar445) {
    pcVar258 = aom_sub_pixel_variance64x64_avx2;
    pcVar257 = aom_sub_pixel_variance64x32_avx2;
  }
  aom_sub_pixel_variance64x32 = pcVar257;
  aom_sub_pixel_variance64x64 = pcVar258;
  aom_sub_pixel_variance8x16 = pcVar259;
  aom_sub_pixel_variance8x32 = pcVar260;
  aom_sub_pixel_variance8x4 = pcVar261;
  aom_sub_pixel_variance8x8 = pcVar262;
  pcVar7 = aom_subtract_block_avx2;
  pcVar6 = aom_sum_squares_2d_i16_avx2;
  if (bVar445) {
    pcVar6 = aom_sum_squares_2d_i16_sse2;
    pcVar7 = aom_subtract_block_sse2;
  }
  aom_subtract_block = pcVar7;
  aom_sum_squares_2d_i16 = pcVar6;
  pcVar7 = aom_sum_sse_2d_i16_avx2;
  pcVar6 = aom_v_predictor_32x16_avx2;
  if (bVar445) {
    pcVar6 = aom_v_predictor_32x16_sse2;
    pcVar7 = aom_sum_sse_2d_i16_sse2;
  }
  aom_sum_sse_2d_i16 = pcVar7;
  aom_v_predictor_32x16 = pcVar6;
  pcVar7 = aom_v_predictor_32x32_avx2;
  pcVar6 = aom_v_predictor_32x64_avx2;
  if (bVar445) {
    pcVar6 = aom_v_predictor_32x64_sse2;
    pcVar7 = aom_v_predictor_32x32_sse2;
  }
  aom_v_predictor_32x32 = pcVar7;
  aom_v_predictor_32x64 = pcVar6;
  pcVar7 = aom_v_predictor_64x16_avx2;
  pcVar6 = aom_v_predictor_64x32_avx2;
  if (bVar445) {
    pcVar6 = aom_v_predictor_64x32_sse2;
    pcVar7 = aom_v_predictor_64x16_sse2;
  }
  aom_v_predictor_64x16 = pcVar7;
  aom_v_predictor_64x32 = pcVar6;
  pcVar7 = aom_v_predictor_64x64_avx2;
  pcVar6 = aom_var_2d_u16_avx2;
  if (bVar445) {
    pcVar6 = aom_var_2d_u16_sse2;
    pcVar7 = aom_v_predictor_64x64_sse2;
  }
  aom_v_predictor_64x64 = pcVar7;
  aom_var_2d_u16 = pcVar6;
  pcVar7 = aom_var_2d_u8_avx2;
  pcVar6 = aom_variance128x128_avx2;
  if (bVar445) {
    pcVar6 = aom_variance128x128_sse2;
    pcVar7 = aom_var_2d_u8_sse2;
  }
  aom_var_2d_u8 = pcVar7;
  aom_variance128x128 = pcVar6;
  pcVar7 = aom_variance128x64_avx2;
  pcVar6 = aom_variance16x16_avx2;
  if (bVar445) {
    pcVar6 = aom_variance16x16_sse2;
    pcVar7 = aom_variance128x64_sse2;
  }
  aom_variance128x64 = pcVar7;
  aom_variance16x16 = pcVar6;
  pcVar7 = aom_variance16x32_avx2;
  pcVar6 = aom_variance16x4_avx2;
  if (bVar445) {
    pcVar6 = aom_variance16x4_sse2;
    pcVar7 = aom_variance16x32_sse2;
  }
  aom_variance16x32 = pcVar7;
  aom_variance16x4 = pcVar6;
  pcVar7 = aom_variance16x64_avx2;
  pcVar6 = aom_variance16x8_avx2;
  if (bVar445) {
    pcVar6 = aom_variance16x8_sse2;
    pcVar7 = aom_variance16x64_sse2;
  }
  aom_variance16x64 = pcVar7;
  aom_variance16x8 = pcVar6;
  pcVar7 = aom_variance32x16_avx2;
  pcVar6 = aom_variance32x32_avx2;
  if (bVar445) {
    pcVar6 = aom_variance32x32_sse2;
    pcVar7 = aom_variance32x16_sse2;
  }
  aom_variance32x16 = pcVar7;
  aom_variance32x32 = pcVar6;
  pcVar7 = aom_variance32x64_avx2;
  pcVar6 = aom_variance32x8_avx2;
  if (bVar445) {
    pcVar6 = aom_variance32x8_sse2;
    pcVar7 = aom_variance32x64_sse2;
  }
  aom_variance32x64 = pcVar7;
  aom_variance32x8 = pcVar6;
  pcVar6 = aom_variance64x128_avx2;
  if (bVar445) {
    pcVar6 = aom_variance64x128_sse2;
  }
  pcVar7 = aom_variance64x16_avx2;
  if (bVar445) {
    pcVar7 = aom_variance64x16_sse2;
  }
  pcVar8 = aom_variance64x32_avx2;
  if (bVar445) {
    pcVar8 = aom_variance64x32_sse2;
  }
  aom_variance64x128 = pcVar6;
  aom_variance64x16 = pcVar7;
  aom_variance64x32 = pcVar8;
  pcVar6 = aom_variance64x64_avx2;
  if (bVar445) {
    pcVar6 = aom_variance64x64_sse2;
  }
  aom_variance64x64 = pcVar6;
  if (!bVar445) {
    pcVar440 = aom_vector_var_avx2;
  }
  aom_vector_var = pcVar440;
  return;
}

Assistant:

static void setup_rtcd_internal(void)
{
    int flags = x86_simd_caps();

    (void)flags;

    av1_apply_selfguided_restoration = av1_apply_selfguided_restoration_c;
    if (flags & HAS_SSE4_1) av1_apply_selfguided_restoration = av1_apply_selfguided_restoration_sse4_1;
    if (flags & HAS_AVX2) av1_apply_selfguided_restoration = av1_apply_selfguided_restoration_avx2;
    av1_apply_temporal_filter = av1_apply_temporal_filter_sse2;
    if (flags & HAS_AVX2) av1_apply_temporal_filter = av1_apply_temporal_filter_avx2;
    av1_block_error = av1_block_error_sse2;
    if (flags & HAS_AVX2) av1_block_error = av1_block_error_avx2;
    av1_block_error_lp = av1_block_error_lp_sse2;
    if (flags & HAS_AVX2) av1_block_error_lp = av1_block_error_lp_avx2;
    av1_build_compound_diffwtd_mask = av1_build_compound_diffwtd_mask_c;
    if (flags & HAS_SSE4_1) av1_build_compound_diffwtd_mask = av1_build_compound_diffwtd_mask_sse4_1;
    if (flags & HAS_AVX2) av1_build_compound_diffwtd_mask = av1_build_compound_diffwtd_mask_avx2;
    av1_build_compound_diffwtd_mask_d16 = av1_build_compound_diffwtd_mask_d16_c;
    if (flags & HAS_SSE4_1) av1_build_compound_diffwtd_mask_d16 = av1_build_compound_diffwtd_mask_d16_sse4_1;
    if (flags & HAS_AVX2) av1_build_compound_diffwtd_mask_d16 = av1_build_compound_diffwtd_mask_d16_avx2;
    av1_build_compound_diffwtd_mask_highbd = av1_build_compound_diffwtd_mask_highbd_c;
    if (flags & HAS_SSSE3) av1_build_compound_diffwtd_mask_highbd = av1_build_compound_diffwtd_mask_highbd_ssse3;
    if (flags & HAS_AVX2) av1_build_compound_diffwtd_mask_highbd = av1_build_compound_diffwtd_mask_highbd_avx2;
    av1_calc_indices_dim1 = av1_calc_indices_dim1_sse2;
    if (flags & HAS_AVX2) av1_calc_indices_dim1 = av1_calc_indices_dim1_avx2;
    av1_calc_indices_dim2 = av1_calc_indices_dim2_sse2;
    if (flags & HAS_AVX2) av1_calc_indices_dim2 = av1_calc_indices_dim2_avx2;
    av1_calc_proj_params = av1_calc_proj_params_c;
    if (flags & HAS_SSE4_1) av1_calc_proj_params = av1_calc_proj_params_sse4_1;
    if (flags & HAS_AVX2) av1_calc_proj_params = av1_calc_proj_params_avx2;
    av1_calc_proj_params_high_bd = av1_calc_proj_params_high_bd_c;
    if (flags & HAS_SSE4_1) av1_calc_proj_params_high_bd = av1_calc_proj_params_high_bd_sse4_1;
    if (flags & HAS_AVX2) av1_calc_proj_params_high_bd = av1_calc_proj_params_high_bd_avx2;
    av1_cnn_convolve_no_maxpool_padding_valid = av1_cnn_convolve_no_maxpool_padding_valid_c;
    if (flags & HAS_AVX2) av1_cnn_convolve_no_maxpool_padding_valid = av1_cnn_convolve_no_maxpool_padding_valid_avx2;
    av1_compute_stats = av1_compute_stats_c;
    if (flags & HAS_SSE4_1) av1_compute_stats = av1_compute_stats_sse4_1;
    if (flags & HAS_AVX2) av1_compute_stats = av1_compute_stats_avx2;
    av1_compute_stats_highbd = av1_compute_stats_highbd_c;
    if (flags & HAS_SSE4_1) av1_compute_stats_highbd = av1_compute_stats_highbd_sse4_1;
    if (flags & HAS_AVX2) av1_compute_stats_highbd = av1_compute_stats_highbd_avx2;
    av1_convolve_2d_scale = av1_convolve_2d_scale_c;
    if (flags & HAS_SSE4_1) av1_convolve_2d_scale = av1_convolve_2d_scale_sse4_1;
    av1_convolve_2d_sr = av1_convolve_2d_sr_sse2;
    if (flags & HAS_AVX2) av1_convolve_2d_sr = av1_convolve_2d_sr_avx2;
    av1_convolve_horiz_rs = av1_convolve_horiz_rs_c;
    if (flags & HAS_SSE4_1) av1_convolve_horiz_rs = av1_convolve_horiz_rs_sse4_1;
    av1_convolve_x_sr = av1_convolve_x_sr_sse2;
    if (flags & HAS_AVX2) av1_convolve_x_sr = av1_convolve_x_sr_avx2;
    av1_convolve_y_sr = av1_convolve_y_sr_sse2;
    if (flags & HAS_AVX2) av1_convolve_y_sr = av1_convolve_y_sr_avx2;
    av1_dist_wtd_convolve_2d = av1_dist_wtd_convolve_2d_c;
    if (flags & HAS_SSSE3) av1_dist_wtd_convolve_2d = av1_dist_wtd_convolve_2d_ssse3;
    if (flags & HAS_AVX2) av1_dist_wtd_convolve_2d = av1_dist_wtd_convolve_2d_avx2;
    av1_dist_wtd_convolve_2d_copy = av1_dist_wtd_convolve_2d_copy_sse2;
    if (flags & HAS_AVX2) av1_dist_wtd_convolve_2d_copy = av1_dist_wtd_convolve_2d_copy_avx2;
    av1_dist_wtd_convolve_x = av1_dist_wtd_convolve_x_sse2;
    if (flags & HAS_AVX2) av1_dist_wtd_convolve_x = av1_dist_wtd_convolve_x_avx2;
    av1_dist_wtd_convolve_y = av1_dist_wtd_convolve_y_sse2;
    if (flags & HAS_AVX2) av1_dist_wtd_convolve_y = av1_dist_wtd_convolve_y_avx2;
    av1_dr_prediction_z1 = av1_dr_prediction_z1_c;
    if (flags & HAS_SSE4_1) av1_dr_prediction_z1 = av1_dr_prediction_z1_sse4_1;
    if (flags & HAS_AVX2) av1_dr_prediction_z1 = av1_dr_prediction_z1_avx2;
    av1_dr_prediction_z2 = av1_dr_prediction_z2_c;
    if (flags & HAS_SSE4_1) av1_dr_prediction_z2 = av1_dr_prediction_z2_sse4_1;
    if (flags & HAS_AVX2) av1_dr_prediction_z2 = av1_dr_prediction_z2_avx2;
    av1_dr_prediction_z3 = av1_dr_prediction_z3_c;
    if (flags & HAS_SSE4_1) av1_dr_prediction_z3 = av1_dr_prediction_z3_sse4_1;
    if (flags & HAS_AVX2) av1_dr_prediction_z3 = av1_dr_prediction_z3_avx2;
    av1_estimate_noise_from_single_plane = av1_estimate_noise_from_single_plane_c;
    if (flags & HAS_AVX2) av1_estimate_noise_from_single_plane = av1_estimate_noise_from_single_plane_avx2;
    av1_filter_intra_edge = av1_filter_intra_edge_c;
    if (flags & HAS_SSE4_1) av1_filter_intra_edge = av1_filter_intra_edge_sse4_1;
    av1_filter_intra_predictor = av1_filter_intra_predictor_c;
    if (flags & HAS_SSE4_1) av1_filter_intra_predictor = av1_filter_intra_predictor_sse4_1;
    av1_fwd_txfm2d_16x16 = av1_fwd_txfm2d_16x16_c;
    if (flags & HAS_SSE4_1) av1_fwd_txfm2d_16x16 = av1_fwd_txfm2d_16x16_sse4_1;
    if (flags & HAS_AVX2) av1_fwd_txfm2d_16x16 = av1_fwd_txfm2d_16x16_avx2;
    av1_fwd_txfm2d_16x32 = av1_fwd_txfm2d_16x32_c;
    if (flags & HAS_SSE4_1) av1_fwd_txfm2d_16x32 = av1_fwd_txfm2d_16x32_sse4_1;
    av1_fwd_txfm2d_16x4 = av1_fwd_txfm2d_16x4_c;
    if (flags & HAS_SSE4_1) av1_fwd_txfm2d_16x4 = av1_fwd_txfm2d_16x4_sse4_1;
    av1_fwd_txfm2d_16x64 = av1_fwd_txfm2d_16x64_c;
    if (flags & HAS_SSE4_1) av1_fwd_txfm2d_16x64 = av1_fwd_txfm2d_16x64_sse4_1;
    av1_fwd_txfm2d_16x8 = av1_fwd_txfm2d_16x8_c;
    if (flags & HAS_SSE4_1) av1_fwd_txfm2d_16x8 = av1_fwd_txfm2d_16x8_sse4_1;
    if (flags & HAS_AVX2) av1_fwd_txfm2d_16x8 = av1_fwd_txfm2d_16x8_avx2;
    av1_fwd_txfm2d_32x16 = av1_fwd_txfm2d_32x16_c;
    if (flags & HAS_SSE4_1) av1_fwd_txfm2d_32x16 = av1_fwd_txfm2d_32x16_sse4_1;
    av1_fwd_txfm2d_32x32 = av1_fwd_txfm2d_32x32_c;
    if (flags & HAS_SSE4_1) av1_fwd_txfm2d_32x32 = av1_fwd_txfm2d_32x32_sse4_1;
    if (flags & HAS_AVX2) av1_fwd_txfm2d_32x32 = av1_fwd_txfm2d_32x32_avx2;
    av1_fwd_txfm2d_32x64 = av1_fwd_txfm2d_32x64_c;
    if (flags & HAS_SSE4_1) av1_fwd_txfm2d_32x64 = av1_fwd_txfm2d_32x64_sse4_1;
    av1_fwd_txfm2d_32x8 = av1_fwd_txfm2d_32x8_c;
    if (flags & HAS_SSE4_1) av1_fwd_txfm2d_32x8 = av1_fwd_txfm2d_32x8_sse4_1;
    av1_fwd_txfm2d_4x16 = av1_fwd_txfm2d_4x16_c;
    if (flags & HAS_SSE4_1) av1_fwd_txfm2d_4x16 = av1_fwd_txfm2d_4x16_sse4_1;
    av1_fwd_txfm2d_4x4 = av1_fwd_txfm2d_4x4_c;
    if (flags & HAS_SSE4_1) av1_fwd_txfm2d_4x4 = av1_fwd_txfm2d_4x4_sse4_1;
    av1_fwd_txfm2d_4x8 = av1_fwd_txfm2d_4x8_c;
    if (flags & HAS_SSE4_1) av1_fwd_txfm2d_4x8 = av1_fwd_txfm2d_4x8_sse4_1;
    av1_fwd_txfm2d_64x16 = av1_fwd_txfm2d_64x16_c;
    if (flags & HAS_SSE4_1) av1_fwd_txfm2d_64x16 = av1_fwd_txfm2d_64x16_sse4_1;
    av1_fwd_txfm2d_64x32 = av1_fwd_txfm2d_64x32_c;
    if (flags & HAS_SSE4_1) av1_fwd_txfm2d_64x32 = av1_fwd_txfm2d_64x32_sse4_1;
    av1_fwd_txfm2d_64x64 = av1_fwd_txfm2d_64x64_c;
    if (flags & HAS_SSE4_1) av1_fwd_txfm2d_64x64 = av1_fwd_txfm2d_64x64_sse4_1;
    if (flags & HAS_AVX2) av1_fwd_txfm2d_64x64 = av1_fwd_txfm2d_64x64_avx2;
    av1_fwd_txfm2d_8x16 = av1_fwd_txfm2d_8x16_c;
    if (flags & HAS_SSE4_1) av1_fwd_txfm2d_8x16 = av1_fwd_txfm2d_8x16_sse4_1;
    if (flags & HAS_AVX2) av1_fwd_txfm2d_8x16 = av1_fwd_txfm2d_8x16_avx2;
    av1_fwd_txfm2d_8x32 = av1_fwd_txfm2d_8x32_c;
    if (flags & HAS_SSE4_1) av1_fwd_txfm2d_8x32 = av1_fwd_txfm2d_8x32_sse4_1;
    av1_fwd_txfm2d_8x4 = av1_fwd_txfm2d_8x4_c;
    if (flags & HAS_SSE4_1) av1_fwd_txfm2d_8x4 = av1_fwd_txfm2d_8x4_sse4_1;
    av1_fwd_txfm2d_8x8 = av1_fwd_txfm2d_8x8_c;
    if (flags & HAS_SSE4_1) av1_fwd_txfm2d_8x8 = av1_fwd_txfm2d_8x8_sse4_1;
    if (flags & HAS_AVX2) av1_fwd_txfm2d_8x8 = av1_fwd_txfm2d_8x8_avx2;
    av1_fwht4x4 = av1_fwht4x4_c;
    if (flags & HAS_SSE4_1) av1_fwht4x4 = av1_fwht4x4_sse4_1;
    av1_get_crc32c_value = av1_get_crc32c_value_c;
    if (flags & HAS_SSE4_2) av1_get_crc32c_value = av1_get_crc32c_value_sse4_2;
    av1_get_horver_correlation_full = av1_get_horver_correlation_full_c;
    if (flags & HAS_SSE4_1) av1_get_horver_correlation_full = av1_get_horver_correlation_full_sse4_1;
    if (flags & HAS_AVX2) av1_get_horver_correlation_full = av1_get_horver_correlation_full_avx2;
    av1_highbd_apply_temporal_filter = av1_highbd_apply_temporal_filter_sse2;
    if (flags & HAS_AVX2) av1_highbd_apply_temporal_filter = av1_highbd_apply_temporal_filter_avx2;
    av1_highbd_block_error = av1_highbd_block_error_sse2;
    if (flags & HAS_AVX2) av1_highbd_block_error = av1_highbd_block_error_avx2;
    av1_highbd_convolve_2d_scale = av1_highbd_convolve_2d_scale_c;
    if (flags & HAS_SSE4_1) av1_highbd_convolve_2d_scale = av1_highbd_convolve_2d_scale_sse4_1;
    av1_highbd_convolve_2d_sr = av1_highbd_convolve_2d_sr_c;
    if (flags & HAS_SSSE3) av1_highbd_convolve_2d_sr = av1_highbd_convolve_2d_sr_ssse3;
    if (flags & HAS_AVX2) av1_highbd_convolve_2d_sr = av1_highbd_convolve_2d_sr_avx2;
    av1_highbd_convolve_horiz_rs = av1_highbd_convolve_horiz_rs_c;
    if (flags & HAS_SSE4_1) av1_highbd_convolve_horiz_rs = av1_highbd_convolve_horiz_rs_sse4_1;
    av1_highbd_convolve_x_sr = av1_highbd_convolve_x_sr_c;
    if (flags & HAS_SSSE3) av1_highbd_convolve_x_sr = av1_highbd_convolve_x_sr_ssse3;
    if (flags & HAS_AVX2) av1_highbd_convolve_x_sr = av1_highbd_convolve_x_sr_avx2;
    av1_highbd_convolve_y_sr = av1_highbd_convolve_y_sr_c;
    if (flags & HAS_SSSE3) av1_highbd_convolve_y_sr = av1_highbd_convolve_y_sr_ssse3;
    if (flags & HAS_AVX2) av1_highbd_convolve_y_sr = av1_highbd_convolve_y_sr_avx2;
    av1_highbd_dist_wtd_convolve_2d = av1_highbd_dist_wtd_convolve_2d_c;
    if (flags & HAS_SSE4_1) av1_highbd_dist_wtd_convolve_2d = av1_highbd_dist_wtd_convolve_2d_sse4_1;
    if (flags & HAS_AVX2) av1_highbd_dist_wtd_convolve_2d = av1_highbd_dist_wtd_convolve_2d_avx2;
    av1_highbd_dist_wtd_convolve_2d_copy = av1_highbd_dist_wtd_convolve_2d_copy_c;
    if (flags & HAS_SSE4_1) av1_highbd_dist_wtd_convolve_2d_copy = av1_highbd_dist_wtd_convolve_2d_copy_sse4_1;
    if (flags & HAS_AVX2) av1_highbd_dist_wtd_convolve_2d_copy = av1_highbd_dist_wtd_convolve_2d_copy_avx2;
    av1_highbd_dist_wtd_convolve_x = av1_highbd_dist_wtd_convolve_x_c;
    if (flags & HAS_SSE4_1) av1_highbd_dist_wtd_convolve_x = av1_highbd_dist_wtd_convolve_x_sse4_1;
    if (flags & HAS_AVX2) av1_highbd_dist_wtd_convolve_x = av1_highbd_dist_wtd_convolve_x_avx2;
    av1_highbd_dist_wtd_convolve_y = av1_highbd_dist_wtd_convolve_y_c;
    if (flags & HAS_SSE4_1) av1_highbd_dist_wtd_convolve_y = av1_highbd_dist_wtd_convolve_y_sse4_1;
    if (flags & HAS_AVX2) av1_highbd_dist_wtd_convolve_y = av1_highbd_dist_wtd_convolve_y_avx2;
    av1_highbd_dr_prediction_z1 = av1_highbd_dr_prediction_z1_c;
    if (flags & HAS_AVX2) av1_highbd_dr_prediction_z1 = av1_highbd_dr_prediction_z1_avx2;
    av1_highbd_dr_prediction_z2 = av1_highbd_dr_prediction_z2_c;
    if (flags & HAS_AVX2) av1_highbd_dr_prediction_z2 = av1_highbd_dr_prediction_z2_avx2;
    av1_highbd_dr_prediction_z3 = av1_highbd_dr_prediction_z3_c;
    if (flags & HAS_AVX2) av1_highbd_dr_prediction_z3 = av1_highbd_dr_prediction_z3_avx2;
    av1_highbd_filter_intra_edge = av1_highbd_filter_intra_edge_c;
    if (flags & HAS_SSE4_1) av1_highbd_filter_intra_edge = av1_highbd_filter_intra_edge_sse4_1;
    av1_highbd_inv_txfm_add = av1_highbd_inv_txfm_add_c;
    if (flags & HAS_SSE4_1) av1_highbd_inv_txfm_add = av1_highbd_inv_txfm_add_sse4_1;
    if (flags & HAS_AVX2) av1_highbd_inv_txfm_add = av1_highbd_inv_txfm_add_avx2;
    av1_highbd_iwht4x4_16_add = av1_highbd_iwht4x4_16_add_c;
    if (flags & HAS_SSE4_1) av1_highbd_iwht4x4_16_add = av1_highbd_iwht4x4_16_add_sse4_1;
    av1_highbd_pixel_proj_error = av1_highbd_pixel_proj_error_c;
    if (flags & HAS_SSE4_1) av1_highbd_pixel_proj_error = av1_highbd_pixel_proj_error_sse4_1;
    if (flags & HAS_AVX2) av1_highbd_pixel_proj_error = av1_highbd_pixel_proj_error_avx2;
    av1_highbd_quantize_fp = av1_highbd_quantize_fp_c;
    if (flags & HAS_SSE4_1) av1_highbd_quantize_fp = av1_highbd_quantize_fp_sse4_1;
    if (flags & HAS_AVX2) av1_highbd_quantize_fp = av1_highbd_quantize_fp_avx2;
    av1_highbd_upsample_intra_edge = av1_highbd_upsample_intra_edge_c;
    if (flags & HAS_SSE4_1) av1_highbd_upsample_intra_edge = av1_highbd_upsample_intra_edge_sse4_1;
    av1_highbd_warp_affine = av1_highbd_warp_affine_c;
    if (flags & HAS_SSE4_1) av1_highbd_warp_affine = av1_highbd_warp_affine_sse4_1;
    if (flags & HAS_AVX2) av1_highbd_warp_affine = av1_highbd_warp_affine_avx2;
    av1_highbd_wiener_convolve_add_src = av1_highbd_wiener_convolve_add_src_c;
    if (flags & HAS_SSSE3) av1_highbd_wiener_convolve_add_src = av1_highbd_wiener_convolve_add_src_ssse3;
    if (flags & HAS_AVX2) av1_highbd_wiener_convolve_add_src = av1_highbd_wiener_convolve_add_src_avx2;
    av1_inv_txfm2d_add_4x4 = av1_inv_txfm2d_add_4x4_c;
    if (flags & HAS_SSE4_1) av1_inv_txfm2d_add_4x4 = av1_inv_txfm2d_add_4x4_sse4_1;
    av1_inv_txfm2d_add_8x8 = av1_inv_txfm2d_add_8x8_c;
    if (flags & HAS_SSE4_1) av1_inv_txfm2d_add_8x8 = av1_inv_txfm2d_add_8x8_sse4_1;
    av1_inv_txfm_add = av1_inv_txfm_add_c;
    if (flags & HAS_SSSE3) av1_inv_txfm_add = av1_inv_txfm_add_ssse3;
    if (flags & HAS_AVX2) av1_inv_txfm_add = av1_inv_txfm_add_avx2;
    av1_lowbd_fwd_txfm = av1_lowbd_fwd_txfm_c;
    if (flags & HAS_SSE4_1) av1_lowbd_fwd_txfm = av1_lowbd_fwd_txfm_sse4_1;
    if (flags & HAS_AVX2) av1_lowbd_fwd_txfm = av1_lowbd_fwd_txfm_avx2;
    av1_lowbd_pixel_proj_error = av1_lowbd_pixel_proj_error_c;
    if (flags & HAS_SSE4_1) av1_lowbd_pixel_proj_error = av1_lowbd_pixel_proj_error_sse4_1;
    if (flags & HAS_AVX2) av1_lowbd_pixel_proj_error = av1_lowbd_pixel_proj_error_avx2;
    av1_nn_fast_softmax_16 = av1_nn_fast_softmax_16_c;
    if (flags & HAS_SSE3) av1_nn_fast_softmax_16 = av1_nn_fast_softmax_16_sse3;
    av1_nn_predict = av1_nn_predict_c;
    if (flags & HAS_SSE3) av1_nn_predict = av1_nn_predict_sse3;
    if (flags & HAS_AVX2) av1_nn_predict = av1_nn_predict_avx2;
    av1_quantize_fp = av1_quantize_fp_sse2;
    if (flags & HAS_AVX2) av1_quantize_fp = av1_quantize_fp_avx2;
    av1_quantize_fp_32x32 = av1_quantize_fp_32x32_c;
    if (flags & HAS_AVX2) av1_quantize_fp_32x32 = av1_quantize_fp_32x32_avx2;
    av1_quantize_fp_64x64 = av1_quantize_fp_64x64_c;
    if (flags & HAS_AVX2) av1_quantize_fp_64x64 = av1_quantize_fp_64x64_avx2;
    av1_quantize_lp = av1_quantize_lp_sse2;
    if (flags & HAS_AVX2) av1_quantize_lp = av1_quantize_lp_avx2;
    av1_resize_and_extend_frame = av1_resize_and_extend_frame_c;
    if (flags & HAS_SSSE3) av1_resize_and_extend_frame = av1_resize_and_extend_frame_ssse3;
    av1_resize_horz_dir = av1_resize_horz_dir_sse2;
    if (flags & HAS_AVX2) av1_resize_horz_dir = av1_resize_horz_dir_avx2;
    av1_resize_vert_dir = av1_resize_vert_dir_sse2;
    if (flags & HAS_AVX2) av1_resize_vert_dir = av1_resize_vert_dir_avx2;
    av1_round_shift_array = av1_round_shift_array_c;
    if (flags & HAS_SSE4_1) av1_round_shift_array = av1_round_shift_array_sse4_1;
    av1_selfguided_restoration = av1_selfguided_restoration_c;
    if (flags & HAS_SSE4_1) av1_selfguided_restoration = av1_selfguided_restoration_sse4_1;
    if (flags & HAS_AVX2) av1_selfguided_restoration = av1_selfguided_restoration_avx2;
    av1_txb_init_levels = av1_txb_init_levels_c;
    if (flags & HAS_SSE4_1) av1_txb_init_levels = av1_txb_init_levels_sse4_1;
    if (flags & HAS_AVX2) av1_txb_init_levels = av1_txb_init_levels_avx2;
    av1_upsample_intra_edge = av1_upsample_intra_edge_c;
    if (flags & HAS_SSE4_1) av1_upsample_intra_edge = av1_upsample_intra_edge_sse4_1;
    av1_warp_affine = av1_warp_affine_c;
    if (flags & HAS_SSE4_1) av1_warp_affine = av1_warp_affine_sse4_1;
    if (flags & HAS_AVX2) av1_warp_affine = av1_warp_affine_avx2;
    av1_wedge_compute_delta_squares = av1_wedge_compute_delta_squares_sse2;
    if (flags & HAS_AVX2) av1_wedge_compute_delta_squares = av1_wedge_compute_delta_squares_avx2;
    av1_wedge_sign_from_residuals = av1_wedge_sign_from_residuals_sse2;
    if (flags & HAS_AVX2) av1_wedge_sign_from_residuals = av1_wedge_sign_from_residuals_avx2;
    av1_wedge_sse_from_residuals = av1_wedge_sse_from_residuals_sse2;
    if (flags & HAS_AVX2) av1_wedge_sse_from_residuals = av1_wedge_sse_from_residuals_avx2;
    av1_wiener_convolve_add_src = av1_wiener_convolve_add_src_sse2;
    if (flags & HAS_AVX2) av1_wiener_convolve_add_src = av1_wiener_convolve_add_src_avx2;
    cdef_copy_rect8_16bit_to_16bit = cdef_copy_rect8_16bit_to_16bit_c;
    if (flags & HAS_SSE4_1) cdef_copy_rect8_16bit_to_16bit = cdef_copy_rect8_16bit_to_16bit_sse4_1;
    if (flags & HAS_AVX2) cdef_copy_rect8_16bit_to_16bit = cdef_copy_rect8_16bit_to_16bit_avx2;
    cdef_copy_rect8_8bit_to_16bit = cdef_copy_rect8_8bit_to_16bit_c;
    if (flags & HAS_SSE4_1) cdef_copy_rect8_8bit_to_16bit = cdef_copy_rect8_8bit_to_16bit_sse4_1;
    if (flags & HAS_AVX2) cdef_copy_rect8_8bit_to_16bit = cdef_copy_rect8_8bit_to_16bit_avx2;
    cdef_filter_16_0 = cdef_filter_16_0_c;
    if (flags & HAS_SSE4_1) cdef_filter_16_0 = cdef_filter_16_0_sse4_1;
    if (flags & HAS_AVX2) cdef_filter_16_0 = cdef_filter_16_0_avx2;
    cdef_filter_16_1 = cdef_filter_16_1_c;
    if (flags & HAS_SSE4_1) cdef_filter_16_1 = cdef_filter_16_1_sse4_1;
    if (flags & HAS_AVX2) cdef_filter_16_1 = cdef_filter_16_1_avx2;
    cdef_filter_16_2 = cdef_filter_16_2_c;
    if (flags & HAS_SSE4_1) cdef_filter_16_2 = cdef_filter_16_2_sse4_1;
    if (flags & HAS_AVX2) cdef_filter_16_2 = cdef_filter_16_2_avx2;
    cdef_filter_16_3 = cdef_filter_16_3_c;
    if (flags & HAS_SSE4_1) cdef_filter_16_3 = cdef_filter_16_3_sse4_1;
    if (flags & HAS_AVX2) cdef_filter_16_3 = cdef_filter_16_3_avx2;
    cdef_filter_8_0 = cdef_filter_8_0_c;
    if (flags & HAS_SSE4_1) cdef_filter_8_0 = cdef_filter_8_0_sse4_1;
    if (flags & HAS_AVX2) cdef_filter_8_0 = cdef_filter_8_0_avx2;
    cdef_filter_8_1 = cdef_filter_8_1_c;
    if (flags & HAS_SSE4_1) cdef_filter_8_1 = cdef_filter_8_1_sse4_1;
    if (flags & HAS_AVX2) cdef_filter_8_1 = cdef_filter_8_1_avx2;
    cdef_filter_8_2 = cdef_filter_8_2_c;
    if (flags & HAS_SSE4_1) cdef_filter_8_2 = cdef_filter_8_2_sse4_1;
    if (flags & HAS_AVX2) cdef_filter_8_2 = cdef_filter_8_2_avx2;
    cdef_filter_8_3 = cdef_filter_8_3_c;
    if (flags & HAS_SSE4_1) cdef_filter_8_3 = cdef_filter_8_3_sse4_1;
    if (flags & HAS_AVX2) cdef_filter_8_3 = cdef_filter_8_3_avx2;
    cdef_find_dir = cdef_find_dir_c;
    if (flags & HAS_SSE4_1) cdef_find_dir = cdef_find_dir_sse4_1;
    if (flags & HAS_AVX2) cdef_find_dir = cdef_find_dir_avx2;
    cdef_find_dir_dual = cdef_find_dir_dual_c;
    if (flags & HAS_SSE4_1) cdef_find_dir_dual = cdef_find_dir_dual_sse4_1;
    if (flags & HAS_AVX2) cdef_find_dir_dual = cdef_find_dir_dual_avx2;
    cfl_get_luma_subsampling_420_hbd = cfl_get_luma_subsampling_420_hbd_c;
    if (flags & HAS_SSSE3) cfl_get_luma_subsampling_420_hbd = cfl_get_luma_subsampling_420_hbd_ssse3;
    if (flags & HAS_AVX2) cfl_get_luma_subsampling_420_hbd = cfl_get_luma_subsampling_420_hbd_avx2;
    cfl_get_luma_subsampling_420_lbd = cfl_get_luma_subsampling_420_lbd_c;
    if (flags & HAS_SSSE3) cfl_get_luma_subsampling_420_lbd = cfl_get_luma_subsampling_420_lbd_ssse3;
    if (flags & HAS_AVX2) cfl_get_luma_subsampling_420_lbd = cfl_get_luma_subsampling_420_lbd_avx2;
    cfl_get_luma_subsampling_422_hbd = cfl_get_luma_subsampling_422_hbd_c;
    if (flags & HAS_SSSE3) cfl_get_luma_subsampling_422_hbd = cfl_get_luma_subsampling_422_hbd_ssse3;
    if (flags & HAS_AVX2) cfl_get_luma_subsampling_422_hbd = cfl_get_luma_subsampling_422_hbd_avx2;
    cfl_get_luma_subsampling_422_lbd = cfl_get_luma_subsampling_422_lbd_c;
    if (flags & HAS_SSSE3) cfl_get_luma_subsampling_422_lbd = cfl_get_luma_subsampling_422_lbd_ssse3;
    if (flags & HAS_AVX2) cfl_get_luma_subsampling_422_lbd = cfl_get_luma_subsampling_422_lbd_avx2;
    cfl_get_luma_subsampling_444_hbd = cfl_get_luma_subsampling_444_hbd_c;
    if (flags & HAS_SSSE3) cfl_get_luma_subsampling_444_hbd = cfl_get_luma_subsampling_444_hbd_ssse3;
    if (flags & HAS_AVX2) cfl_get_luma_subsampling_444_hbd = cfl_get_luma_subsampling_444_hbd_avx2;
    cfl_get_luma_subsampling_444_lbd = cfl_get_luma_subsampling_444_lbd_c;
    if (flags & HAS_SSSE3) cfl_get_luma_subsampling_444_lbd = cfl_get_luma_subsampling_444_lbd_ssse3;
    if (flags & HAS_AVX2) cfl_get_luma_subsampling_444_lbd = cfl_get_luma_subsampling_444_lbd_avx2;
    cfl_get_predict_hbd_fn = cfl_get_predict_hbd_fn_c;
    if (flags & HAS_SSSE3) cfl_get_predict_hbd_fn = cfl_get_predict_hbd_fn_ssse3;
    if (flags & HAS_AVX2) cfl_get_predict_hbd_fn = cfl_get_predict_hbd_fn_avx2;
    cfl_get_predict_lbd_fn = cfl_get_predict_lbd_fn_c;
    if (flags & HAS_SSSE3) cfl_get_predict_lbd_fn = cfl_get_predict_lbd_fn_ssse3;
    if (flags & HAS_AVX2) cfl_get_predict_lbd_fn = cfl_get_predict_lbd_fn_avx2;
    cfl_get_subtract_average_fn = cfl_get_subtract_average_fn_sse2;
    if (flags & HAS_AVX2) cfl_get_subtract_average_fn = cfl_get_subtract_average_fn_avx2;
}